

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Primitive PVar15;
  uint uVar16;
  uint uVar17;
  __int_type_conflict _Var18;
  RTCFilterFunctionN p_Var19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  undefined1 auVar125 [28];
  undefined1 auVar126 [24];
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  undefined8 uVar131;
  undefined8 uVar132;
  byte bVar133;
  uint uVar134;
  int iVar135;
  ulong uVar136;
  long lVar137;
  ulong uVar138;
  undefined1 auVar169 [16];
  float fVar183;
  float fVar185;
  float fVar186;
  undefined1 auVar170 [32];
  undefined1 auVar184 [16];
  long lVar139;
  ulong uVar140;
  Geometry *pGVar141;
  ulong uVar142;
  float fVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar157;
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar159;
  float fVar163;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar164;
  float fVar180;
  float fVar181;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar182;
  float fVar187;
  undefined1 auVar174 [32];
  undefined1 auVar168 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar199;
  undefined1 auVar198 [32];
  float fVar200;
  float fVar201;
  float fVar215;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar250 [16];
  float fVar213;
  float fVar214;
  float fVar217;
  float fVar219;
  float fVar222;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar216;
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar223;
  float fVar224;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  float fVar225;
  float fVar226;
  undefined1 auVar228 [16];
  float fVar235;
  float fVar237;
  float fVar239;
  undefined1 auVar227 [16];
  float fVar236;
  float fVar238;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar244;
  undefined1 auVar234 [64];
  float fVar245;
  float fVar258;
  float fVar260;
  undefined1 auVar247 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar251 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar246;
  float fVar262;
  undefined1 auVar252 [32];
  float fVar259;
  float fVar261;
  float fVar263;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar268 [16];
  float fVar267;
  float fVar277;
  float fVar278;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar279;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar280;
  undefined1 auVar276 [32];
  float fVar281;
  float fVar282;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar298;
  undefined1 auVar290 [32];
  undefined1 auVar299 [16];
  float fVar306;
  float fVar308;
  float fVar309;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar307;
  undefined1 auVar303 [32];
  float fVar310;
  float fVar314;
  undefined1 auVar304 [32];
  undefined1 auVar305 [64];
  float fVar315;
  float fVar316;
  float fVar326;
  float fVar329;
  float fVar332;
  float fVar334;
  float fVar335;
  undefined1 auVar318 [32];
  float fVar327;
  float fVar330;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar317;
  float fVar328;
  float fVar331;
  float fVar333;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  float fVar336;
  float fVar337;
  float fVar342;
  float fVar344;
  float fVar346;
  undefined1 auVar338 [32];
  float fVar343;
  float fVar345;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  float in_register_0000151c;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar355;
  undefined1 auVar356 [16];
  float fVar361;
  float fVar362;
  undefined1 auVar357 [32];
  float fVar363;
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  float fVar364;
  float fVar365;
  float fVar368;
  float fVar369;
  float fVar370;
  float in_register_0000159c;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  float fVar371;
  float fVar374;
  float fVar375;
  float fVar376;
  float in_register_000015dc;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float local_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float local_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  uint local_7e0;
  undefined4 uStack_7dc;
  undefined1 local_7c0 [16];
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 auStack_750 [8];
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [40];
  undefined1 (*local_718) [16];
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [4];
  undefined1 auStack_69c [8];
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  undefined8 uStack_678;
  undefined1 auStack_670 [16];
  undefined1 local_650 [16];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 auStack_5b0 [8];
  float fStack_5a8;
  LinearSpace3fa *local_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  RTCHitN local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined1 local_260 [16];
  undefined1 local_240 [32];
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar15 = prim[1];
  uVar142 = (ulong)(byte)PVar15;
  lVar137 = uVar142 * 5;
  auVar250 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar250 = vinsertps_avx(auVar250,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar192 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar192 = vinsertps_avx(auVar192,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar201 = *(float *)(prim + uVar142 * 0x19 + 0x12);
  auVar250 = vsubps_avx(auVar250,*(undefined1 (*) [16])(prim + uVar142 * 0x19 + 6));
  auVar165._0_4_ = fVar201 * auVar250._0_4_;
  auVar165._4_4_ = fVar201 * auVar250._4_4_;
  auVar165._8_4_ = fVar201 * auVar250._8_4_;
  auVar165._12_4_ = fVar201 * auVar250._12_4_;
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 4 + 6)));
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 4 + 10)));
  auVar247._0_4_ = fVar201 * auVar192._0_4_;
  auVar247._4_4_ = fVar201 * auVar192._4_4_;
  auVar247._8_4_ = fVar201 * auVar192._8_4_;
  auVar247._12_4_ = fVar201 * auVar192._12_4_;
  auVar146._16_16_ = auVar184;
  auVar146._0_16_ = auVar250;
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar137 + 6)));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar137 + 10)));
  auVar195._16_16_ = auVar192;
  auVar195._0_16_ = auVar250;
  auVar303 = vcvtdq2ps_avx(auVar195);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 6 + 6)));
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 6 + 10)));
  auVar204._16_16_ = auVar192;
  auVar204._0_16_ = auVar250;
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0xb + 6)));
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0xb + 10)));
  auVar21 = vcvtdq2ps_avx(auVar204);
  auVar205._16_16_ = auVar192;
  auVar205._0_16_ = auVar250;
  auVar22 = vcvtdq2ps_avx(auVar205);
  uVar138 = (ulong)((uint)(byte)PVar15 * 0xc);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 6)));
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 10)));
  auVar269._16_16_ = auVar192;
  auVar269._0_16_ = auVar250;
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + uVar142 + 6)));
  auVar321 = vcvtdq2ps_avx(auVar269);
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + uVar142 + 10)));
  auVar283._16_16_ = auVar192;
  auVar283._0_16_ = auVar250;
  lVar139 = uVar142 * 9;
  uVar138 = (ulong)(uint)((int)lVar139 * 2);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar283);
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 10)));
  auVar284._16_16_ = auVar192;
  auVar284._0_16_ = auVar250;
  auVar24 = vcvtdq2ps_avx(auVar284);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + uVar142 + 6)));
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + uVar142 + 10)));
  auVar318._16_16_ = auVar192;
  auVar318._0_16_ = auVar250;
  uVar138 = (ulong)(uint)((int)lVar137 << 2);
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 6)));
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 + 10)));
  auVar25 = vcvtdq2ps_avx(auVar318);
  auVar338._16_16_ = auVar192;
  auVar338._0_16_ = auVar250;
  auVar26 = vcvtdq2ps_avx(auVar338);
  auVar250 = vshufps_avx(auVar247,auVar247,0);
  auVar192 = vshufps_avx(auVar247,auVar247,0x55);
  auVar184 = vshufps_avx(auVar247,auVar247,0xaa);
  fVar201 = auVar184._0_4_;
  fVar213 = auVar184._4_4_;
  fVar214 = auVar184._8_4_;
  fVar215 = auVar184._12_4_;
  fVar217 = auVar192._0_4_;
  fVar219 = auVar192._4_4_;
  fVar222 = auVar192._8_4_;
  fVar225 = auVar192._12_4_;
  fVar235 = auVar250._0_4_;
  fVar237 = auVar250._4_4_;
  fVar239 = auVar250._8_4_;
  fVar241 = auVar250._12_4_;
  auVar349._0_4_ = fVar235 * auVar146._0_4_ + fVar217 * auVar303._0_4_ + fVar201 * auVar21._0_4_;
  auVar349._4_4_ = fVar237 * auVar146._4_4_ + fVar219 * auVar303._4_4_ + fVar213 * auVar21._4_4_;
  auVar349._8_4_ = fVar239 * auVar146._8_4_ + fVar222 * auVar303._8_4_ + fVar214 * auVar21._8_4_;
  auVar349._12_4_ = fVar241 * auVar146._12_4_ + fVar225 * auVar303._12_4_ + fVar215 * auVar21._12_4_
  ;
  auVar349._16_4_ = fVar235 * auVar146._16_4_ + fVar217 * auVar303._16_4_ + fVar201 * auVar21._16_4_
  ;
  auVar349._20_4_ = fVar237 * auVar146._20_4_ + fVar219 * auVar303._20_4_ + fVar213 * auVar21._20_4_
  ;
  auVar349._24_4_ = fVar239 * auVar146._24_4_ + fVar222 * auVar303._24_4_ + fVar214 * auVar21._24_4_
  ;
  auVar349._28_4_ = fVar225 + in_register_000015dc + in_register_0000151c;
  auVar347._0_4_ = fVar235 * auVar22._0_4_ + fVar217 * auVar321._0_4_ + auVar23._0_4_ * fVar201;
  auVar347._4_4_ = fVar237 * auVar22._4_4_ + fVar219 * auVar321._4_4_ + auVar23._4_4_ * fVar213;
  auVar347._8_4_ = fVar239 * auVar22._8_4_ + fVar222 * auVar321._8_4_ + auVar23._8_4_ * fVar214;
  auVar347._12_4_ = fVar241 * auVar22._12_4_ + fVar225 * auVar321._12_4_ + auVar23._12_4_ * fVar215;
  auVar347._16_4_ = fVar235 * auVar22._16_4_ + fVar217 * auVar321._16_4_ + auVar23._16_4_ * fVar201;
  auVar347._20_4_ = fVar237 * auVar22._20_4_ + fVar219 * auVar321._20_4_ + auVar23._20_4_ * fVar213;
  auVar347._24_4_ = fVar239 * auVar22._24_4_ + fVar222 * auVar321._24_4_ + auVar23._24_4_ * fVar214;
  auVar347._28_4_ = fVar225 + in_register_000015dc + in_register_0000159c;
  auVar251._0_4_ = fVar235 * auVar24._0_4_ + fVar217 * auVar25._0_4_ + auVar26._0_4_ * fVar201;
  auVar251._4_4_ = fVar237 * auVar24._4_4_ + fVar219 * auVar25._4_4_ + auVar26._4_4_ * fVar213;
  auVar251._8_4_ = fVar239 * auVar24._8_4_ + fVar222 * auVar25._8_4_ + auVar26._8_4_ * fVar214;
  auVar251._12_4_ = fVar241 * auVar24._12_4_ + fVar225 * auVar25._12_4_ + auVar26._12_4_ * fVar215;
  auVar251._16_4_ = fVar235 * auVar24._16_4_ + fVar217 * auVar25._16_4_ + auVar26._16_4_ * fVar201;
  auVar251._20_4_ = fVar237 * auVar24._20_4_ + fVar219 * auVar25._20_4_ + auVar26._20_4_ * fVar213;
  auVar251._24_4_ = fVar239 * auVar24._24_4_ + fVar222 * auVar25._24_4_ + auVar26._24_4_ * fVar214;
  auVar251._28_4_ = fVar241 + fVar225 + fVar215;
  auVar250 = vshufps_avx(auVar165,auVar165,0);
  auVar192 = vshufps_avx(auVar165,auVar165,0x55);
  auVar184 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar213 = auVar184._0_4_;
  fVar214 = auVar184._4_4_;
  fVar215 = auVar184._8_4_;
  fVar217 = auVar184._12_4_;
  fVar237 = auVar192._0_4_;
  fVar239 = auVar192._4_4_;
  fVar241 = auVar192._8_4_;
  fVar242 = auVar192._12_4_;
  fVar219 = auVar250._0_4_;
  fVar222 = auVar250._4_4_;
  fVar225 = auVar250._8_4_;
  fVar235 = auVar250._12_4_;
  fVar201 = auVar146._28_4_;
  auVar270._0_4_ = fVar219 * auVar146._0_4_ + fVar237 * auVar303._0_4_ + fVar213 * auVar21._0_4_;
  auVar270._4_4_ = fVar222 * auVar146._4_4_ + fVar239 * auVar303._4_4_ + fVar214 * auVar21._4_4_;
  auVar270._8_4_ = fVar225 * auVar146._8_4_ + fVar241 * auVar303._8_4_ + fVar215 * auVar21._8_4_;
  auVar270._12_4_ = fVar235 * auVar146._12_4_ + fVar242 * auVar303._12_4_ + fVar217 * auVar21._12_4_
  ;
  auVar270._16_4_ = fVar219 * auVar146._16_4_ + fVar237 * auVar303._16_4_ + fVar213 * auVar21._16_4_
  ;
  auVar270._20_4_ = fVar222 * auVar146._20_4_ + fVar239 * auVar303._20_4_ + fVar214 * auVar21._20_4_
  ;
  auVar270._24_4_ = fVar225 * auVar146._24_4_ + fVar241 * auVar303._24_4_ + fVar215 * auVar21._24_4_
  ;
  auVar270._28_4_ = fVar201 + auVar303._28_4_ + auVar21._28_4_;
  auVar170._0_4_ = fVar219 * auVar22._0_4_ + auVar23._0_4_ * fVar213 + fVar237 * auVar321._0_4_;
  auVar170._4_4_ = fVar222 * auVar22._4_4_ + auVar23._4_4_ * fVar214 + fVar239 * auVar321._4_4_;
  auVar170._8_4_ = fVar225 * auVar22._8_4_ + auVar23._8_4_ * fVar215 + fVar241 * auVar321._8_4_;
  auVar170._12_4_ = fVar235 * auVar22._12_4_ + auVar23._12_4_ * fVar217 + fVar242 * auVar321._12_4_;
  auVar170._16_4_ = fVar219 * auVar22._16_4_ + auVar23._16_4_ * fVar213 + fVar237 * auVar321._16_4_;
  auVar170._20_4_ = fVar222 * auVar22._20_4_ + auVar23._20_4_ * fVar214 + fVar239 * auVar321._20_4_;
  auVar170._24_4_ = fVar225 * auVar22._24_4_ + auVar23._24_4_ * fVar215 + fVar241 * auVar321._24_4_;
  auVar170._28_4_ = fVar201 + auVar23._28_4_ + auVar21._28_4_;
  auVar285._8_4_ = 0x7fffffff;
  auVar285._0_8_ = 0x7fffffff7fffffff;
  auVar285._12_4_ = 0x7fffffff;
  auVar285._16_4_ = 0x7fffffff;
  auVar285._20_4_ = 0x7fffffff;
  auVar285._24_4_ = 0x7fffffff;
  auVar285._28_4_ = 0x7fffffff;
  auVar196._8_4_ = 0x219392ef;
  auVar196._0_8_ = 0x219392ef219392ef;
  auVar196._12_4_ = 0x219392ef;
  auVar196._16_4_ = 0x219392ef;
  auVar196._20_4_ = 0x219392ef;
  auVar196._24_4_ = 0x219392ef;
  auVar196._28_4_ = 0x219392ef;
  auVar146 = vandps_avx(auVar349,auVar285);
  auVar146 = vcmpps_avx(auVar146,auVar196,1);
  auVar303 = vblendvps_avx(auVar349,auVar196,auVar146);
  auVar146 = vandps_avx(auVar347,auVar285);
  auVar146 = vcmpps_avx(auVar146,auVar196,1);
  auVar21 = vblendvps_avx(auVar347,auVar196,auVar146);
  auVar146 = vandps_avx(auVar251,auVar285);
  auVar146 = vcmpps_avx(auVar146,auVar196,1);
  auVar146 = vblendvps_avx(auVar251,auVar196,auVar146);
  auVar197._0_4_ = fVar237 * auVar25._0_4_ + auVar26._0_4_ * fVar213 + fVar219 * auVar24._0_4_;
  auVar197._4_4_ = fVar239 * auVar25._4_4_ + auVar26._4_4_ * fVar214 + fVar222 * auVar24._4_4_;
  auVar197._8_4_ = fVar241 * auVar25._8_4_ + auVar26._8_4_ * fVar215 + fVar225 * auVar24._8_4_;
  auVar197._12_4_ = fVar242 * auVar25._12_4_ + auVar26._12_4_ * fVar217 + fVar235 * auVar24._12_4_;
  auVar197._16_4_ = fVar237 * auVar25._16_4_ + auVar26._16_4_ * fVar213 + fVar219 * auVar24._16_4_;
  auVar197._20_4_ = fVar239 * auVar25._20_4_ + auVar26._20_4_ * fVar214 + fVar222 * auVar24._20_4_;
  auVar197._24_4_ = fVar241 * auVar25._24_4_ + auVar26._24_4_ * fVar215 + fVar225 * auVar24._24_4_;
  auVar197._28_4_ = auVar321._28_4_ + fVar217 + fVar201;
  auVar22 = vrcpps_avx(auVar303);
  fVar201 = auVar22._0_4_;
  fVar213 = auVar22._4_4_;
  auVar321._4_4_ = auVar303._4_4_ * fVar213;
  auVar321._0_4_ = auVar303._0_4_ * fVar201;
  fVar214 = auVar22._8_4_;
  auVar321._8_4_ = auVar303._8_4_ * fVar214;
  fVar215 = auVar22._12_4_;
  auVar321._12_4_ = auVar303._12_4_ * fVar215;
  fVar217 = auVar22._16_4_;
  auVar321._16_4_ = auVar303._16_4_ * fVar217;
  fVar219 = auVar22._20_4_;
  auVar321._20_4_ = auVar303._20_4_ * fVar219;
  fVar222 = auVar22._24_4_;
  auVar321._24_4_ = auVar303._24_4_ * fVar222;
  auVar321._28_4_ = auVar303._28_4_;
  auVar300._8_4_ = 0x3f800000;
  auVar300._0_8_ = 0x3f8000003f800000;
  auVar300._12_4_ = 0x3f800000;
  auVar300._16_4_ = 0x3f800000;
  auVar300._20_4_ = 0x3f800000;
  auVar300._24_4_ = 0x3f800000;
  auVar300._28_4_ = 0x3f800000;
  auVar321 = vsubps_avx(auVar300,auVar321);
  auVar303 = vrcpps_avx(auVar21);
  fVar201 = fVar201 + fVar201 * auVar321._0_4_;
  fVar213 = fVar213 + fVar213 * auVar321._4_4_;
  fVar214 = fVar214 + fVar214 * auVar321._8_4_;
  fVar215 = fVar215 + fVar215 * auVar321._12_4_;
  fVar217 = fVar217 + fVar217 * auVar321._16_4_;
  fVar219 = fVar219 + fVar219 * auVar321._20_4_;
  fVar222 = fVar222 + fVar222 * auVar321._24_4_;
  fVar245 = auVar303._0_4_;
  fVar258 = auVar303._4_4_;
  auVar23._4_4_ = fVar258 * auVar21._4_4_;
  auVar23._0_4_ = fVar245 * auVar21._0_4_;
  fVar260 = auVar303._8_4_;
  auVar23._8_4_ = fVar260 * auVar21._8_4_;
  fVar262 = auVar303._12_4_;
  auVar23._12_4_ = fVar262 * auVar21._12_4_;
  fVar264 = auVar303._16_4_;
  auVar23._16_4_ = fVar264 * auVar21._16_4_;
  fVar265 = auVar303._20_4_;
  auVar23._20_4_ = fVar265 * auVar21._20_4_;
  fVar266 = auVar303._24_4_;
  auVar23._24_4_ = fVar266 * auVar21._24_4_;
  auVar23._28_4_ = auVar22._28_4_;
  auVar303 = vsubps_avx(auVar300,auVar23);
  fVar245 = fVar245 + fVar245 * auVar303._0_4_;
  fVar258 = fVar258 + fVar258 * auVar303._4_4_;
  fVar260 = fVar260 + fVar260 * auVar303._8_4_;
  fVar262 = fVar262 + fVar262 * auVar303._12_4_;
  fVar264 = fVar264 + fVar264 * auVar303._16_4_;
  fVar265 = fVar265 + fVar265 * auVar303._20_4_;
  fVar266 = fVar266 + fVar266 * auVar303._24_4_;
  auVar303 = vrcpps_avx(auVar146);
  fVar225 = auVar303._0_4_;
  fVar235 = auVar303._4_4_;
  auVar24._4_4_ = fVar235 * auVar146._4_4_;
  auVar24._0_4_ = fVar225 * auVar146._0_4_;
  fVar237 = auVar303._8_4_;
  auVar24._8_4_ = fVar237 * auVar146._8_4_;
  fVar239 = auVar303._12_4_;
  auVar24._12_4_ = fVar239 * auVar146._12_4_;
  fVar241 = auVar303._16_4_;
  auVar24._16_4_ = fVar241 * auVar146._16_4_;
  fVar242 = auVar303._20_4_;
  auVar24._20_4_ = fVar242 * auVar146._20_4_;
  fVar243 = auVar303._24_4_;
  auVar24._24_4_ = fVar243 * auVar146._24_4_;
  auVar24._28_4_ = auVar21._28_4_;
  auVar146 = vsubps_avx(auVar300,auVar24);
  fVar225 = fVar225 + fVar225 * auVar146._0_4_;
  fVar235 = fVar235 + fVar235 * auVar146._4_4_;
  fVar237 = fVar237 + fVar237 * auVar146._8_4_;
  fVar239 = fVar239 + fVar239 * auVar146._12_4_;
  fVar241 = fVar241 + fVar241 * auVar146._16_4_;
  fVar242 = fVar242 + fVar242 * auVar146._20_4_;
  fVar243 = fVar243 + fVar243 * auVar146._24_4_;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *(ulong *)(prim + uVar142 * 7 + 6);
  auVar250 = vpmovsxwd_avx(auVar250);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + uVar142 * 7 + 0xe);
  auVar192 = vpmovsxwd_avx(auVar192);
  auVar147._16_16_ = auVar192;
  auVar147._0_16_ = auVar250;
  auVar146 = vcvtdq2ps_avx(auVar147);
  auVar146 = vsubps_avx(auVar146,auVar270);
  auVar144._0_4_ = fVar201 * auVar146._0_4_;
  auVar144._4_4_ = fVar213 * auVar146._4_4_;
  auVar144._8_4_ = fVar214 * auVar146._8_4_;
  auVar144._12_4_ = fVar215 * auVar146._12_4_;
  auVar21._16_4_ = fVar217 * auVar146._16_4_;
  auVar21._0_16_ = auVar144;
  auVar21._20_4_ = fVar219 * auVar146._20_4_;
  auVar21._24_4_ = fVar222 * auVar146._24_4_;
  auVar21._28_4_ = auVar146._28_4_;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + lVar139 + 6);
  auVar250 = vpmovsxwd_avx(auVar184);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar139 + 0xe);
  auVar192 = vpmovsxwd_avx(auVar7);
  auVar286._16_16_ = auVar192;
  auVar286._0_16_ = auVar250;
  auVar146 = vcvtdq2ps_avx(auVar286);
  auVar146 = vsubps_avx(auVar146,auVar270);
  auVar202._0_4_ = fVar201 * auVar146._0_4_;
  auVar202._4_4_ = fVar213 * auVar146._4_4_;
  auVar202._8_4_ = fVar214 * auVar146._8_4_;
  auVar202._12_4_ = fVar215 * auVar146._12_4_;
  auVar25._16_4_ = fVar217 * auVar146._16_4_;
  auVar25._0_16_ = auVar202;
  auVar25._20_4_ = fVar219 * auVar146._20_4_;
  auVar25._24_4_ = fVar222 * auVar146._24_4_;
  auVar25._28_4_ = auVar22._28_4_ + auVar321._28_4_;
  lVar137 = (ulong)(byte)PVar15 * 0x10;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + lVar137 + 6);
  auVar250 = vpmovsxwd_avx(auVar203);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar137 + 0xe);
  auVar192 = vpmovsxwd_avx(auVar8);
  lVar137 = lVar137 + uVar142 * -2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar137 + 6);
  auVar184 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar137 + 0xe);
  auVar7 = vpmovsxwd_avx(auVar10);
  auVar271._16_16_ = auVar7;
  auVar271._0_16_ = auVar184;
  auVar146 = vcvtdq2ps_avx(auVar271);
  auVar146 = vsubps_avx(auVar146,auVar170);
  auVar268._0_4_ = fVar245 * auVar146._0_4_;
  auVar268._4_4_ = fVar258 * auVar146._4_4_;
  auVar268._8_4_ = fVar260 * auVar146._8_4_;
  auVar268._12_4_ = fVar262 * auVar146._12_4_;
  auVar22._16_4_ = fVar264 * auVar146._16_4_;
  auVar22._0_16_ = auVar268;
  auVar22._20_4_ = fVar265 * auVar146._20_4_;
  auVar22._24_4_ = fVar266 * auVar146._24_4_;
  auVar22._28_4_ = auVar146._28_4_;
  auVar287._16_16_ = auVar192;
  auVar287._0_16_ = auVar250;
  auVar146 = vcvtdq2ps_avx(auVar287);
  auVar146 = vsubps_avx(auVar146,auVar170);
  auVar166._0_4_ = fVar245 * auVar146._0_4_;
  auVar166._4_4_ = fVar258 * auVar146._4_4_;
  auVar166._8_4_ = fVar260 * auVar146._8_4_;
  auVar166._12_4_ = fVar262 * auVar146._12_4_;
  auVar303._16_4_ = fVar264 * auVar146._16_4_;
  auVar303._0_16_ = auVar166;
  auVar303._20_4_ = fVar265 * auVar146._20_4_;
  auVar303._24_4_ = fVar266 * auVar146._24_4_;
  auVar303._28_4_ = auVar146._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar138 + uVar142 + 6);
  auVar250 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar138 + uVar142 + 0xe);
  auVar192 = vpmovsxwd_avx(auVar12);
  auVar252._16_16_ = auVar192;
  auVar252._0_16_ = auVar250;
  auVar146 = vcvtdq2ps_avx(auVar252);
  auVar146 = vsubps_avx(auVar146,auVar197);
  auVar248._0_4_ = fVar225 * auVar146._0_4_;
  auVar248._4_4_ = fVar235 * auVar146._4_4_;
  auVar248._8_4_ = fVar237 * auVar146._8_4_;
  auVar248._12_4_ = fVar239 * auVar146._12_4_;
  auVar26._16_4_ = fVar241 * auVar146._16_4_;
  auVar26._0_16_ = auVar248;
  auVar26._20_4_ = fVar242 * auVar146._20_4_;
  auVar26._24_4_ = fVar243 * auVar146._24_4_;
  auVar26._28_4_ = auVar146._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar142 * 0x17 + 6);
  auVar250 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar142 * 0x17 + 0xe);
  auVar192 = vpmovsxwd_avx(auVar14);
  auVar288._16_16_ = auVar192;
  auVar288._0_16_ = auVar250;
  auVar146 = vcvtdq2ps_avx(auVar288);
  auVar146 = vsubps_avx(auVar146,auVar197);
  auVar188._0_4_ = fVar225 * auVar146._0_4_;
  auVar188._4_4_ = fVar235 * auVar146._4_4_;
  auVar188._8_4_ = fVar237 * auVar146._8_4_;
  auVar188._12_4_ = fVar239 * auVar146._12_4_;
  auVar28._16_4_ = fVar241 * auVar146._16_4_;
  auVar28._0_16_ = auVar188;
  auVar28._20_4_ = fVar242 * auVar146._20_4_;
  auVar28._24_4_ = fVar243 * auVar146._24_4_;
  auVar28._28_4_ = auVar146._28_4_;
  auVar250 = vpminsd_avx(auVar21._16_16_,auVar25._16_16_);
  auVar192 = vpminsd_avx(auVar144,auVar202);
  auVar301._16_16_ = auVar250;
  auVar301._0_16_ = auVar192;
  auVar184 = auVar303._16_16_;
  auVar325 = ZEXT1664(auVar184);
  auVar250 = vpminsd_avx(auVar22._16_16_,auVar184);
  auVar192 = vpminsd_avx(auVar268,auVar166);
  auVar348._16_16_ = auVar250;
  auVar348._0_16_ = auVar192;
  auVar146 = vmaxps_avx(auVar301,auVar348);
  auVar250 = vpminsd_avx(auVar26._16_16_,auVar28._16_16_);
  auVar192 = vpminsd_avx(auVar248,auVar188);
  auVar357._16_16_ = auVar250;
  auVar357._0_16_ = auVar192;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar366._4_4_ = uVar6;
  auVar366._0_4_ = uVar6;
  auVar366._8_4_ = uVar6;
  auVar366._12_4_ = uVar6;
  auVar366._16_4_ = uVar6;
  auVar366._20_4_ = uVar6;
  auVar366._24_4_ = uVar6;
  auVar366._28_4_ = uVar6;
  auVar303 = vmaxps_avx(auVar357,auVar366);
  auVar146 = vmaxps_avx(auVar146,auVar303);
  local_80._4_4_ = auVar146._4_4_ * 0.99999964;
  local_80._0_4_ = auVar146._0_4_ * 0.99999964;
  local_80._8_4_ = auVar146._8_4_ * 0.99999964;
  local_80._12_4_ = auVar146._12_4_ * 0.99999964;
  local_80._16_4_ = auVar146._16_4_ * 0.99999964;
  local_80._20_4_ = auVar146._20_4_ * 0.99999964;
  local_80._24_4_ = auVar146._24_4_ * 0.99999964;
  local_80._28_4_ = auVar146._28_4_;
  auVar305 = ZEXT3264(local_80);
  auVar250 = vpmaxsd_avx(auVar21._16_16_,auVar25._16_16_);
  auVar192 = vpmaxsd_avx(auVar144,auVar202);
  auVar148._16_16_ = auVar250;
  auVar148._0_16_ = auVar192;
  auVar250 = vpmaxsd_avx(auVar22._16_16_,auVar184);
  auVar192 = vpmaxsd_avx(auVar268,auVar166);
  auVar171._16_16_ = auVar250;
  auVar171._0_16_ = auVar192;
  auVar146 = vminps_avx(auVar148,auVar171);
  auVar250 = vpmaxsd_avx(auVar26._16_16_,auVar28._16_16_);
  auVar192 = vpmaxsd_avx(auVar248,auVar188);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar206._4_4_ = uVar6;
  auVar206._0_4_ = uVar6;
  auVar206._8_4_ = uVar6;
  auVar206._12_4_ = uVar6;
  auVar206._16_4_ = uVar6;
  auVar206._20_4_ = uVar6;
  auVar206._24_4_ = uVar6;
  auVar206._28_4_ = uVar6;
  auVar172._16_16_ = auVar250;
  auVar172._0_16_ = auVar192;
  auVar303 = vminps_avx(auVar172,auVar206);
  auVar146 = vminps_avx(auVar146,auVar303);
  auVar27._4_4_ = auVar146._4_4_ * 1.0000004;
  auVar27._0_4_ = auVar146._0_4_ * 1.0000004;
  auVar27._8_4_ = auVar146._8_4_ * 1.0000004;
  auVar27._12_4_ = auVar146._12_4_ * 1.0000004;
  auVar27._16_4_ = auVar146._16_4_ * 1.0000004;
  auVar27._20_4_ = auVar146._20_4_ * 1.0000004;
  auVar27._24_4_ = auVar146._24_4_ * 1.0000004;
  auVar27._28_4_ = auVar146._28_4_;
  auVar146 = vcmpps_avx(local_80,auVar27,2);
  auVar250 = vpshufd_avx(ZEXT116((byte)PVar15),0);
  auVar173._16_16_ = auVar250;
  auVar173._0_16_ = auVar250;
  auVar303 = vcvtdq2ps_avx(auVar173);
  auVar303 = vcmpps_avx(_DAT_01faff40,auVar303,1);
  auVar146 = vandps_avx(auVar146,auVar303);
  uVar134 = vmovmskps_avx(auVar146);
  if (uVar134 == 0) {
    bVar133 = 0;
  }
  else {
    uVar134 = uVar134 & 0xff;
    local_588 = pre->ray_space + k;
    local_580 = mm_lookupmask_ps._16_8_;
    uStack_578 = mm_lookupmask_ps._24_8_;
    uStack_570 = mm_lookupmask_ps._16_8_;
    uStack_568 = mm_lookupmask_ps._24_8_;
    local_718 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar142 = (ulong)uVar134;
      auVar303 = auVar325._0_32_;
      auVar146 = auVar305._0_32_;
      lVar137 = 0;
      if (uVar142 != 0) {
        for (; (uVar134 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
        }
      }
      uVar142 = uVar142 - 1 & uVar142;
      uVar134 = *(uint *)(prim + 2);
      local_7a8 = (ulong)uVar134;
      uVar16 = *(uint *)(prim + lVar137 * 4 + 6);
      pGVar141 = (context->scene->geometries).items[local_7a8].ptr;
      _Var18 = pGVar141[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_650._0_8_ = CONCAT44(0,uVar16);
      uVar138 = (ulong)*(uint *)(*(long *)&pGVar141->field_0x58 + _Var18 * CONCAT44(0,uVar16));
      p_Var19 = pGVar141[1].intersectionFilterN;
      lVar137 = *(long *)&pGVar141[1].time_range.upper;
      auVar250 = *(undefined1 (*) [16])(lVar137 + (long)p_Var19 * uVar138);
      auVar192 = *(undefined1 (*) [16])(lVar137 + (uVar138 + 1) * (long)p_Var19);
      auVar184 = *(undefined1 (*) [16])(lVar137 + (uVar138 + 2) * (long)p_Var19);
      lVar139 = 0;
      if (uVar142 != 0) {
        for (; (uVar142 >> lVar139 & 1) == 0; lVar139 = lVar139 + 1) {
        }
      }
      auVar7 = *(undefined1 (*) [16])(lVar137 + (uVar138 + 3) * (long)p_Var19);
      if (uVar142 != 0) {
        uVar138 = uVar142 - 1 & uVar142;
        lVar139 = (ulong)*(uint *)(*(long *)&pGVar141->field_0x58 +
                                  *(uint *)(prim + lVar139 * 4 + 6) * _Var18) * (long)p_Var19;
        if ((uVar138 != 0) && (lVar137 = 0, uVar138 != 0)) {
          for (; (uVar138 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
          }
        }
      }
      uVar17 = (uint)pGVar141[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar203 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar10 = vinsertps_avx(auVar203,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar9 = vsubps_avx(auVar250,auVar10);
      auVar203 = vshufps_avx(auVar9,auVar9,0);
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      fVar201 = (local_588->vx).field_0.m128[0];
      fVar213 = (local_588->vx).field_0.m128[1];
      fVar214 = (local_588->vx).field_0.m128[2];
      fVar215 = (local_588->vx).field_0.m128[3];
      fVar217 = (local_588->vy).field_0.m128[0];
      fVar219 = (local_588->vy).field_0.m128[1];
      fVar222 = (local_588->vy).field_0.m128[2];
      fVar225 = (local_588->vy).field_0.m128[3];
      fVar235 = (local_588->vz).field_0.m128[0];
      fVar237 = (local_588->vz).field_0.m128[1];
      fVar239 = (local_588->vz).field_0.m128[2];
      fVar241 = (local_588->vz).field_0.m128[3];
      auVar167._0_4_ = auVar203._0_4_ * fVar201 + auVar8._0_4_ * fVar217 + fVar235 * auVar9._0_4_;
      auVar167._4_4_ = auVar203._4_4_ * fVar213 + auVar8._4_4_ * fVar219 + fVar237 * auVar9._4_4_;
      auVar167._8_4_ = auVar203._8_4_ * fVar214 + auVar8._8_4_ * fVar222 + fVar239 * auVar9._8_4_;
      auVar167._12_4_ =
           auVar203._12_4_ * fVar215 + auVar8._12_4_ * fVar225 + fVar241 * auVar9._12_4_;
      auVar203 = vblendps_avx(auVar167,auVar250,8);
      auVar11 = vsubps_avx(auVar192,auVar10);
      auVar8 = vshufps_avx(auVar11,auVar11,0);
      auVar9 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar356._0_4_ = auVar8._0_4_ * fVar201 + auVar9._0_4_ * fVar217 + fVar235 * auVar11._0_4_;
      auVar356._4_4_ = auVar8._4_4_ * fVar213 + auVar9._4_4_ * fVar219 + fVar237 * auVar11._4_4_;
      auVar356._8_4_ = auVar8._8_4_ * fVar214 + auVar9._8_4_ * fVar222 + fVar239 * auVar11._8_4_;
      auVar356._12_4_ = auVar8._12_4_ * fVar215 + auVar9._12_4_ * fVar225 + fVar241 * auVar11._12_4_
      ;
      auVar8 = vblendps_avx(auVar356,auVar192,8);
      auVar12 = vsubps_avx(auVar184,auVar10);
      auVar9 = vshufps_avx(auVar12,auVar12,0);
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar249._0_4_ = auVar9._0_4_ * fVar201 + auVar11._0_4_ * fVar217 + fVar235 * auVar12._0_4_;
      auVar249._4_4_ = auVar9._4_4_ * fVar213 + auVar11._4_4_ * fVar219 + fVar237 * auVar12._4_4_;
      auVar249._8_4_ = auVar9._8_4_ * fVar214 + auVar11._8_4_ * fVar222 + fVar239 * auVar12._8_4_;
      auVar249._12_4_ =
           auVar9._12_4_ * fVar215 + auVar11._12_4_ * fVar225 + fVar241 * auVar12._12_4_;
      auVar12 = vshufps_avx(auVar184,auVar184,0xff);
      auVar9 = vblendps_avx(auVar249,auVar184,8);
      auVar13 = vsubps_avx(auVar7,auVar10);
      auVar10 = vshufps_avx(auVar13,auVar13,0);
      auVar11 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar299._0_4_ = auVar10._0_4_ * fVar201 + auVar11._0_4_ * fVar217 + fVar235 * auVar13._0_4_;
      auVar299._4_4_ = auVar10._4_4_ * fVar213 + auVar11._4_4_ * fVar219 + fVar237 * auVar13._4_4_;
      auVar299._8_4_ = auVar10._8_4_ * fVar214 + auVar11._8_4_ * fVar222 + fVar239 * auVar13._8_4_;
      auVar299._12_4_ =
           auVar10._12_4_ * fVar215 + auVar11._12_4_ * fVar225 + fVar241 * auVar13._12_4_;
      auVar13 = vshufps_avx(auVar7,auVar7,0xff);
      auVar10 = vblendps_avx(auVar299,auVar7,8);
      auVar227._8_4_ = 0x7fffffff;
      auVar227._0_8_ = 0x7fffffff7fffffff;
      auVar227._12_4_ = 0x7fffffff;
      auVar203 = vandps_avx(auVar203,auVar227);
      auVar8 = vandps_avx(auVar8,auVar227);
      auVar11 = vmaxps_avx(auVar203,auVar8);
      auVar203 = vandps_avx(auVar9,auVar227);
      auVar8 = vandps_avx(auVar10,auVar227);
      auVar203 = vmaxps_avx(auVar203,auVar8);
      auVar203 = vmaxps_avx(auVar11,auVar203);
      auVar8 = vmovshdup_avx(auVar203);
      auVar8 = vmaxss_avx(auVar8,auVar203);
      auVar203 = vshufpd_avx(auVar203,auVar203,1);
      auVar203 = vmaxss_avx(auVar203,auVar8);
      lVar137 = (long)(int)uVar17 * 0x44;
      fVar213 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar137 + 0x908);
      fVar214 = *(float *)(bspline_basis0 + lVar137 + 0x90c);
      fVar217 = *(float *)(bspline_basis0 + lVar137 + 0x910);
      fVar219 = *(float *)(bspline_basis0 + lVar137 + 0x914);
      fVar225 = *(float *)(bspline_basis0 + lVar137 + 0x918);
      fVar235 = *(float *)(bspline_basis0 + lVar137 + 0x91c);
      fVar239 = *(float *)(bspline_basis0 + lVar137 + 0x920);
      auVar121 = *(undefined1 (*) [28])(bspline_basis0 + lVar137 + 0x908);
      auVar8 = vshufps_avx(auVar249,auVar249,0);
      register0x00001450 = auVar8;
      _local_540 = auVar8;
      auVar9 = vshufps_avx(auVar249,auVar249,0x55);
      register0x00001390 = auVar9;
      _local_4c0 = auVar9;
      register0x00001490 = auVar12;
      _local_340 = auVar12;
      fVar241 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar137 + 0xd8c);
      fVar242 = *(float *)(bspline_basis0 + lVar137 + 0xd90);
      fVar243 = *(float *)(bspline_basis0 + lVar137 + 0xd94);
      fVar245 = *(float *)(bspline_basis0 + lVar137 + 0xd98);
      fVar258 = *(float *)(bspline_basis0 + lVar137 + 0xd9c);
      fVar260 = *(float *)(bspline_basis0 + lVar137 + 0xda0);
      fVar262 = *(float *)(bspline_basis0 + lVar137 + 0xda4);
      auVar120 = *(undefined1 (*) [28])(bspline_basis0 + lVar137 + 0xd8c);
      auVar10 = vshufps_avx(auVar299,auVar299,0);
      register0x00001310 = auVar10;
      _local_500 = auVar10;
      auVar11 = vshufps_avx(auVar299,auVar299,0x55);
      register0x000013d0 = auVar13;
      _local_160 = auVar13;
      fVar226 = auVar10._0_4_;
      fVar236 = auVar10._4_4_;
      fVar238 = auVar10._8_4_;
      fVar240 = auVar10._12_4_;
      fVar371 = auVar11._0_4_;
      fVar374 = auVar11._4_4_;
      fVar375 = auVar11._8_4_;
      fVar376 = auVar11._12_4_;
      fVar315 = auVar8._0_4_;
      fVar326 = auVar8._4_4_;
      fVar329 = auVar8._8_4_;
      fVar332 = auVar8._12_4_;
      fVar267 = auVar9._0_4_;
      fVar277 = auVar9._4_4_;
      fVar278 = auVar9._8_4_;
      fVar279 = auVar9._12_4_;
      fVar281 = auVar13._0_4_;
      fVar291 = auVar13._4_4_;
      fVar293 = auVar13._8_4_;
      fVar295 = auVar13._12_4_;
      fVar336 = auVar12._0_4_;
      fVar342 = auVar12._4_4_;
      fVar344 = auVar12._8_4_;
      auVar8 = vshufps_avx(auVar356,auVar356,0);
      register0x00001350 = auVar8;
      _local_a0 = auVar8;
      fVar264 = *(float *)(bspline_basis0 + lVar137 + 0x484);
      fVar265 = *(float *)(bspline_basis0 + lVar137 + 0x488);
      fVar266 = *(float *)(bspline_basis0 + lVar137 + 0x48c);
      fVar308 = *(float *)(bspline_basis0 + lVar137 + 0x490);
      fVar310 = *(float *)(bspline_basis0 + lVar137 + 0x494);
      fVar221 = *(float *)(bspline_basis0 + lVar137 + 0x498);
      fVar297 = *(float *)(bspline_basis0 + lVar137 + 0x49c);
      fVar312 = *(float *)(bspline_basis0 + lVar137 + 0x4a0);
      fVar246 = auVar8._0_4_;
      fVar259 = auVar8._4_4_;
      fVar261 = auVar8._8_4_;
      fVar263 = auVar8._12_4_;
      auVar8 = vshufps_avx(auVar356,auVar356,0x55);
      register0x00001550 = auVar8;
      _local_140 = auVar8;
      fVar355 = auVar8._0_4_;
      fVar361 = auVar8._4_4_;
      fVar362 = auVar8._8_4_;
      fVar363 = auVar8._12_4_;
      auVar8 = vshufps_avx(auVar192,auVar192,0xff);
      register0x00001590 = auVar8;
      _local_c0 = auVar8;
      fVar364 = auVar8._0_4_;
      fVar368 = auVar8._4_4_;
      fVar369 = auVar8._8_4_;
      fVar370 = auVar8._12_4_;
      fVar199 = *(float *)(bspline_basis0 + lVar137 + 0x924) + 0.0 + 0.0;
      auVar8 = vshufps_avx(auVar167,auVar167,0);
      register0x00001210 = auVar8;
      _local_380 = auVar8;
      fVar314 = *(float *)(bspline_basis0 + lVar137);
      fVar224 = *(float *)(bspline_basis0 + lVar137 + 4);
      fVar200 = *(float *)(bspline_basis0 + lVar137 + 8);
      fVar143 = *(float *)(bspline_basis0 + lVar137 + 0xc);
      fVar157 = *(float *)(bspline_basis0 + lVar137 + 0x10);
      fVar158 = *(float *)(bspline_basis0 + lVar137 + 0x14);
      fVar159 = *(float *)(bspline_basis0 + lVar137 + 0x18);
      fVar201 = auVar8._0_4_;
      fVar215 = auVar8._4_4_;
      fVar222 = auVar8._8_4_;
      fVar237 = auVar8._12_4_;
      auVar302._0_4_ = fVar314 * fVar201 + fVar246 * fVar264 + fVar315 * fVar213 + fVar226 * fVar241
      ;
      auVar302._4_4_ = fVar224 * fVar215 + fVar259 * fVar265 + fVar326 * fVar214 + fVar236 * fVar242
      ;
      auVar302._8_4_ = fVar200 * fVar222 + fVar261 * fVar266 + fVar329 * fVar217 + fVar238 * fVar243
      ;
      auVar302._12_4_ =
           fVar143 * fVar237 + fVar263 * fVar308 + fVar332 * fVar219 + fVar240 * fVar245;
      auVar302._16_4_ =
           fVar157 * fVar201 + fVar246 * fVar310 + fVar315 * fVar225 + fVar226 * fVar258;
      auVar302._20_4_ =
           fVar158 * fVar215 + fVar259 * fVar221 + fVar326 * fVar235 + fVar236 * fVar260;
      auVar302._24_4_ =
           fVar159 * fVar222 + fVar261 * fVar297 + fVar329 * fVar239 + fVar238 * fVar262;
      auVar302._28_4_ = fVar312 + 0.0;
      auVar8 = vshufps_avx(auVar167,auVar167,0x55);
      register0x00001490 = auVar8;
      _local_4e0 = auVar8;
      fVar337 = auVar8._0_4_;
      fVar343 = auVar8._4_4_;
      fVar345 = auVar8._8_4_;
      fVar346 = auVar8._12_4_;
      auVar350._0_4_ = fVar337 * fVar314 + fVar355 * fVar264 + fVar267 * fVar213 + fVar371 * fVar241
      ;
      auVar350._4_4_ = fVar343 * fVar224 + fVar361 * fVar265 + fVar277 * fVar214 + fVar374 * fVar242
      ;
      auVar350._8_4_ = fVar345 * fVar200 + fVar362 * fVar266 + fVar278 * fVar217 + fVar375 * fVar243
      ;
      auVar350._12_4_ =
           fVar346 * fVar143 + fVar363 * fVar308 + fVar279 * fVar219 + fVar376 * fVar245;
      auVar350._16_4_ =
           fVar337 * fVar157 + fVar355 * fVar310 + fVar267 * fVar225 + fVar371 * fVar258;
      auVar350._20_4_ =
           fVar343 * fVar158 + fVar361 * fVar221 + fVar277 * fVar235 + fVar374 * fVar260;
      auVar350._24_4_ =
           fVar345 * fVar159 + fVar362 * fVar297 + fVar278 * fVar239 + fVar375 * fVar262;
      auVar350._28_4_ = 0;
      auVar8 = vpermilps_avx(auVar250,0xff);
      register0x00001450 = auVar8;
      _local_180 = auVar8;
      fVar316 = auVar8._0_4_;
      fVar327 = auVar8._4_4_;
      fVar330 = auVar8._8_4_;
      fVar164 = fVar316 * fVar314 + fVar364 * fVar264 + fVar336 * fVar213 + fVar281 * fVar241;
      fVar180 = fVar327 * fVar224 + fVar368 * fVar265 + fVar342 * fVar214 + fVar291 * fVar242;
      fVar181 = fVar330 * fVar200 + fVar369 * fVar266 + fVar344 * fVar217 + fVar293 * fVar243;
      fVar182 = auVar8._12_4_ * fVar143 +
                fVar370 * fVar308 + auVar12._12_4_ * fVar219 + fVar295 * fVar245;
      fVar183 = fVar316 * fVar157 + fVar364 * fVar310 + fVar336 * fVar225 + fVar281 * fVar258;
      fVar185 = fVar327 * fVar158 + fVar368 * fVar221 + fVar342 * fVar235 + fVar291 * fVar260;
      fVar186 = fVar330 * fVar159 + fVar369 * fVar297 + fVar344 * fVar239 + fVar293 * fVar262;
      fVar187 = fVar199 + 0.0;
      fVar160 = *(float *)(bspline_basis1 + lVar137 + 0x908);
      fVar161 = *(float *)(bspline_basis1 + lVar137 + 0x90c);
      fVar162 = *(float *)(bspline_basis1 + lVar137 + 0x910);
      fVar163 = *(float *)(bspline_basis1 + lVar137 + 0x914);
      fVar244 = *(float *)(bspline_basis1 + lVar137 + 0x918);
      fVar280 = *(float *)(bspline_basis1 + lVar137 + 0x91c);
      fVar216 = *(float *)(bspline_basis1 + lVar137 + 0x920);
      fVar218 = *(float *)(bspline_basis1 + lVar137 + 0xd8c);
      fVar220 = *(float *)(bspline_basis1 + lVar137 + 0xd90);
      fVar223 = *(float *)(bspline_basis1 + lVar137 + 0xd94);
      fVar298 = *(float *)(bspline_basis1 + lVar137 + 0xd98);
      fVar306 = *(float *)(bspline_basis1 + lVar137 + 0xd9c);
      fVar307 = *(float *)(bspline_basis1 + lVar137 + 0xda0);
      fVar309 = *(float *)(bspline_basis1 + lVar137 + 0xda4);
      fVar311 = *(float *)(bspline_basis1 + lVar137 + 0x484);
      fVar313 = *(float *)(bspline_basis1 + lVar137 + 0x488);
      fVar317 = *(float *)(bspline_basis1 + lVar137 + 0x48c);
      fVar328 = *(float *)(bspline_basis1 + lVar137 + 0x490);
      fVar331 = *(float *)(bspline_basis1 + lVar137 + 0x494);
      fVar333 = *(float *)(bspline_basis1 + lVar137 + 0x498);
      fVar334 = *(float *)(bspline_basis1 + lVar137 + 0x49c);
      fVar214 = fVar363 + fVar199 + 0.0;
      fVar199 = *(float *)(bspline_basis1 + lVar137);
      fVar335 = *(float *)(bspline_basis1 + lVar137 + 4);
      fVar365 = *(float *)(bspline_basis1 + lVar137 + 8);
      fVar282 = *(float *)(bspline_basis1 + lVar137 + 0xc);
      fVar292 = *(float *)(bspline_basis1 + lVar137 + 0x10);
      fVar294 = *(float *)(bspline_basis1 + lVar137 + 0x14);
      fVar296 = *(float *)(bspline_basis1 + lVar137 + 0x18);
      auVar229._0_4_ = fVar201 * fVar199 + fVar246 * fVar311 + fVar160 * fVar315 + fVar218 * fVar226
      ;
      auVar229._4_4_ = fVar215 * fVar335 + fVar259 * fVar313 + fVar161 * fVar326 + fVar220 * fVar236
      ;
      auVar229._8_4_ = fVar222 * fVar365 + fVar261 * fVar317 + fVar162 * fVar329 + fVar223 * fVar238
      ;
      auVar229._12_4_ =
           fVar237 * fVar282 + fVar263 * fVar328 + fVar163 * fVar332 + fVar298 * fVar240;
      auVar229._16_4_ =
           fVar201 * fVar292 + fVar246 * fVar331 + fVar244 * fVar315 + fVar306 * fVar226;
      auVar229._20_4_ =
           fVar215 * fVar294 + fVar259 * fVar333 + fVar280 * fVar326 + fVar307 * fVar236;
      auVar229._24_4_ =
           fVar222 * fVar296 + fVar261 * fVar334 + fVar216 * fVar329 + fVar309 * fVar238;
      auVar229._28_4_ = fVar370 + fVar214;
      auVar207._0_4_ = fVar337 * fVar199 + fVar355 * fVar311 + fVar160 * fVar267 + fVar371 * fVar218
      ;
      auVar207._4_4_ = fVar343 * fVar335 + fVar361 * fVar313 + fVar161 * fVar277 + fVar374 * fVar220
      ;
      auVar207._8_4_ = fVar345 * fVar365 + fVar362 * fVar317 + fVar162 * fVar278 + fVar375 * fVar223
      ;
      auVar207._12_4_ =
           fVar346 * fVar282 + fVar363 * fVar328 + fVar163 * fVar279 + fVar376 * fVar298;
      auVar207._16_4_ =
           fVar337 * fVar292 + fVar355 * fVar331 + fVar244 * fVar267 + fVar371 * fVar306;
      auVar207._20_4_ =
           fVar343 * fVar294 + fVar361 * fVar333 + fVar280 * fVar277 + fVar374 * fVar307;
      auVar207._24_4_ =
           fVar345 * fVar296 + fVar362 * fVar334 + fVar216 * fVar278 + fVar375 * fVar309;
      auVar207._28_4_ = fVar214 + fVar363 + fVar312 + 0.0;
      local_7a0._0_4_ =
           fVar364 * fVar311 + fVar160 * fVar336 + fVar218 * fVar281 + fVar316 * fVar199;
      local_7a0._4_4_ =
           fVar368 * fVar313 + fVar161 * fVar342 + fVar220 * fVar291 + fVar327 * fVar335;
      local_7a0._8_4_ =
           fVar369 * fVar317 + fVar162 * fVar344 + fVar223 * fVar293 + fVar330 * fVar365;
      local_7a0._12_4_ =
           fVar370 * fVar328 + fVar163 * auVar12._12_4_ + fVar298 * fVar295 +
           auVar8._12_4_ * fVar282;
      local_7a0._16_4_ =
           fVar364 * fVar331 + fVar244 * fVar336 + fVar306 * fVar281 + fVar316 * fVar292;
      local_7a0._20_4_ =
           fVar368 * fVar333 + fVar280 * fVar342 + fVar307 * fVar291 + fVar327 * fVar294;
      local_7a0._24_4_ =
           fVar369 * fVar334 + fVar216 * fVar344 + fVar309 * fVar293 + fVar330 * fVar296;
      local_7a0._28_4_ = fVar363 + fVar295 + fVar312 + fVar214;
      auVar321 = vsubps_avx(auVar229,auVar302);
      auVar23 = vsubps_avx(auVar207,auVar350);
      fVar213 = auVar321._0_4_;
      fVar217 = auVar321._4_4_;
      auVar29._4_4_ = auVar350._4_4_ * fVar217;
      auVar29._0_4_ = auVar350._0_4_ * fVar213;
      fVar225 = auVar321._8_4_;
      auVar29._8_4_ = auVar350._8_4_ * fVar225;
      fVar239 = auVar321._12_4_;
      auVar29._12_4_ = auVar350._12_4_ * fVar239;
      fVar242 = auVar321._16_4_;
      auVar29._16_4_ = auVar350._16_4_ * fVar242;
      fVar245 = auVar321._20_4_;
      auVar29._20_4_ = auVar350._20_4_ * fVar245;
      fVar260 = auVar321._24_4_;
      auVar29._24_4_ = auVar350._24_4_ * fVar260;
      auVar29._28_4_ = fVar214;
      fVar214 = auVar23._0_4_;
      fVar219 = auVar23._4_4_;
      auVar30._4_4_ = auVar302._4_4_ * fVar219;
      auVar30._0_4_ = auVar302._0_4_ * fVar214;
      fVar235 = auVar23._8_4_;
      auVar30._8_4_ = auVar302._8_4_ * fVar235;
      fVar241 = auVar23._12_4_;
      auVar30._12_4_ = auVar302._12_4_ * fVar241;
      fVar243 = auVar23._16_4_;
      auVar30._16_4_ = auVar302._16_4_ * fVar243;
      fVar258 = auVar23._20_4_;
      auVar30._20_4_ = auVar302._20_4_ * fVar258;
      fVar262 = auVar23._24_4_;
      auVar30._24_4_ = auVar302._24_4_ * fVar262;
      auVar30._28_4_ = auVar207._28_4_;
      auVar22 = vsubps_avx(auVar29,auVar30);
      auVar112._4_4_ = fVar180;
      auVar112._0_4_ = fVar164;
      auVar112._8_4_ = fVar181;
      auVar112._12_4_ = fVar182;
      auVar112._16_4_ = fVar183;
      auVar112._20_4_ = fVar185;
      auVar112._24_4_ = fVar186;
      auVar112._28_4_ = fVar187;
      auVar21 = vmaxps_avx(auVar112,local_7a0);
      auVar31._4_4_ = auVar21._4_4_ * auVar21._4_4_ * (fVar217 * fVar217 + fVar219 * fVar219);
      auVar31._0_4_ = auVar21._0_4_ * auVar21._0_4_ * (fVar213 * fVar213 + fVar214 * fVar214);
      auVar31._8_4_ = auVar21._8_4_ * auVar21._8_4_ * (fVar225 * fVar225 + fVar235 * fVar235);
      auVar31._12_4_ = auVar21._12_4_ * auVar21._12_4_ * (fVar239 * fVar239 + fVar241 * fVar241);
      auVar31._16_4_ = auVar21._16_4_ * auVar21._16_4_ * (fVar242 * fVar242 + fVar243 * fVar243);
      auVar31._20_4_ = auVar21._20_4_ * auVar21._20_4_ * (fVar245 * fVar245 + fVar258 * fVar258);
      auVar31._24_4_ = auVar21._24_4_ * auVar21._24_4_ * (fVar260 * fVar260 + fVar262 * fVar262);
      auVar31._28_4_ = auVar23._28_4_ + auVar207._28_4_;
      auVar32._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar32._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar32._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar32._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar32._16_4_ = auVar22._16_4_ * auVar22._16_4_;
      auVar32._20_4_ = auVar22._20_4_ * auVar22._20_4_;
      auVar32._24_4_ = auVar22._24_4_ * auVar22._24_4_;
      auVar32._28_4_ = auVar22._28_4_;
      auVar21 = vcmpps_avx(auVar32,auVar31,2);
      local_520 = (float)(int)uVar17;
      fStack_51c = 0.0;
      fStack_518 = 0.0;
      fStack_514 = 0.0;
      auVar8 = vshufps_avx(ZEXT416((uint)local_520),ZEXT416((uint)local_520),0);
      auVar208._16_16_ = auVar8;
      auVar208._0_16_ = auVar8;
      auVar22 = vcmpps_avx(_DAT_01faff40,auVar208,1);
      auVar212 = ZEXT3264(auVar22);
      auVar8 = vpermilps_avx(auVar167,0xaa);
      register0x00001450 = auVar8;
      _local_560 = auVar8;
      auVar9 = vpermilps_avx(auVar356,0xaa);
      register0x00001550 = auVar9;
      _local_360 = auVar9;
      auVar10 = vpermilps_avx(auVar249,0xaa);
      register0x00001590 = auVar10;
      _local_e0 = auVar10;
      auVar11 = vpermilps_avx(auVar299,0xaa);
      register0x00001310 = auVar11;
      _local_780 = auVar11;
      auVar24 = auVar22 & auVar21;
      local_6c0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x30));
      auVar203 = ZEXT416((uint)(auVar203._0_4_ * 4.7683716e-07));
      local_740._0_16_ = auVar203;
      local_880 = auVar250._0_4_;
      fStack_87c = auVar250._4_4_;
      fStack_878 = auVar250._8_4_;
      fStack_874 = auVar250._12_4_;
      local_290 = auVar250._0_8_;
      uVar127 = local_290;
      uStack_288 = auVar250._8_8_;
      uVar128 = uStack_288;
      local_860 = auVar192._0_4_;
      fStack_85c = auVar192._4_4_;
      fStack_858 = auVar192._8_4_;
      fStack_854 = auVar192._12_4_;
      local_280 = auVar192._0_8_;
      uVar129 = local_280;
      uStack_278 = auVar192._8_8_;
      uVar130 = uStack_278;
      local_870 = auVar184._0_4_;
      fStack_86c = auVar184._4_4_;
      fStack_868 = auVar184._8_4_;
      fStack_864 = auVar184._12_4_;
      local_270 = auVar184._0_8_;
      uVar131 = local_270;
      uStack_268 = auVar184._8_8_;
      uVar132 = uStack_268;
      local_850 = auVar7._0_4_;
      fStack_84c = auVar7._4_4_;
      fStack_848 = auVar7._8_4_;
      fStack_844 = auVar7._12_4_;
      if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar24 >> 0x7f,0) == '\0') &&
            (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0xbf,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f])
      {
        auVar305 = ZEXT3264(auVar146);
        auVar325 = ZEXT3264(auVar303);
LAB_010d93d4:
        auVar234 = ZEXT3264(_local_780);
        uVar138 = 0;
      }
      else {
        local_3a0 = vandps_avx(auVar21,auVar22);
        fVar281 = auVar8._0_4_;
        fVar291 = auVar8._4_4_;
        fVar293 = auVar8._8_4_;
        fVar295 = auVar8._12_4_;
        fVar316 = auVar9._0_4_;
        fVar327 = auVar9._4_4_;
        fVar330 = auVar9._8_4_;
        fVar336 = auVar9._12_4_;
        fVar342 = auVar10._0_4_;
        fVar344 = auVar10._4_4_;
        fVar364 = auVar10._8_4_;
        fVar368 = auVar10._12_4_;
        fVar213 = auVar11._0_4_;
        fVar214 = auVar11._4_4_;
        fVar217 = auVar11._8_4_;
        fVar219 = auVar11._12_4_;
        local_3c0._0_4_ =
             fVar281 * fVar199 + fVar316 * fVar311 + fVar342 * fVar160 + fVar218 * fVar213;
        local_3c0._4_4_ =
             fVar291 * fVar335 + fVar327 * fVar313 + fVar344 * fVar161 + fVar220 * fVar214;
        fStack_3b8 = fVar293 * fVar365 + fVar330 * fVar317 + fVar364 * fVar162 + fVar223 * fVar217;
        fStack_3b4 = fVar295 * fVar282 + fVar336 * fVar328 + fVar368 * fVar163 + fVar298 * fVar219;
        fStack_3b0 = fVar281 * fVar292 + fVar316 * fVar331 + fVar342 * fVar244 + fVar306 * fVar213;
        fStack_3ac = fVar291 * fVar294 + fVar327 * fVar333 + fVar344 * fVar280 + fVar307 * fVar214;
        fStack_3a8 = fVar293 * fVar296 + fVar330 * fVar334 + fVar364 * fVar216 + fVar309 * fVar217;
        fStack_3a4 = local_3a0._28_4_ +
                     auVar22._28_4_ + *(float *)(bspline_basis1 + lVar137 + 0x924) + 0.0;
        local_5e0._0_4_ = auVar121._0_4_;
        local_5e0._4_4_ = auVar121._4_4_;
        fStack_5d8 = auVar121._8_4_;
        fStack_5d4 = auVar121._12_4_;
        fStack_5d0 = auVar121._16_4_;
        fStack_5cc = auVar121._20_4_;
        fStack_5c8 = auVar121._24_4_;
        local_6e0._0_4_ = auVar120._0_4_;
        local_6e0._4_4_ = auVar120._4_4_;
        fStack_6d8 = auVar120._8_4_;
        fStack_6d4 = auVar120._12_4_;
        fStack_6d0 = auVar120._16_4_;
        fStack_6cc = auVar120._20_4_;
        fStack_6c8 = auVar120._24_4_;
        local_5e0._0_4_ =
             fVar281 * fVar314 +
             fVar316 * fVar264 + fVar342 * (float)local_5e0._0_4_ + fVar213 * (float)local_6e0._0_4_
        ;
        local_5e0._4_4_ =
             fVar291 * fVar224 +
             fVar327 * fVar265 + fVar344 * (float)local_5e0._4_4_ + fVar214 * (float)local_6e0._4_4_
        ;
        fStack_5d8 = fVar293 * fVar200 +
                     fVar330 * fVar266 + fVar364 * fStack_5d8 + fVar217 * fStack_6d8;
        fStack_5d4 = fVar295 * fVar143 +
                     fVar336 * fVar308 + fVar368 * fStack_5d4 + fVar219 * fStack_6d4;
        fStack_5d0 = fVar281 * fVar157 +
                     fVar316 * fVar310 + fVar342 * fStack_5d0 + fVar213 * fStack_6d0;
        fStack_5cc = fVar291 * fVar158 +
                     fVar327 * fVar221 + fVar344 * fStack_5cc + fVar214 * fStack_6cc;
        fStack_5c8 = fVar293 * fVar159 +
                     fVar330 * fVar297 + fVar364 * fStack_5c8 + fVar217 * fStack_6c8;
        fStack_5c4 = fVar346 + fStack_3a4 + local_3a0._28_4_ + auVar22._28_4_;
        fVar225 = *(float *)(bspline_basis0 + lVar137 + 0x1210);
        fVar235 = *(float *)(bspline_basis0 + lVar137 + 0x1214);
        fVar239 = *(float *)(bspline_basis0 + lVar137 + 0x1218);
        fVar241 = *(float *)(bspline_basis0 + lVar137 + 0x121c);
        fVar242 = *(float *)(bspline_basis0 + lVar137 + 0x1220);
        fVar243 = *(float *)(bspline_basis0 + lVar137 + 0x1224);
        fVar245 = *(float *)(bspline_basis0 + lVar137 + 0x1228);
        fVar258 = *(float *)(bspline_basis0 + lVar137 + 0x1694);
        fVar260 = *(float *)(bspline_basis0 + lVar137 + 0x1698);
        fVar262 = *(float *)(bspline_basis0 + lVar137 + 0x169c);
        fVar264 = *(float *)(bspline_basis0 + lVar137 + 0x16a0);
        fVar265 = *(float *)(bspline_basis0 + lVar137 + 0x16a4);
        fVar266 = *(float *)(bspline_basis0 + lVar137 + 0x16a8);
        fVar308 = *(float *)(bspline_basis0 + lVar137 + 0x16ac);
        fVar310 = *(float *)(bspline_basis0 + lVar137 + 0x1b18);
        fVar221 = *(float *)(bspline_basis0 + lVar137 + 0x1b1c);
        fVar297 = *(float *)(bspline_basis0 + lVar137 + 0x1b20);
        fVar312 = *(float *)(bspline_basis0 + lVar137 + 0x1b24);
        fVar314 = *(float *)(bspline_basis0 + lVar137 + 0x1b28);
        fVar224 = *(float *)(bspline_basis0 + lVar137 + 0x1b2c);
        fVar200 = *(float *)(bspline_basis0 + lVar137 + 0x1b30);
        fVar143 = *(float *)(bspline_basis0 + lVar137 + 0x1f9c);
        fVar157 = *(float *)(bspline_basis0 + lVar137 + 0x1fa0);
        fVar158 = *(float *)(bspline_basis0 + lVar137 + 0x1fa4);
        fVar159 = *(float *)(bspline_basis0 + lVar137 + 0x1fa8);
        fVar160 = *(float *)(bspline_basis0 + lVar137 + 0x1fac);
        fVar161 = *(float *)(bspline_basis0 + lVar137 + 0x1fb0);
        fVar162 = *(float *)(bspline_basis0 + lVar137 + 0x1fb4);
        fVar163 = *(float *)(bspline_basis0 + lVar137 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar137 + 0x1fb8);
        fVar244 = *(float *)(bspline_basis0 + lVar137 + 0x16b0) + fVar163;
        local_620 = fVar201 * fVar225 + fVar246 * fVar258 + fVar315 * fVar310 + fVar226 * fVar143;
        fStack_61c = fVar215 * fVar235 + fVar259 * fVar260 + fVar326 * fVar221 + fVar236 * fVar157;
        fStack_618 = fVar222 * fVar239 + fVar261 * fVar262 + fVar329 * fVar297 + fVar238 * fVar158;
        fStack_614 = fVar237 * fVar241 + fVar263 * fVar264 + fVar332 * fVar312 + fVar240 * fVar159;
        fStack_610 = fVar201 * fVar242 + fVar246 * fVar265 + fVar315 * fVar314 + fVar226 * fVar160;
        fStack_60c = fVar215 * fVar243 + fVar259 * fVar266 + fVar326 * fVar224 + fVar236 * fVar161;
        fStack_608 = fVar222 * fVar245 + fVar261 * fVar308 + fVar329 * fVar200 + fVar238 * fVar162;
        fStack_604 = *(float *)(bspline_basis0 + lVar137 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar137 + 0x1fb8) +
                     fVar295 + *(float *)(bspline_basis1 + lVar137 + 0x4a0);
        auVar272._0_4_ =
             fVar337 * fVar225 + fVar355 * fVar258 + fVar267 * fVar310 + fVar371 * fVar143;
        auVar272._4_4_ =
             fVar343 * fVar235 + fVar361 * fVar260 + fVar277 * fVar221 + fVar374 * fVar157;
        auVar272._8_4_ =
             fVar345 * fVar239 + fVar362 * fVar262 + fVar278 * fVar297 + fVar375 * fVar158;
        auVar272._12_4_ =
             fVar346 * fVar241 + fVar363 * fVar264 + fVar279 * fVar312 + fVar376 * fVar159;
        auVar272._16_4_ =
             fVar337 * fVar242 + fVar355 * fVar265 + fVar267 * fVar314 + fVar371 * fVar160;
        auVar272._20_4_ =
             fVar343 * fVar243 + fVar361 * fVar266 + fVar277 * fVar224 + fVar374 * fVar161;
        auVar272._24_4_ =
             fVar345 * fVar245 + fVar362 * fVar308 + fVar278 * fVar200 + fVar375 * fVar162;
        auVar272._28_4_ =
             fVar163 + fVar295 + *(float *)(bspline_basis1 + lVar137 + 0x4a0) +
                       fVar295 + *(float *)(bspline_basis1 + lVar137 + 0x1c);
        local_640 = fVar281 * fVar225 + fVar316 * fVar258 + fVar342 * fVar310 + fVar213 * fVar143;
        fStack_63c = fVar291 * fVar235 + fVar327 * fVar260 + fVar344 * fVar221 + fVar214 * fVar157;
        fStack_638 = fVar293 * fVar239 + fVar330 * fVar262 + fVar364 * fVar297 + fVar217 * fVar158;
        fStack_634 = fVar295 * fVar241 + fVar336 * fVar264 + fVar368 * fVar312 + fVar219 * fVar159;
        fStack_630 = fVar281 * fVar242 + fVar316 * fVar265 + fVar342 * fVar314 + fVar213 * fVar160;
        fStack_62c = fVar291 * fVar243 + fVar327 * fVar266 + fVar344 * fVar224 + fVar214 * fVar161;
        fStack_628 = fVar293 * fVar245 + fVar330 * fVar308 + fVar364 * fVar200 + fVar217 * fVar162;
        fStack_624 = *(float *)(bspline_basis0 + lVar137 + 0x122c) + fVar244;
        fVar225 = *(float *)(bspline_basis1 + lVar137 + 0x1b18);
        fVar235 = *(float *)(bspline_basis1 + lVar137 + 0x1b1c);
        fVar239 = *(float *)(bspline_basis1 + lVar137 + 0x1b20);
        fVar241 = *(float *)(bspline_basis1 + lVar137 + 0x1b24);
        fVar242 = *(float *)(bspline_basis1 + lVar137 + 0x1b28);
        fVar243 = *(float *)(bspline_basis1 + lVar137 + 0x1b2c);
        fVar245 = *(float *)(bspline_basis1 + lVar137 + 0x1b30);
        fVar258 = *(float *)(bspline_basis1 + lVar137 + 0x1f9c);
        fVar260 = *(float *)(bspline_basis1 + lVar137 + 0x1fa0);
        fVar262 = *(float *)(bspline_basis1 + lVar137 + 0x1fa4);
        fVar264 = *(float *)(bspline_basis1 + lVar137 + 0x1fa8);
        fVar265 = *(float *)(bspline_basis1 + lVar137 + 0x1fac);
        fVar266 = *(float *)(bspline_basis1 + lVar137 + 0x1fb0);
        fVar308 = *(float *)(bspline_basis1 + lVar137 + 0x1fb4);
        fVar310 = *(float *)(bspline_basis1 + lVar137 + 0x1694);
        fVar221 = *(float *)(bspline_basis1 + lVar137 + 0x1698);
        fVar297 = *(float *)(bspline_basis1 + lVar137 + 0x169c);
        fVar312 = *(float *)(bspline_basis1 + lVar137 + 0x16a0);
        fVar314 = *(float *)(bspline_basis1 + lVar137 + 0x16a4);
        fVar224 = *(float *)(bspline_basis1 + lVar137 + 0x16a8);
        fVar200 = *(float *)(bspline_basis1 + lVar137 + 0x16ac);
        fVar143 = *(float *)(bspline_basis1 + lVar137 + 0x1210);
        fVar157 = *(float *)(bspline_basis1 + lVar137 + 0x1214);
        fVar158 = *(float *)(bspline_basis1 + lVar137 + 0x1218);
        fVar159 = *(float *)(bspline_basis1 + lVar137 + 0x121c);
        fVar160 = *(float *)(bspline_basis1 + lVar137 + 0x1220);
        fVar161 = *(float *)(bspline_basis1 + lVar137 + 0x1224);
        fVar162 = *(float *)(bspline_basis1 + lVar137 + 0x1228);
        auVar289._0_4_ =
             fVar201 * fVar143 + fVar246 * fVar310 + fVar315 * fVar225 + fVar226 * fVar258;
        auVar289._4_4_ =
             fVar215 * fVar157 + fVar259 * fVar221 + fVar326 * fVar235 + fVar236 * fVar260;
        auVar289._8_4_ =
             fVar222 * fVar158 + fVar261 * fVar297 + fVar329 * fVar239 + fVar238 * fVar262;
        auVar289._12_4_ =
             fVar237 * fVar159 + fVar263 * fVar312 + fVar332 * fVar241 + fVar240 * fVar264;
        auVar289._16_4_ =
             fVar201 * fVar160 + fVar246 * fVar314 + fVar315 * fVar242 + fVar226 * fVar265;
        auVar289._20_4_ =
             fVar215 * fVar161 + fVar259 * fVar224 + fVar326 * fVar243 + fVar236 * fVar266;
        auVar289._24_4_ =
             fVar222 * fVar162 + fVar261 * fVar200 + fVar329 * fVar245 + fVar238 * fVar308;
        auVar289._28_4_ = fVar332 + fVar332 + fVar295 + fVar244;
        auVar319._0_4_ =
             fVar337 * fVar143 + fVar355 * fVar310 + fVar267 * fVar225 + fVar371 * fVar258;
        auVar319._4_4_ =
             fVar343 * fVar157 + fVar361 * fVar221 + fVar277 * fVar235 + fVar374 * fVar260;
        auVar319._8_4_ =
             fVar345 * fVar158 + fVar362 * fVar297 + fVar278 * fVar239 + fVar375 * fVar262;
        auVar319._12_4_ =
             fVar346 * fVar159 + fVar363 * fVar312 + fVar279 * fVar241 + fVar376 * fVar264;
        auVar319._16_4_ =
             fVar337 * fVar160 + fVar355 * fVar314 + fVar267 * fVar242 + fVar371 * fVar265;
        auVar319._20_4_ =
             fVar343 * fVar161 + fVar361 * fVar224 + fVar277 * fVar243 + fVar374 * fVar266;
        auVar319._24_4_ =
             fVar345 * fVar162 + fVar362 * fVar200 + fVar278 * fVar245 + fVar375 * fVar308;
        auVar319._28_4_ = fVar332 + fVar332 + fVar332 + fVar295;
        auVar198._0_4_ =
             fVar281 * fVar143 + fVar316 * fVar310 + fVar342 * fVar225 + fVar258 * fVar213;
        auVar198._4_4_ =
             fVar291 * fVar157 + fVar327 * fVar221 + fVar344 * fVar235 + fVar260 * fVar214;
        auVar198._8_4_ =
             fVar293 * fVar158 + fVar330 * fVar297 + fVar364 * fVar239 + fVar262 * fVar217;
        auVar198._12_4_ =
             fVar295 * fVar159 + fVar336 * fVar312 + fVar368 * fVar241 + fVar264 * fVar219;
        auVar198._16_4_ =
             fVar281 * fVar160 + fVar316 * fVar314 + fVar342 * fVar242 + fVar265 * fVar213;
        auVar198._20_4_ =
             fVar291 * fVar161 + fVar327 * fVar224 + fVar344 * fVar243 + fVar266 * fVar214;
        auVar198._24_4_ =
             fVar293 * fVar162 + fVar330 * fVar200 + fVar364 * fVar245 + fVar308 * fVar217;
        auVar198._28_4_ =
             *(float *)(bspline_basis1 + lVar137 + 0x122c) +
             *(float *)(bspline_basis1 + lVar137 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar137 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar137 + 0x1fb8);
        auVar230._8_4_ = 0x7fffffff;
        auVar230._0_8_ = 0x7fffffff7fffffff;
        auVar230._12_4_ = 0x7fffffff;
        auVar230._16_4_ = 0x7fffffff;
        auVar230._20_4_ = 0x7fffffff;
        auVar230._24_4_ = 0x7fffffff;
        auVar230._28_4_ = 0x7fffffff;
        auVar117._4_4_ = fStack_61c;
        auVar117._0_4_ = local_620;
        auVar117._8_4_ = fStack_618;
        auVar117._12_4_ = fStack_614;
        auVar117._16_4_ = fStack_610;
        auVar117._20_4_ = fStack_60c;
        auVar117._24_4_ = fStack_608;
        auVar117._28_4_ = fStack_604;
        auVar21 = vandps_avx(auVar117,auVar230);
        auVar22 = vandps_avx(auVar272,auVar230);
        auVar22 = vmaxps_avx(auVar21,auVar22);
        auVar115._4_4_ = fStack_63c;
        auVar115._0_4_ = local_640;
        auVar115._8_4_ = fStack_638;
        auVar115._12_4_ = fStack_634;
        auVar115._16_4_ = fStack_630;
        auVar115._20_4_ = fStack_62c;
        auVar115._24_4_ = fStack_628;
        auVar115._28_4_ = fStack_624;
        auVar21 = vandps_avx(auVar230,auVar115);
        auVar21 = vmaxps_avx(auVar22,auVar21);
        auVar250 = vpermilps_avx(auVar203,0);
        auVar273._16_16_ = auVar250;
        auVar273._0_16_ = auVar250;
        auVar21 = vcmpps_avx(auVar21,auVar273,1);
        auVar24 = vblendvps_avx(auVar117,auVar321,auVar21);
        auVar25 = vblendvps_avx(auVar272,auVar23,auVar21);
        auVar21 = vandps_avx(auVar289,auVar230);
        auVar22 = vandps_avx(auVar319,auVar230);
        auVar26 = vmaxps_avx(auVar21,auVar22);
        auVar21 = vandps_avx(auVar198,auVar230);
        auVar21 = vmaxps_avx(auVar26,auVar21);
        auVar26 = vcmpps_avx(auVar21,auVar273,1);
        auVar21 = vblendvps_avx(auVar289,auVar321,auVar26);
        auVar321 = vblendvps_avx(auVar319,auVar23,auVar26);
        fVar143 = auVar24._0_4_;
        fVar157 = auVar24._4_4_;
        fVar158 = auVar24._8_4_;
        fVar159 = auVar24._12_4_;
        fVar160 = auVar24._16_4_;
        fVar161 = auVar24._20_4_;
        fVar162 = auVar24._24_4_;
        fVar163 = auVar21._0_4_;
        fVar244 = auVar21._4_4_;
        fVar280 = auVar21._8_4_;
        fVar216 = auVar21._12_4_;
        fVar218 = auVar21._16_4_;
        fVar220 = auVar21._20_4_;
        fVar223 = auVar21._24_4_;
        fVar298 = -auVar21._28_4_;
        fVar201 = auVar25._0_4_;
        fVar217 = auVar25._4_4_;
        fVar235 = auVar25._8_4_;
        fVar242 = auVar25._12_4_;
        fVar260 = auVar25._16_4_;
        fVar266 = auVar25._20_4_;
        fVar297 = auVar25._24_4_;
        auVar149._0_4_ = fVar201 * fVar201 + fVar143 * fVar143;
        auVar149._4_4_ = fVar217 * fVar217 + fVar157 * fVar157;
        auVar149._8_4_ = fVar235 * fVar235 + fVar158 * fVar158;
        auVar149._12_4_ = fVar242 * fVar242 + fVar159 * fVar159;
        auVar149._16_4_ = fVar260 * fVar260 + fVar160 * fVar160;
        auVar149._20_4_ = fVar266 * fVar266 + fVar161 * fVar161;
        auVar149._24_4_ = fVar297 * fVar297 + fVar162 * fVar162;
        auVar149._28_4_ = auVar319._28_4_ + auVar24._28_4_;
        auVar23 = vrsqrtps_avx(auVar149);
        fVar213 = auVar23._0_4_;
        fVar214 = auVar23._4_4_;
        auVar33._4_4_ = fVar214 * 1.5;
        auVar33._0_4_ = fVar213 * 1.5;
        fVar215 = auVar23._8_4_;
        auVar33._8_4_ = fVar215 * 1.5;
        fVar219 = auVar23._12_4_;
        auVar33._12_4_ = fVar219 * 1.5;
        fVar222 = auVar23._16_4_;
        auVar33._16_4_ = fVar222 * 1.5;
        fVar225 = auVar23._20_4_;
        auVar33._20_4_ = fVar225 * 1.5;
        fVar237 = auVar23._24_4_;
        fVar200 = auVar22._28_4_;
        auVar33._24_4_ = fVar237 * 1.5;
        auVar33._28_4_ = fVar200;
        auVar34._4_4_ = fVar214 * fVar214 * fVar214 * auVar149._4_4_ * 0.5;
        auVar34._0_4_ = fVar213 * fVar213 * fVar213 * auVar149._0_4_ * 0.5;
        auVar34._8_4_ = fVar215 * fVar215 * fVar215 * auVar149._8_4_ * 0.5;
        auVar34._12_4_ = fVar219 * fVar219 * fVar219 * auVar149._12_4_ * 0.5;
        auVar34._16_4_ = fVar222 * fVar222 * fVar222 * auVar149._16_4_ * 0.5;
        auVar34._20_4_ = fVar225 * fVar225 * fVar225 * auVar149._20_4_ * 0.5;
        auVar34._24_4_ = fVar237 * fVar237 * fVar237 * auVar149._24_4_ * 0.5;
        auVar34._28_4_ = auVar149._28_4_;
        auVar22 = vsubps_avx(auVar33,auVar34);
        fVar213 = auVar22._0_4_;
        fVar219 = auVar22._4_4_;
        fVar237 = auVar22._8_4_;
        fVar243 = auVar22._12_4_;
        fVar262 = auVar22._16_4_;
        fVar308 = auVar22._20_4_;
        fVar312 = auVar22._24_4_;
        fVar214 = auVar321._0_4_;
        fVar222 = auVar321._4_4_;
        fVar239 = auVar321._8_4_;
        fVar245 = auVar321._12_4_;
        fVar264 = auVar321._16_4_;
        fVar310 = auVar321._20_4_;
        fVar314 = auVar321._24_4_;
        auVar150._0_4_ = fVar214 * fVar214 + fVar163 * fVar163;
        auVar150._4_4_ = fVar222 * fVar222 + fVar244 * fVar244;
        auVar150._8_4_ = fVar239 * fVar239 + fVar280 * fVar280;
        auVar150._12_4_ = fVar245 * fVar245 + fVar216 * fVar216;
        auVar150._16_4_ = fVar264 * fVar264 + fVar218 * fVar218;
        auVar150._20_4_ = fVar310 * fVar310 + fVar220 * fVar220;
        auVar150._24_4_ = fVar314 * fVar314 + fVar223 * fVar223;
        auVar150._28_4_ = auVar21._28_4_ + auVar22._28_4_;
        auVar21 = vrsqrtps_avx(auVar150);
        fVar215 = auVar21._0_4_;
        fVar225 = auVar21._4_4_;
        auVar35._4_4_ = fVar225 * 1.5;
        auVar35._0_4_ = fVar215 * 1.5;
        fVar241 = auVar21._8_4_;
        auVar35._8_4_ = fVar241 * 1.5;
        fVar258 = auVar21._12_4_;
        auVar35._12_4_ = fVar258 * 1.5;
        fVar265 = auVar21._16_4_;
        auVar35._16_4_ = fVar265 * 1.5;
        fVar221 = auVar21._20_4_;
        auVar35._20_4_ = fVar221 * 1.5;
        fVar224 = auVar21._24_4_;
        auVar35._24_4_ = fVar224 * 1.5;
        auVar35._28_4_ = fVar200;
        auVar36._4_4_ = fVar225 * fVar225 * fVar225 * auVar150._4_4_ * 0.5;
        auVar36._0_4_ = fVar215 * fVar215 * fVar215 * auVar150._0_4_ * 0.5;
        auVar36._8_4_ = fVar241 * fVar241 * fVar241 * auVar150._8_4_ * 0.5;
        auVar36._12_4_ = fVar258 * fVar258 * fVar258 * auVar150._12_4_ * 0.5;
        auVar36._16_4_ = fVar265 * fVar265 * fVar265 * auVar150._16_4_ * 0.5;
        auVar36._20_4_ = fVar221 * fVar221 * fVar221 * auVar150._20_4_ * 0.5;
        auVar36._24_4_ = fVar224 * fVar224 * fVar224 * auVar150._24_4_ * 0.5;
        auVar36._28_4_ = auVar150._28_4_;
        auVar21 = vsubps_avx(auVar35,auVar36);
        fVar215 = auVar21._0_4_;
        fVar225 = auVar21._4_4_;
        fVar241 = auVar21._8_4_;
        fVar258 = auVar21._12_4_;
        fVar265 = auVar21._16_4_;
        fVar221 = auVar21._20_4_;
        fVar224 = auVar21._24_4_;
        fVar201 = fVar164 * fVar201 * fVar213;
        fVar217 = fVar180 * fVar217 * fVar219;
        auVar37._4_4_ = fVar217;
        auVar37._0_4_ = fVar201;
        fVar235 = fVar181 * fVar235 * fVar237;
        auVar37._8_4_ = fVar235;
        fVar242 = fVar182 * fVar242 * fVar243;
        auVar37._12_4_ = fVar242;
        fVar260 = fVar183 * fVar260 * fVar262;
        auVar37._16_4_ = fVar260;
        fVar266 = fVar185 * fVar266 * fVar308;
        auVar37._20_4_ = fVar266;
        fVar297 = fVar186 * fVar297 * fVar312;
        auVar37._24_4_ = fVar297;
        auVar37._28_4_ = fVar298;
        local_6e0._4_4_ = auVar302._4_4_ + fVar217;
        local_6e0._0_4_ = auVar302._0_4_ + fVar201;
        fStack_6d8 = auVar302._8_4_ + fVar235;
        fStack_6d4 = auVar302._12_4_ + fVar242;
        fStack_6d0 = auVar302._16_4_ + fVar260;
        fStack_6cc = auVar302._20_4_ + fVar266;
        fStack_6c8 = auVar302._24_4_ + fVar297;
        fStack_6c4 = auVar302._28_4_ + fVar298;
        fVar201 = fVar164 * fVar213 * -fVar143;
        fVar217 = fVar180 * fVar219 * -fVar157;
        auVar38._4_4_ = fVar217;
        auVar38._0_4_ = fVar201;
        fVar235 = fVar181 * fVar237 * -fVar158;
        auVar38._8_4_ = fVar235;
        fVar242 = fVar182 * fVar243 * -fVar159;
        auVar38._12_4_ = fVar242;
        fVar260 = fVar183 * fVar262 * -fVar160;
        auVar38._16_4_ = fVar260;
        fVar266 = fVar185 * fVar308 * -fVar161;
        auVar38._20_4_ = fVar266;
        fVar297 = fVar186 * fVar312 * -fVar162;
        auVar38._24_4_ = fVar297;
        auVar38._28_4_ = fVar200;
        local_600._4_4_ = fVar217 + auVar350._4_4_;
        local_600._0_4_ = fVar201 + auVar350._0_4_;
        fStack_5f8 = fVar235 + auVar350._8_4_;
        fStack_5f4 = fVar242 + auVar350._12_4_;
        fStack_5f0 = fVar260 + auVar350._16_4_;
        fStack_5ec = fVar266 + auVar350._20_4_;
        fStack_5e8 = fVar297 + auVar350._24_4_;
        fStack_5e4 = fVar200 + 0.0;
        fVar201 = fVar213 * 0.0 * fVar164;
        fVar213 = fVar219 * 0.0 * fVar180;
        auVar39._4_4_ = fVar213;
        auVar39._0_4_ = fVar201;
        fVar217 = fVar237 * 0.0 * fVar181;
        auVar39._8_4_ = fVar217;
        fVar219 = fVar243 * 0.0 * fVar182;
        auVar39._12_4_ = fVar219;
        fVar235 = fVar262 * 0.0 * fVar183;
        auVar39._16_4_ = fVar235;
        fVar237 = fVar308 * 0.0 * fVar185;
        auVar39._20_4_ = fVar237;
        fVar242 = fVar312 * 0.0 * fVar186;
        auVar39._24_4_ = fVar242;
        auVar39._28_4_ = fVar263;
        auVar274._0_4_ = fVar201 + (float)local_5e0._0_4_;
        auVar274._4_4_ = fVar213 + (float)local_5e0._4_4_;
        auVar274._8_4_ = fVar217 + fStack_5d8;
        auVar274._12_4_ = fVar219 + fStack_5d4;
        auVar274._16_4_ = fVar235 + fStack_5d0;
        auVar274._20_4_ = fVar237 + fStack_5cc;
        auVar274._24_4_ = fVar242 + fStack_5c8;
        auVar274._28_4_ = fVar263 + fStack_5c4;
        fVar201 = (float)local_7a0._0_4_ * fVar214 * fVar215;
        fVar213 = local_7a0._4_4_ * fVar222 * fVar225;
        auVar40._4_4_ = fVar213;
        auVar40._0_4_ = fVar201;
        fVar214 = local_7a0._8_4_ * fVar239 * fVar241;
        auVar40._8_4_ = fVar214;
        fVar217 = local_7a0._12_4_ * fVar245 * fVar258;
        auVar40._12_4_ = fVar217;
        fVar219 = local_7a0._16_4_ * fVar264 * fVar265;
        auVar40._16_4_ = fVar219;
        fVar222 = local_7a0._20_4_ * fVar310 * fVar221;
        auVar40._20_4_ = fVar222;
        fVar235 = local_7a0._24_4_ * fVar314 * fVar224;
        auVar40._24_4_ = fVar235;
        auVar40._28_4_ = auVar321._28_4_;
        auVar26 = vsubps_avx(auVar302,auVar37);
        auVar320._0_4_ = auVar229._0_4_ + fVar201;
        auVar320._4_4_ = auVar229._4_4_ + fVar213;
        auVar320._8_4_ = auVar229._8_4_ + fVar214;
        auVar320._12_4_ = auVar229._12_4_ + fVar217;
        auVar320._16_4_ = auVar229._16_4_ + fVar219;
        auVar320._20_4_ = auVar229._20_4_ + fVar222;
        auVar320._24_4_ = auVar229._24_4_ + fVar235;
        auVar320._28_4_ = auVar229._28_4_ + auVar321._28_4_;
        fVar201 = (float)local_7a0._0_4_ * fVar215 * -fVar163;
        fVar213 = local_7a0._4_4_ * fVar225 * -fVar244;
        auVar41._4_4_ = fVar213;
        auVar41._0_4_ = fVar201;
        fVar214 = local_7a0._8_4_ * fVar241 * -fVar280;
        auVar41._8_4_ = fVar214;
        fVar217 = local_7a0._12_4_ * fVar258 * -fVar216;
        auVar41._12_4_ = fVar217;
        fVar219 = local_7a0._16_4_ * fVar265 * -fVar218;
        auVar41._16_4_ = fVar219;
        fVar222 = local_7a0._20_4_ * fVar221 * -fVar220;
        auVar41._20_4_ = fVar222;
        fVar235 = local_7a0._24_4_ * fVar224 * -fVar223;
        auVar41._24_4_ = fVar235;
        auVar41._28_4_ = fVar336;
        auVar28 = vsubps_avx(auVar350,auVar38);
        auVar339._0_4_ = fVar201 + auVar207._0_4_;
        auVar339._4_4_ = fVar213 + auVar207._4_4_;
        auVar339._8_4_ = fVar214 + auVar207._8_4_;
        auVar339._12_4_ = fVar217 + auVar207._12_4_;
        auVar339._16_4_ = fVar219 + auVar207._16_4_;
        auVar339._20_4_ = fVar222 + auVar207._20_4_;
        auVar339._24_4_ = fVar235 + auVar207._24_4_;
        auVar339._28_4_ = fVar336 + auVar207._28_4_;
        fVar201 = (float)local_7a0._0_4_ * fVar215 * 0.0;
        fVar213 = local_7a0._4_4_ * fVar225 * 0.0;
        auVar42._4_4_ = fVar213;
        auVar42._0_4_ = fVar201;
        fVar214 = local_7a0._8_4_ * fVar241 * 0.0;
        auVar42._8_4_ = fVar214;
        fVar215 = local_7a0._12_4_ * fVar258 * 0.0;
        auVar42._12_4_ = fVar215;
        fVar217 = local_7a0._16_4_ * fVar265 * 0.0;
        auVar42._16_4_ = fVar217;
        fVar219 = local_7a0._20_4_ * fVar221 * 0.0;
        auVar42._20_4_ = fVar219;
        fVar222 = local_7a0._24_4_ * fVar224 * 0.0;
        auVar42._24_4_ = fVar222;
        auVar42._28_4_ = 0x3f000000;
        auVar27 = vsubps_avx(_local_5e0,auVar39);
        auVar367._0_4_ = fVar201 + (float)local_3c0._0_4_;
        auVar367._4_4_ = fVar213 + (float)local_3c0._4_4_;
        auVar367._8_4_ = fVar214 + fStack_3b8;
        auVar367._12_4_ = fVar215 + fStack_3b4;
        auVar367._16_4_ = fVar217 + fStack_3b0;
        auVar367._20_4_ = fVar219 + fStack_3ac;
        auVar367._24_4_ = fVar222 + fStack_3a8;
        auVar367._28_4_ = fStack_3a4 + 0.5;
        auVar21 = vsubps_avx(auVar229,auVar40);
        auVar22 = vsubps_avx(auVar207,auVar41);
        auVar148 = vsubps_avx(_local_3c0,auVar42);
        auVar321 = vsubps_avx(auVar339,auVar28);
        auVar23 = vsubps_avx(auVar367,auVar27);
        auVar43._4_4_ = auVar27._4_4_ * auVar321._4_4_;
        auVar43._0_4_ = auVar27._0_4_ * auVar321._0_4_;
        auVar43._8_4_ = auVar27._8_4_ * auVar321._8_4_;
        auVar43._12_4_ = auVar27._12_4_ * auVar321._12_4_;
        auVar43._16_4_ = auVar27._16_4_ * auVar321._16_4_;
        auVar43._20_4_ = auVar27._20_4_ * auVar321._20_4_;
        auVar43._24_4_ = auVar27._24_4_ * auVar321._24_4_;
        auVar43._28_4_ = fVar240;
        auVar44._4_4_ = auVar28._4_4_ * auVar23._4_4_;
        auVar44._0_4_ = auVar28._0_4_ * auVar23._0_4_;
        auVar44._8_4_ = auVar28._8_4_ * auVar23._8_4_;
        auVar44._12_4_ = auVar28._12_4_ * auVar23._12_4_;
        auVar44._16_4_ = auVar28._16_4_ * auVar23._16_4_;
        auVar44._20_4_ = auVar28._20_4_ * auVar23._20_4_;
        auVar44._24_4_ = auVar28._24_4_ * auVar23._24_4_;
        auVar44._28_4_ = auVar207._28_4_;
        auVar24 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = auVar26._4_4_ * auVar23._4_4_;
        auVar45._0_4_ = auVar26._0_4_ * auVar23._0_4_;
        auVar45._8_4_ = auVar26._8_4_ * auVar23._8_4_;
        auVar45._12_4_ = auVar26._12_4_ * auVar23._12_4_;
        auVar45._16_4_ = auVar26._16_4_ * auVar23._16_4_;
        auVar45._20_4_ = auVar26._20_4_ * auVar23._20_4_;
        auVar45._24_4_ = auVar26._24_4_ * auVar23._24_4_;
        auVar45._28_4_ = auVar23._28_4_;
        auVar25 = vsubps_avx(auVar320,auVar26);
        auVar46._4_4_ = auVar27._4_4_ * auVar25._4_4_;
        auVar46._0_4_ = auVar27._0_4_ * auVar25._0_4_;
        auVar46._8_4_ = auVar27._8_4_ * auVar25._8_4_;
        auVar46._12_4_ = auVar27._12_4_ * auVar25._12_4_;
        auVar46._16_4_ = auVar27._16_4_ * auVar25._16_4_;
        auVar46._20_4_ = auVar27._20_4_ * auVar25._20_4_;
        auVar46._24_4_ = auVar27._24_4_ * auVar25._24_4_;
        auVar46._28_4_ = auVar229._28_4_;
        auVar147 = vsubps_avx(auVar46,auVar45);
        auVar47._4_4_ = auVar25._4_4_ * auVar28._4_4_;
        auVar47._0_4_ = auVar25._0_4_ * auVar28._0_4_;
        auVar47._8_4_ = auVar25._8_4_ * auVar28._8_4_;
        auVar47._12_4_ = auVar25._12_4_ * auVar28._12_4_;
        auVar47._16_4_ = auVar25._16_4_ * auVar28._16_4_;
        auVar47._20_4_ = auVar25._20_4_ * auVar28._20_4_;
        auVar47._24_4_ = auVar25._24_4_ * auVar28._24_4_;
        auVar47._28_4_ = auVar23._28_4_;
        auVar48._4_4_ = auVar26._4_4_ * auVar321._4_4_;
        auVar48._0_4_ = auVar26._0_4_ * auVar321._0_4_;
        auVar48._8_4_ = auVar26._8_4_ * auVar321._8_4_;
        auVar48._12_4_ = auVar26._12_4_ * auVar321._12_4_;
        auVar48._16_4_ = auVar26._16_4_ * auVar321._16_4_;
        auVar48._20_4_ = auVar26._20_4_ * auVar321._20_4_;
        auVar48._24_4_ = auVar26._24_4_ * auVar321._24_4_;
        auVar48._28_4_ = auVar321._28_4_;
        auVar321 = vsubps_avx(auVar48,auVar47);
        auVar151._0_4_ = auVar24._0_4_ * 0.0 + auVar321._0_4_ + auVar147._0_4_ * 0.0;
        auVar151._4_4_ = auVar24._4_4_ * 0.0 + auVar321._4_4_ + auVar147._4_4_ * 0.0;
        auVar151._8_4_ = auVar24._8_4_ * 0.0 + auVar321._8_4_ + auVar147._8_4_ * 0.0;
        auVar151._12_4_ = auVar24._12_4_ * 0.0 + auVar321._12_4_ + auVar147._12_4_ * 0.0;
        auVar151._16_4_ = auVar24._16_4_ * 0.0 + auVar321._16_4_ + auVar147._16_4_ * 0.0;
        auVar151._20_4_ = auVar24._20_4_ * 0.0 + auVar321._20_4_ + auVar147._20_4_ * 0.0;
        auVar151._24_4_ = auVar24._24_4_ * 0.0 + auVar321._24_4_ + auVar147._24_4_ * 0.0;
        auVar151._28_4_ = auVar321._28_4_ + auVar321._28_4_ + auVar147._28_4_;
        auVar147 = vcmpps_avx(auVar151,ZEXT432(0) << 0x20,2);
        auVar21 = vblendvps_avx(auVar21,_local_6e0,auVar147);
        auVar22 = vblendvps_avx(auVar22,_local_600,auVar147);
        auVar321 = vblendvps_avx(auVar148,auVar274,auVar147);
        auVar23 = vblendvps_avx(auVar26,auVar320,auVar147);
        auVar24 = vblendvps_avx(auVar28,auVar339,auVar147);
        auVar25 = vblendvps_avx(auVar27,auVar367,auVar147);
        auVar26 = vblendvps_avx(auVar320,auVar26,auVar147);
        auVar28 = vblendvps_avx(auVar339,auVar28,auVar147);
        auVar250 = vpackssdw_avx(local_3a0._0_16_,local_3a0._16_16_);
        auVar27 = vblendvps_avx(auVar367,auVar27,auVar147);
        auVar26 = vsubps_avx(auVar26,auVar21);
        auVar170 = vsubps_avx(auVar28,auVar22);
        auVar27 = vsubps_avx(auVar27,auVar321);
        auVar171 = vsubps_avx(auVar22,auVar24);
        fVar201 = auVar170._0_4_;
        fVar162 = auVar321._0_4_;
        fVar219 = auVar170._4_4_;
        fVar163 = auVar321._4_4_;
        auVar49._4_4_ = fVar163 * fVar219;
        auVar49._0_4_ = fVar162 * fVar201;
        fVar239 = auVar170._8_4_;
        fVar244 = auVar321._8_4_;
        auVar49._8_4_ = fVar244 * fVar239;
        fVar258 = auVar170._12_4_;
        fVar280 = auVar321._12_4_;
        auVar49._12_4_ = fVar280 * fVar258;
        fVar266 = auVar170._16_4_;
        fVar216 = auVar321._16_4_;
        auVar49._16_4_ = fVar216 * fVar266;
        fVar312 = auVar170._20_4_;
        fVar218 = auVar321._20_4_;
        auVar49._20_4_ = fVar218 * fVar312;
        fVar157 = auVar170._24_4_;
        fVar220 = auVar321._24_4_;
        auVar49._24_4_ = fVar220 * fVar157;
        auVar49._28_4_ = auVar28._28_4_;
        fVar213 = auVar22._0_4_;
        fVar317 = auVar27._0_4_;
        fVar222 = auVar22._4_4_;
        fVar328 = auVar27._4_4_;
        auVar50._4_4_ = fVar328 * fVar222;
        auVar50._0_4_ = fVar317 * fVar213;
        fVar241 = auVar22._8_4_;
        fVar331 = auVar27._8_4_;
        auVar50._8_4_ = fVar331 * fVar241;
        fVar260 = auVar22._12_4_;
        fVar333 = auVar27._12_4_;
        auVar50._12_4_ = fVar333 * fVar260;
        fVar308 = auVar22._16_4_;
        fVar334 = auVar27._16_4_;
        auVar50._16_4_ = fVar334 * fVar308;
        fVar314 = auVar22._20_4_;
        fVar199 = auVar27._20_4_;
        auVar50._20_4_ = fVar199 * fVar314;
        fVar158 = auVar22._24_4_;
        fVar335 = auVar27._24_4_;
        uVar6 = auVar148._28_4_;
        auVar50._24_4_ = fVar335 * fVar158;
        auVar50._28_4_ = uVar6;
        auVar28 = vsubps_avx(auVar50,auVar49);
        fVar214 = auVar21._0_4_;
        fVar225 = auVar21._4_4_;
        auVar51._4_4_ = fVar328 * fVar225;
        auVar51._0_4_ = fVar317 * fVar214;
        fVar242 = auVar21._8_4_;
        auVar51._8_4_ = fVar331 * fVar242;
        fVar262 = auVar21._12_4_;
        auVar51._12_4_ = fVar333 * fVar262;
        fVar310 = auVar21._16_4_;
        auVar51._16_4_ = fVar334 * fVar310;
        fVar224 = auVar21._20_4_;
        auVar51._20_4_ = fVar199 * fVar224;
        fVar159 = auVar21._24_4_;
        auVar51._24_4_ = fVar335 * fVar159;
        auVar51._28_4_ = uVar6;
        fVar215 = auVar26._0_4_;
        fVar235 = auVar26._4_4_;
        auVar52._4_4_ = fVar163 * fVar235;
        auVar52._0_4_ = fVar162 * fVar215;
        fVar243 = auVar26._8_4_;
        auVar52._8_4_ = fVar244 * fVar243;
        fVar264 = auVar26._12_4_;
        auVar52._12_4_ = fVar280 * fVar264;
        fVar221 = auVar26._16_4_;
        auVar52._16_4_ = fVar216 * fVar221;
        fVar200 = auVar26._20_4_;
        auVar52._20_4_ = fVar218 * fVar200;
        fVar160 = auVar26._24_4_;
        auVar52._24_4_ = fVar220 * fVar160;
        auVar52._28_4_ = auVar367._28_4_;
        auVar148 = vsubps_avx(auVar52,auVar51);
        auVar53._4_4_ = fVar222 * fVar235;
        auVar53._0_4_ = fVar213 * fVar215;
        auVar53._8_4_ = fVar241 * fVar243;
        auVar53._12_4_ = fVar260 * fVar264;
        auVar53._16_4_ = fVar308 * fVar221;
        auVar53._20_4_ = fVar314 * fVar200;
        auVar53._24_4_ = fVar158 * fVar160;
        auVar53._28_4_ = uVar6;
        auVar372._0_4_ = fVar214 * fVar201;
        auVar372._4_4_ = fVar225 * fVar219;
        auVar372._8_4_ = fVar242 * fVar239;
        auVar372._12_4_ = fVar262 * fVar258;
        auVar372._16_4_ = fVar310 * fVar266;
        auVar372._20_4_ = fVar224 * fVar312;
        auVar372._24_4_ = fVar159 * fVar157;
        auVar372._28_4_ = 0;
        auVar172 = vsubps_avx(auVar372,auVar53);
        auVar173 = vsubps_avx(auVar321,auVar25);
        fVar217 = auVar172._28_4_ + auVar148._28_4_;
        auVar174._0_4_ = auVar172._0_4_ + auVar148._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
        auVar174._4_4_ = auVar172._4_4_ + auVar148._4_4_ * 0.0 + auVar28._4_4_ * 0.0;
        auVar174._8_4_ = auVar172._8_4_ + auVar148._8_4_ * 0.0 + auVar28._8_4_ * 0.0;
        auVar174._12_4_ = auVar172._12_4_ + auVar148._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
        auVar174._16_4_ = auVar172._16_4_ + auVar148._16_4_ * 0.0 + auVar28._16_4_ * 0.0;
        auVar174._20_4_ = auVar172._20_4_ + auVar148._20_4_ * 0.0 + auVar28._20_4_ * 0.0;
        auVar174._24_4_ = auVar172._24_4_ + auVar148._24_4_ * 0.0 + auVar28._24_4_ * 0.0;
        auVar174._28_4_ = fVar217 + auVar28._28_4_;
        fVar223 = auVar171._0_4_;
        fVar298 = auVar171._4_4_;
        auVar54._4_4_ = fVar298 * auVar25._4_4_;
        auVar54._0_4_ = fVar223 * auVar25._0_4_;
        fVar306 = auVar171._8_4_;
        auVar54._8_4_ = fVar306 * auVar25._8_4_;
        fVar307 = auVar171._12_4_;
        auVar54._12_4_ = fVar307 * auVar25._12_4_;
        fVar309 = auVar171._16_4_;
        auVar54._16_4_ = fVar309 * auVar25._16_4_;
        fVar311 = auVar171._20_4_;
        auVar54._20_4_ = fVar311 * auVar25._20_4_;
        fVar313 = auVar171._24_4_;
        auVar54._24_4_ = fVar313 * auVar25._24_4_;
        auVar54._28_4_ = fVar217;
        fVar217 = auVar173._0_4_;
        fVar237 = auVar173._4_4_;
        auVar55._4_4_ = auVar24._4_4_ * fVar237;
        auVar55._0_4_ = auVar24._0_4_ * fVar217;
        fVar245 = auVar173._8_4_;
        auVar55._8_4_ = auVar24._8_4_ * fVar245;
        fVar265 = auVar173._12_4_;
        auVar55._12_4_ = auVar24._12_4_ * fVar265;
        fVar297 = auVar173._16_4_;
        auVar55._16_4_ = auVar24._16_4_ * fVar297;
        fVar143 = auVar173._20_4_;
        auVar55._20_4_ = auVar24._20_4_ * fVar143;
        fVar161 = auVar173._24_4_;
        auVar55._24_4_ = auVar24._24_4_ * fVar161;
        auVar55._28_4_ = auVar172._28_4_;
        auVar148 = vsubps_avx(auVar55,auVar54);
        auVar171 = vsubps_avx(auVar21,auVar23);
        fVar365 = auVar171._0_4_;
        fVar282 = auVar171._4_4_;
        auVar56._4_4_ = fVar282 * auVar25._4_4_;
        auVar56._0_4_ = fVar365 * auVar25._0_4_;
        fVar292 = auVar171._8_4_;
        auVar56._8_4_ = fVar292 * auVar25._8_4_;
        fVar294 = auVar171._12_4_;
        auVar56._12_4_ = fVar294 * auVar25._12_4_;
        fVar296 = auVar171._16_4_;
        auVar56._16_4_ = fVar296 * auVar25._16_4_;
        fVar226 = auVar171._20_4_;
        auVar56._20_4_ = fVar226 * auVar25._20_4_;
        fVar236 = auVar171._24_4_;
        auVar56._24_4_ = fVar236 * auVar25._24_4_;
        auVar56._28_4_ = auVar25._28_4_;
        auVar57._4_4_ = auVar23._4_4_ * fVar237;
        auVar57._0_4_ = auVar23._0_4_ * fVar217;
        auVar57._8_4_ = auVar23._8_4_ * fVar245;
        auVar57._12_4_ = auVar23._12_4_ * fVar265;
        auVar57._16_4_ = auVar23._16_4_ * fVar297;
        auVar57._20_4_ = auVar23._20_4_ * fVar143;
        auVar57._24_4_ = auVar23._24_4_ * fVar161;
        auVar57._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar56,auVar57);
        auVar58._4_4_ = auVar24._4_4_ * fVar282;
        auVar58._0_4_ = auVar24._0_4_ * fVar365;
        auVar58._8_4_ = auVar24._8_4_ * fVar292;
        auVar58._12_4_ = auVar24._12_4_ * fVar294;
        auVar58._16_4_ = auVar24._16_4_ * fVar296;
        auVar58._20_4_ = auVar24._20_4_ * fVar226;
        auVar58._24_4_ = auVar24._24_4_ * fVar236;
        auVar58._28_4_ = auVar25._28_4_;
        auVar59._4_4_ = auVar23._4_4_ * fVar298;
        auVar59._0_4_ = auVar23._0_4_ * fVar223;
        auVar59._8_4_ = auVar23._8_4_ * fVar306;
        auVar59._12_4_ = auVar23._12_4_ * fVar307;
        auVar59._16_4_ = auVar23._16_4_ * fVar309;
        auVar59._20_4_ = auVar23._20_4_ * fVar311;
        auVar59._24_4_ = auVar23._24_4_ * fVar313;
        auVar59._28_4_ = auVar23._28_4_;
        auVar23 = vsubps_avx(auVar59,auVar58);
        auVar231._0_4_ = auVar148._0_4_ * 0.0 + auVar23._0_4_ + auVar28._0_4_ * 0.0;
        auVar231._4_4_ = auVar148._4_4_ * 0.0 + auVar23._4_4_ + auVar28._4_4_ * 0.0;
        auVar231._8_4_ = auVar148._8_4_ * 0.0 + auVar23._8_4_ + auVar28._8_4_ * 0.0;
        auVar231._12_4_ = auVar148._12_4_ * 0.0 + auVar23._12_4_ + auVar28._12_4_ * 0.0;
        auVar231._16_4_ = auVar148._16_4_ * 0.0 + auVar23._16_4_ + auVar28._16_4_ * 0.0;
        auVar231._20_4_ = auVar148._20_4_ * 0.0 + auVar23._20_4_ + auVar28._20_4_ * 0.0;
        auVar231._24_4_ = auVar148._24_4_ * 0.0 + auVar23._24_4_ + auVar28._24_4_ * 0.0;
        auVar231._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar28._28_4_;
        auVar23 = vmaxps_avx(auVar174,auVar231);
        auVar23 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,2);
        auVar192 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
        auVar250 = vpand_avx(auVar250,auVar192);
        auVar192 = vpmovsxwd_avx(auVar250);
        auVar184 = vpunpckhwd_avx(auVar250,auVar250);
        auVar209._16_16_ = auVar184;
        auVar209._0_16_ = auVar192;
        if ((((((((auVar209 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar209 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar209 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar209 >> 0x7f,0) == '\0') &&
              (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar184 >> 0x3f,0) == '\0') &&
            (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar184[0xf]) {
LAB_010daf9d:
          auVar255._8_8_ = uStack_578;
          auVar255._0_8_ = local_580;
          auVar255._16_8_ = uStack_570;
          auVar255._24_8_ = uStack_568;
          auVar325 = ZEXT3264(auVar303);
          auVar305 = ZEXT3264(auVar146);
          auVar212 = ZEXT3264(auVar209);
          auVar358._4_4_ = fVar180;
          auVar358._0_4_ = fVar164;
          auVar358._8_4_ = fVar181;
          auVar358._12_4_ = fVar182;
          auVar358._16_4_ = fVar183;
          auVar358._20_4_ = fVar185;
          auVar358._24_4_ = fVar186;
          auVar358._28_4_ = fVar187;
        }
        else {
          auVar60._4_4_ = fVar237 * fVar219;
          auVar60._0_4_ = fVar217 * fVar201;
          auVar60._8_4_ = fVar245 * fVar239;
          auVar60._12_4_ = fVar265 * fVar258;
          auVar60._16_4_ = fVar297 * fVar266;
          auVar60._20_4_ = fVar143 * fVar312;
          auVar60._24_4_ = fVar161 * fVar157;
          auVar60._28_4_ = auVar184._12_4_;
          auVar351._0_4_ = fVar223 * fVar317;
          auVar351._4_4_ = fVar298 * fVar328;
          auVar351._8_4_ = fVar306 * fVar331;
          auVar351._12_4_ = fVar307 * fVar333;
          auVar351._16_4_ = fVar309 * fVar334;
          auVar351._20_4_ = fVar311 * fVar199;
          auVar351._24_4_ = fVar313 * fVar335;
          auVar351._28_4_ = 0;
          auVar23 = vsubps_avx(auVar351,auVar60);
          auVar61._4_4_ = fVar282 * fVar328;
          auVar61._0_4_ = fVar365 * fVar317;
          auVar61._8_4_ = fVar292 * fVar331;
          auVar61._12_4_ = fVar294 * fVar333;
          auVar61._16_4_ = fVar296 * fVar334;
          auVar61._20_4_ = fVar226 * fVar199;
          auVar61._24_4_ = fVar236 * fVar335;
          auVar61._28_4_ = auVar27._28_4_;
          auVar62._4_4_ = fVar237 * fVar235;
          auVar62._0_4_ = fVar217 * fVar215;
          auVar62._8_4_ = fVar245 * fVar243;
          auVar62._12_4_ = fVar265 * fVar264;
          auVar62._16_4_ = fVar297 * fVar221;
          auVar62._20_4_ = fVar143 * fVar200;
          auVar62._24_4_ = fVar161 * fVar160;
          auVar62._28_4_ = auVar173._28_4_;
          auVar25 = vsubps_avx(auVar62,auVar61);
          auVar63._4_4_ = fVar298 * fVar235;
          auVar63._0_4_ = fVar223 * fVar215;
          auVar63._8_4_ = fVar306 * fVar243;
          auVar63._12_4_ = fVar307 * fVar264;
          auVar63._16_4_ = fVar309 * fVar221;
          auVar63._20_4_ = fVar311 * fVar200;
          auVar63._24_4_ = fVar313 * fVar160;
          auVar63._28_4_ = auVar174._28_4_;
          auVar64._4_4_ = fVar282 * fVar219;
          auVar64._0_4_ = fVar365 * fVar201;
          auVar64._8_4_ = fVar292 * fVar239;
          auVar64._12_4_ = fVar294 * fVar258;
          auVar64._16_4_ = fVar296 * fVar266;
          auVar64._20_4_ = fVar226 * fVar312;
          auVar64._24_4_ = fVar236 * fVar157;
          auVar64._28_4_ = auVar170._28_4_;
          auVar28 = vsubps_avx(auVar64,auVar63);
          auVar290._0_4_ = auVar23._0_4_ * 0.0 + auVar28._0_4_ + auVar25._0_4_ * 0.0;
          auVar290._4_4_ = auVar23._4_4_ * 0.0 + auVar28._4_4_ + auVar25._4_4_ * 0.0;
          auVar290._8_4_ = auVar23._8_4_ * 0.0 + auVar28._8_4_ + auVar25._8_4_ * 0.0;
          auVar290._12_4_ = auVar23._12_4_ * 0.0 + auVar28._12_4_ + auVar25._12_4_ * 0.0;
          auVar290._16_4_ = auVar23._16_4_ * 0.0 + auVar28._16_4_ + auVar25._16_4_ * 0.0;
          auVar290._20_4_ = auVar23._20_4_ * 0.0 + auVar28._20_4_ + auVar25._20_4_ * 0.0;
          auVar290._24_4_ = auVar23._24_4_ * 0.0 + auVar28._24_4_ + auVar25._24_4_ * 0.0;
          auVar290._28_4_ = auVar170._28_4_ + auVar28._28_4_ + auVar174._28_4_;
          auVar24 = vrcpps_avx(auVar290);
          fVar201 = auVar24._0_4_;
          fVar215 = auVar24._4_4_;
          auVar65._4_4_ = auVar290._4_4_ * fVar215;
          auVar65._0_4_ = auVar290._0_4_ * fVar201;
          fVar217 = auVar24._8_4_;
          auVar65._8_4_ = auVar290._8_4_ * fVar217;
          fVar219 = auVar24._12_4_;
          auVar65._12_4_ = auVar290._12_4_ * fVar219;
          fVar235 = auVar24._16_4_;
          auVar65._16_4_ = auVar290._16_4_ * fVar235;
          fVar237 = auVar24._20_4_;
          auVar65._20_4_ = auVar290._20_4_ * fVar237;
          fVar239 = auVar24._24_4_;
          auVar65._24_4_ = auVar290._24_4_ * fVar239;
          auVar65._28_4_ = auVar173._28_4_;
          auVar352._8_4_ = 0x3f800000;
          auVar352._0_8_ = 0x3f8000003f800000;
          auVar352._12_4_ = 0x3f800000;
          auVar352._16_4_ = 0x3f800000;
          auVar352._20_4_ = 0x3f800000;
          auVar352._24_4_ = 0x3f800000;
          auVar352._28_4_ = 0x3f800000;
          auVar27 = vsubps_avx(auVar352,auVar65);
          fVar201 = auVar27._0_4_ * fVar201 + fVar201;
          fVar215 = auVar27._4_4_ * fVar215 + fVar215;
          fVar217 = auVar27._8_4_ * fVar217 + fVar217;
          fVar219 = auVar27._12_4_ * fVar219 + fVar219;
          fVar235 = auVar27._16_4_ * fVar235 + fVar235;
          fVar237 = auVar27._20_4_ * fVar237 + fVar237;
          fVar239 = auVar27._24_4_ * fVar239 + fVar239;
          auVar66._4_4_ =
               (auVar23._4_4_ * fVar225 + auVar25._4_4_ * fVar222 + auVar28._4_4_ * fVar163) *
               fVar215;
          auVar66._0_4_ =
               (auVar23._0_4_ * fVar214 + auVar25._0_4_ * fVar213 + auVar28._0_4_ * fVar162) *
               fVar201;
          auVar66._8_4_ =
               (auVar23._8_4_ * fVar242 + auVar25._8_4_ * fVar241 + auVar28._8_4_ * fVar244) *
               fVar217;
          auVar66._12_4_ =
               (auVar23._12_4_ * fVar262 + auVar25._12_4_ * fVar260 + auVar28._12_4_ * fVar280) *
               fVar219;
          auVar66._16_4_ =
               (auVar23._16_4_ * fVar310 + auVar25._16_4_ * fVar308 + auVar28._16_4_ * fVar216) *
               fVar235;
          auVar66._20_4_ =
               (auVar23._20_4_ * fVar224 + auVar25._20_4_ * fVar314 + auVar28._20_4_ * fVar218) *
               fVar237;
          auVar66._24_4_ =
               (auVar23._24_4_ * fVar159 + auVar25._24_4_ * fVar158 + auVar28._24_4_ * fVar220) *
               fVar239;
          auVar66._28_4_ = auVar21._28_4_ + auVar26._28_4_ + auVar321._28_4_;
          auVar192 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
          auVar210._16_16_ = auVar192;
          auVar210._0_16_ = auVar192;
          auVar321 = vcmpps_avx(auVar210,auVar66,2);
          uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar253._4_4_ = uVar6;
          auVar253._0_4_ = uVar6;
          auVar253._8_4_ = uVar6;
          auVar253._12_4_ = uVar6;
          auVar253._16_4_ = uVar6;
          auVar253._20_4_ = uVar6;
          auVar253._24_4_ = uVar6;
          auVar253._28_4_ = uVar6;
          auVar23 = vcmpps_avx(auVar66,auVar253,2);
          auVar321 = vandps_avx(auVar23,auVar321);
          auVar192 = vpackssdw_avx(auVar321._0_16_,auVar321._16_16_);
          auVar250 = vpand_avx(auVar250,auVar192);
          auVar192 = vpmovsxwd_avx(auVar250);
          auVar184 = vpshufd_avx(auVar250,0xee);
          auVar184 = vpmovsxwd_avx(auVar184);
          auVar209._16_16_ = auVar184;
          auVar209._0_16_ = auVar192;
          if ((((((((auVar209 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar209 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar209 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar209 >> 0x7f,0) == '\0') &&
                (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar184 >> 0x3f,0) == '\0') &&
              (auVar209 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar184[0xf]) goto LAB_010daf9d;
          auVar321 = vcmpps_avx(ZEXT832(0) << 0x20,auVar290,4);
          auVar192 = vpackssdw_avx(auVar321._0_16_,auVar321._16_16_);
          auVar250 = vpand_avx(auVar250,auVar192);
          auVar192 = vpmovsxwd_avx(auVar250);
          auVar250 = vpunpckhwd_avx(auVar250,auVar250);
          auVar212 = ZEXT1664(auVar250);
          auVar275._16_16_ = auVar250;
          auVar275._0_16_ = auVar192;
          auVar255._8_8_ = uStack_578;
          auVar255._0_8_ = local_580;
          auVar255._16_8_ = uStack_570;
          auVar255._24_8_ = uStack_568;
          auVar305 = ZEXT3264(auVar146);
          auVar325 = ZEXT3264(auVar303);
          auVar358._4_4_ = fVar180;
          auVar358._0_4_ = fVar164;
          auVar358._8_4_ = fVar181;
          auVar358._12_4_ = fVar182;
          auVar358._16_4_ = fVar183;
          auVar358._20_4_ = fVar185;
          auVar358._24_4_ = fVar186;
          auVar358._28_4_ = fVar187;
          if ((((((((auVar275 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar275 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar275 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar275 >> 0x7f,0) != '\0') ||
                (auVar275 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar250 >> 0x3f,0) != '\0') ||
              (auVar275 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar250[0xf] < '\0') {
            auVar211._0_4_ = auVar174._0_4_ * fVar201;
            auVar211._4_4_ = auVar174._4_4_ * fVar215;
            auVar211._8_4_ = auVar174._8_4_ * fVar217;
            auVar211._12_4_ = auVar174._12_4_ * fVar219;
            auVar211._16_4_ = auVar174._16_4_ * fVar235;
            auVar211._20_4_ = auVar174._20_4_ * fVar237;
            auVar211._24_4_ = auVar174._24_4_ * fVar239;
            auVar211._28_4_ = 0;
            auVar67._4_4_ = auVar231._4_4_ * fVar215;
            auVar67._0_4_ = auVar231._0_4_ * fVar201;
            auVar67._8_4_ = auVar231._8_4_ * fVar217;
            auVar67._12_4_ = auVar231._12_4_ * fVar219;
            auVar67._16_4_ = auVar231._16_4_ * fVar235;
            auVar67._20_4_ = auVar231._20_4_ * fVar237;
            auVar67._24_4_ = auVar231._24_4_ * fVar239;
            auVar67._28_4_ = auVar27._28_4_ + auVar24._28_4_;
            auVar254._8_4_ = 0x3f800000;
            auVar254._0_8_ = 0x3f8000003f800000;
            auVar254._12_4_ = 0x3f800000;
            auVar254._16_4_ = 0x3f800000;
            auVar254._20_4_ = 0x3f800000;
            auVar254._24_4_ = 0x3f800000;
            auVar254._28_4_ = 0x3f800000;
            auVar146 = vsubps_avx(auVar254,auVar211);
            auVar146 = vblendvps_avx(auVar146,auVar211,auVar147);
            auVar305 = ZEXT3264(auVar146);
            auVar146 = vsubps_avx(auVar254,auVar67);
            auVar212 = ZEXT3264(auVar146);
            _local_3e0 = vblendvps_avx(auVar146,auVar67,auVar147);
            auVar325 = ZEXT3264(auVar66);
            auVar255 = auVar275;
          }
        }
        if ((((((((auVar255 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar255 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar255 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar255 >> 0x7f,0) != '\0') ||
              (auVar255 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar255 >> 0xbf,0) != '\0') ||
            (auVar255 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar255[0x1f] < '\0') {
          auVar146 = vsubps_avx(local_7a0,auVar358);
          fVar213 = auVar358._0_4_ + auVar305._0_4_ * auVar146._0_4_;
          fVar214 = auVar358._4_4_ + auVar305._4_4_ * auVar146._4_4_;
          fVar215 = auVar358._8_4_ + auVar305._8_4_ * auVar146._8_4_;
          fVar217 = auVar358._12_4_ + auVar305._12_4_ * auVar146._12_4_;
          fVar219 = auVar358._16_4_ + auVar305._16_4_ * auVar146._16_4_;
          fVar222 = auVar358._20_4_ + auVar305._20_4_ * auVar146._20_4_;
          fVar225 = auVar358._24_4_ + auVar305._24_4_ * auVar146._24_4_;
          fVar235 = auVar358._28_4_ + auVar146._28_4_;
          fVar201 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar68._4_4_ = (fVar214 + fVar214) * fVar201;
          auVar68._0_4_ = (fVar213 + fVar213) * fVar201;
          auVar68._8_4_ = (fVar215 + fVar215) * fVar201;
          auVar68._12_4_ = (fVar217 + fVar217) * fVar201;
          auVar68._16_4_ = (fVar219 + fVar219) * fVar201;
          auVar68._20_4_ = (fVar222 + fVar222) * fVar201;
          auVar68._24_4_ = (fVar225 + fVar225) * fVar201;
          auVar68._28_4_ = fVar235 + fVar235;
          auVar321 = auVar325._0_32_;
          auVar146 = vcmpps_avx(auVar321,auVar68,6);
          auVar303 = auVar255 & auVar146;
          auVar234 = ZEXT3264(_local_780);
          if ((((((((auVar303 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar303 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar303 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar303 >> 0x7f,0) != '\0') ||
                (auVar303 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar303 >> 0xbf,0) != '\0') ||
              (auVar303 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar303[0x1f] < '\0') {
            local_240 = vandps_avx(auVar146,auVar255);
            local_2e0 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
            fStack_2dc = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
            fStack_2d8 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
            fStack_2d4 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
            fStack_2d0 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
            fStack_2cc = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
            fStack_2c8 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
            fStack_2c4 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
            auVar303 = auVar305._0_32_;
            local_2a0 = 0;
            local_3e0._4_4_ = fStack_2dc;
            local_3e0._0_4_ = local_2e0;
            uStack_3d8._0_4_ = fStack_2d8;
            uStack_3d8._4_4_ = fStack_2d4;
            uStack_3d0._0_4_ = fStack_2d0;
            uStack_3d0._4_4_ = fStack_2cc;
            auVar126 = _local_3e0;
            uStack_3c8._0_4_ = fStack_2c8;
            uStack_3c8._4_4_ = fStack_2c4;
            auVar146 = _local_3e0;
            if ((pGVar141->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              _local_3e0 = auVar146;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar138 = CONCAT71((int7)((ulong)context->args >> 8),1),
                 pGVar141->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar189._0_4_ = 1.0 / local_520;
                auVar189._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar250 = vshufps_avx(auVar189,auVar189,0);
                local_220[0] = auVar250._0_4_ * (auVar305._0_4_ + 0.0);
                local_220[1] = auVar250._4_4_ * (auVar305._4_4_ + 1.0);
                local_220[2] = auVar250._8_4_ * (auVar305._8_4_ + 2.0);
                local_220[3] = auVar250._12_4_ * (auVar305._12_4_ + 3.0);
                fStack_210 = auVar250._0_4_ * (auVar305._16_4_ + 4.0);
                fStack_20c = auVar250._4_4_ * (auVar305._20_4_ + 5.0);
                fStack_208 = auVar250._8_4_ * (auVar305._24_4_ + 6.0);
                fStack_204 = auVar305._28_4_ + 7.0;
                uStack_3d0 = auVar126._16_8_;
                uStack_3c8 = auVar146._24_8_;
                local_200 = local_3e0;
                uStack_1f8 = uStack_3d8;
                uStack_1f0 = uStack_3d0;
                uStack_1e8 = uStack_3c8;
                local_1e0 = auVar321;
                iVar135 = vmovmskps_avx(local_240);
                uVar140 = CONCAT44((int)((ulong)lVar139 >> 0x20),iVar135);
                uVar136 = 0;
                if (uVar140 != 0) {
                  for (; (uVar140 >> uVar136 & 1) == 0; uVar136 = uVar136 + 1) {
                  }
                }
                if (iVar135 == 0) {
                  uVar138 = 0;
                }
                else {
                  _local_760 = vshufps_avx(ZEXT416(uVar134),ZEXT416(uVar134),0);
                  _auStack_750 = auVar21._16_16_;
                  _local_680 = vshufps_avx(ZEXT416(uVar16),ZEXT416(uVar16),0);
                  auStack_670 = auVar22._16_16_;
                  _auStack_5b0 = auVar229._16_16_;
                  _local_5c0 = *local_718;
                  _auStack_69c = auVar207._4_28_;
                  local_6a0 = (undefined1  [4])*(undefined4 *)(ray + k * 4 + 0x80);
                  local_300 = auVar303;
                  local_2c0 = auVar321;
                  local_29c = uVar17;
                  local_260 = auVar7;
                  do {
                    local_460 = local_220[uVar136];
                    local_450 = *(undefined4 *)((long)&local_200 + uVar136 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar136 * 4);
                    fVar213 = 1.0 - local_460;
                    fVar201 = local_460 * fVar213 * 4.0;
                    auVar250 = ZEXT416((uint)(local_460 * local_460 * 0.5));
                    auVar250 = vshufps_avx(auVar250,auVar250,0);
                    auVar192 = ZEXT416((uint)((fVar213 * fVar213 + fVar201) * 0.5));
                    auVar192 = vshufps_avx(auVar192,auVar192,0);
                    auVar184 = ZEXT416((uint)((-local_460 * local_460 - fVar201) * 0.5));
                    auVar184 = vshufps_avx(auVar184,auVar184,0);
                    local_710.context = context->user;
                    auVar203 = ZEXT416((uint)(fVar213 * -fVar213 * 0.5));
                    auVar203 = vshufps_avx(auVar203,auVar203,0);
                    auVar190._0_4_ =
                         local_880 * auVar203._0_4_ +
                         local_860 * auVar184._0_4_ +
                         local_850 * auVar250._0_4_ + local_870 * auVar192._0_4_;
                    auVar190._4_4_ =
                         fStack_87c * auVar203._4_4_ +
                         fStack_85c * auVar184._4_4_ +
                         fStack_84c * auVar250._4_4_ + fStack_86c * auVar192._4_4_;
                    auVar190._8_4_ =
                         fStack_878 * auVar203._8_4_ +
                         fStack_858 * auVar184._8_4_ +
                         fStack_848 * auVar250._8_4_ + fStack_868 * auVar192._8_4_;
                    auVar190._12_4_ =
                         fStack_874 * auVar203._12_4_ +
                         fStack_854 * auVar184._12_4_ +
                         fStack_844 * auVar250._12_4_ + fStack_864 * auVar192._12_4_;
                    local_490 = (RTCHitN  [16])vshufps_avx(auVar190,auVar190,0);
                    local_480 = vshufps_avx(auVar190,auVar190,0x55);
                    auVar212 = ZEXT1664(local_480);
                    local_470 = vshufps_avx(auVar190,auVar190,0xaa);
                    local_440 = local_680;
                    uStack_438 = uStack_678;
                    local_430 = local_760;
                    uStack_428 = uStack_758;
                    vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                    uStack_41c = (local_710.context)->instID[0];
                    local_420 = uStack_41c;
                    uStack_418 = uStack_41c;
                    uStack_414 = uStack_41c;
                    uStack_410 = (local_710.context)->instPrimID[0];
                    uStack_40c = uStack_410;
                    uStack_408 = uStack_410;
                    uStack_404 = uStack_410;
                    local_7c0 = _local_5c0;
                    local_710.valid = (int *)local_7c0;
                    local_710.geometryUserPtr = pGVar141->userPtr;
                    local_710.hit = local_490;
                    local_710.N = 4;
                    local_7a0._0_8_ = uVar140;
                    local_710.ray = (RTCRayN *)ray;
                    fStack_45c = local_460;
                    fStack_458 = local_460;
                    fStack_454 = local_460;
                    uStack_44c = local_450;
                    uStack_448 = local_450;
                    uStack_444 = local_450;
                    if (pGVar141->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar212 = ZEXT1664(local_480);
                      (*pGVar141->occlusionFilterN)(&local_710);
                      auVar325 = ZEXT3264(auVar321);
                      auVar305 = ZEXT3264(auVar303);
                      uVar140 = local_7a0._0_8_;
                    }
                    if (local_7c0 == (undefined1  [16])0x0) {
                      auVar250 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar250 = auVar250 ^ _DAT_01f7ae20;
                      auVar234 = ZEXT3264(_local_780);
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if (p_Var19 == (RTCFilterFunctionN)0x0) {
                        auVar234 = ZEXT3264(_local_780);
                      }
                      else {
                        auVar234 = ZEXT3264(_local_780);
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar141->field_8).field_0x2 & 0x40) != 0)) {
                          auVar212 = ZEXT1664(auVar212._0_16_);
                          (*p_Var19)(&local_710);
                          auVar234 = ZEXT3264(_local_780);
                          auVar325 = ZEXT3264(auVar321);
                          auVar305 = ZEXT3264(auVar303);
                          uVar140 = local_7a0._0_8_;
                        }
                      }
                      auVar192 = vpcmpeqd_avx(local_7c0,_DAT_01f7aa10);
                      auVar250 = auVar192 ^ _DAT_01f7ae20;
                      auVar191._8_4_ = 0xff800000;
                      auVar191._0_8_ = 0xff800000ff800000;
                      auVar191._12_4_ = 0xff800000;
                      auVar192 = vblendvps_avx(auVar191,*(undefined1 (*) [16])(local_710.ray + 0x80)
                                               ,auVar192);
                      *(undefined1 (*) [16])(local_710.ray + 0x80) = auVar192;
                    }
                    auVar168._8_8_ = 0x100000001;
                    auVar168._0_8_ = 0x100000001;
                    if ((auVar168 & auVar250) != (undefined1  [16])0x0) {
                      uVar138 = CONCAT71((int7)(uVar136 >> 8),1);
                      break;
                    }
                    *(undefined1 (*) [4])(ray + k * 4 + 0x80) = local_6a0;
                    uVar140 = uVar140 ^ 1L << (uVar136 & 0x3f);
                    uVar136 = 0;
                    if (uVar140 != 0) {
                      for (; (uVar140 >> uVar136 & 1) == 0; uVar136 = uVar136 + 1) {
                      }
                    }
                    uVar138 = 0;
                  } while (uVar140 != 0);
                }
              }
              goto LAB_010d9a82;
            }
          }
          goto LAB_010d93d4;
        }
        uVar138 = 0;
        auVar234 = ZEXT3264(_local_780);
      }
LAB_010d9a82:
      if (8 < (int)uVar17) {
        _local_780 = auVar234._0_32_;
        auVar250 = vpshufd_avx(ZEXT416(uVar17),0);
        local_3a0._0_16_ = auVar250;
        auVar250 = vshufps_avx(local_740._0_16_,local_740._0_16_,0);
        register0x00001210 = auVar250;
        _local_3c0 = auVar250;
        auVar250 = vpermilps_avx(local_6c0._0_16_,0);
        local_100._16_16_ = auVar250;
        local_100._0_16_ = auVar250;
        auVar145._0_4_ = 1.0 / local_520;
        auVar145._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar250 = vshufps_avx(auVar145,auVar145,0);
        register0x00001210 = auVar250;
        _local_120 = auVar250;
        local_310 = vshufps_avx(ZEXT416((uint)local_7a8),ZEXT416((uint)local_7a8),0);
        local_650 = vshufps_avx(ZEXT416((uint)local_650._0_4_),ZEXT416((uint)local_650._0_4_),0);
        auVar156 = ZEXT1664(local_650);
        lVar139 = 8;
        auVar146 = auVar305._0_32_;
        auVar303 = auVar325._0_32_;
        do {
          pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar139 * 4 + lVar137);
          fVar201 = *(float *)*pauVar1;
          fVar213 = *(float *)(*pauVar1 + 4);
          fVar214 = *(float *)(*pauVar1 + 8);
          fVar215 = *(float *)(*pauVar1 + 0xc);
          fVar217 = *(float *)(*pauVar1 + 0x10);
          fVar219 = *(float *)(*pauVar1 + 0x14);
          fVar222 = *(float *)(*pauVar1 + 0x18);
          auVar123 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar137 + 0x21aefac + lVar139 * 4);
          fVar225 = *(float *)*pauVar1;
          fVar235 = *(float *)(*pauVar1 + 4);
          fVar237 = *(float *)(*pauVar1 + 8);
          fVar239 = *(float *)(*pauVar1 + 0xc);
          fVar241 = *(float *)(*pauVar1 + 0x10);
          fVar242 = *(float *)(*pauVar1 + 0x14);
          fVar243 = *(float *)(*pauVar1 + 0x18);
          auVar122 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar137 + 0x21af430 + lVar139 * 4);
          fVar245 = *(float *)*pauVar1;
          fVar258 = *(float *)(*pauVar1 + 4);
          fVar260 = *(float *)(*pauVar1 + 8);
          fVar262 = *(float *)(*pauVar1 + 0xc);
          fVar264 = *(float *)(*pauVar1 + 0x10);
          fVar265 = *(float *)(*pauVar1 + 0x14);
          fVar266 = *(float *)(*pauVar1 + 0x18);
          auVar121 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar137 + 0x21af8b4 + lVar139 * 4);
          fVar308 = *(float *)*pauVar1;
          fVar310 = *(float *)(*pauVar1 + 4);
          fVar221 = *(float *)(*pauVar1 + 8);
          fVar297 = *(float *)(*pauVar1 + 0xc);
          fVar312 = *(float *)(*pauVar1 + 0x10);
          fVar314 = *(float *)(*pauVar1 + 0x14);
          fVar224 = *(float *)(*pauVar1 + 0x18);
          auVar120 = *pauVar1;
          fVar143 = auVar212._28_4_;
          fVar200 = fVar143 + *(float *)pauVar1[1];
          fVar163 = fVar143 + fVar143 + auVar156._28_4_;
          fVar244 = fVar143 + fVar200;
          local_6c0._0_4_ =
               (float)local_380._0_4_ * fVar201 +
               (float)local_a0._0_4_ * fVar225 +
               (float)local_540._0_4_ * fVar245 + (float)local_500._0_4_ * fVar308;
          local_6c0._4_4_ =
               (float)local_380._4_4_ * fVar213 +
               (float)local_a0._4_4_ * fVar235 +
               (float)local_540._4_4_ * fVar258 + (float)local_500._4_4_ * fVar310;
          local_6c0._8_4_ =
               fStack_378 * fVar214 +
               fStack_98 * fVar237 + fStack_538 * fVar260 + fStack_4f8 * fVar221;
          local_6c0._12_4_ =
               fStack_374 * fVar215 +
               fStack_94 * fVar239 + fStack_534 * fVar262 + fStack_4f4 * fVar297;
          local_6c0._16_4_ =
               fStack_370 * fVar217 +
               fStack_90 * fVar241 + fStack_530 * fVar264 + fStack_4f0 * fVar312;
          local_6c0._20_4_ =
               fStack_36c * fVar219 +
               fStack_8c * fVar242 + fStack_52c * fVar265 + fStack_4ec * fVar314;
          local_6c0._24_4_ =
               fStack_368 * fVar222 +
               fStack_88 * fVar243 + fStack_528 * fVar266 + fStack_4e8 * fVar224;
          local_6c0._28_4_ = fVar200 + fVar163;
          auVar212 = ZEXT3264(local_6c0);
          local_740._0_4_ =
               (float)local_4e0._0_4_ * fVar201 +
               (float)local_140._0_4_ * fVar225 +
               (float)local_4c0._0_4_ * fVar245 + fVar371 * fVar308;
          local_740._4_4_ =
               (float)local_4e0._4_4_ * fVar213 +
               (float)local_140._4_4_ * fVar235 +
               (float)local_4c0._4_4_ * fVar258 + fVar374 * fVar310;
          local_740._8_4_ =
               fStack_4d8 * fVar214 +
               fStack_138 * fVar237 + fStack_4b8 * fVar260 + fVar375 * fVar221;
          local_740._12_4_ =
               fStack_4d4 * fVar215 +
               fStack_134 * fVar239 + fStack_4b4 * fVar262 + fVar376 * fVar297;
          local_740._16_4_ =
               fStack_4d0 * fVar217 +
               fStack_130 * fVar241 + fStack_4b0 * fVar264 + fVar371 * fVar312;
          local_740._20_4_ =
               fStack_4cc * fVar219 +
               fStack_12c * fVar242 + fStack_4ac * fVar265 + fVar374 * fVar314;
          local_740._24_4_ =
               fStack_4c8 * fVar222 +
               fStack_128 * fVar243 + fStack_4a8 * fVar266 + fVar375 * fVar224;
          local_740._28_4_ = fVar163 + fVar143 + fVar143 + auVar234._28_4_;
          fVar143 = fVar201 * (float)local_180._0_4_ +
                    (float)local_c0._0_4_ * fVar225 +
                    fVar245 * (float)local_340._0_4_ + fVar308 * (float)local_160._0_4_;
          fVar157 = fVar213 * (float)local_180._4_4_ +
                    (float)local_c0._4_4_ * fVar235 +
                    fVar258 * (float)local_340._4_4_ + fVar310 * (float)local_160._4_4_;
          fVar158 = fVar214 * fStack_178 +
                    fStack_b8 * fVar237 + fVar260 * fStack_338 + fVar221 * fStack_158;
          fVar159 = fVar215 * fStack_174 +
                    fStack_b4 * fVar239 + fVar262 * fStack_334 + fVar297 * fStack_154;
          fVar160 = fVar217 * fStack_170 +
                    fStack_b0 * fVar241 + fVar264 * fStack_330 + fVar312 * fStack_150;
          fVar161 = fVar219 * fStack_16c +
                    fStack_ac * fVar242 + fVar265 * fStack_32c + fVar314 * fStack_14c;
          fVar162 = fVar222 * fStack_168 +
                    fStack_a8 * fVar243 + fVar266 * fStack_328 + fVar224 * fStack_148;
          fVar163 = fVar163 + fVar244;
          pauVar1 = (undefined1 (*) [28])(bspline_basis1 + lVar139 * 4 + lVar137);
          fVar201 = *(float *)*pauVar1;
          fVar213 = *(float *)(*pauVar1 + 4);
          fVar214 = *(float *)(*pauVar1 + 8);
          fVar215 = *(float *)(*pauVar1 + 0xc);
          fVar217 = *(float *)(*pauVar1 + 0x10);
          fVar219 = *(float *)(*pauVar1 + 0x14);
          fVar222 = *(float *)(*pauVar1 + 0x18);
          auVar125 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar137 + 0x21b13cc + lVar139 * 4);
          fVar225 = *(float *)*pauVar1;
          fVar235 = *(float *)(*pauVar1 + 4);
          fVar237 = *(float *)(*pauVar1 + 8);
          fVar239 = *(float *)(*pauVar1 + 0xc);
          fVar241 = *(float *)(*pauVar1 + 0x10);
          fVar242 = *(float *)(*pauVar1 + 0x14);
          fVar243 = *(float *)(*pauVar1 + 0x18);
          auVar124 = *pauVar1;
          pfVar2 = (float *)(lVar137 + 0x21b1850 + lVar139 * 4);
          fVar245 = *pfVar2;
          fVar258 = pfVar2[1];
          fVar260 = pfVar2[2];
          fVar262 = pfVar2[3];
          fVar264 = pfVar2[4];
          fVar265 = pfVar2[5];
          fVar266 = pfVar2[6];
          pfVar2 = (float *)(lVar137 + 0x21b1cd4 + lVar139 * 4);
          fVar308 = *pfVar2;
          fVar310 = pfVar2[1];
          fVar221 = pfVar2[2];
          fVar297 = pfVar2[3];
          fVar312 = pfVar2[4];
          fVar314 = pfVar2[5];
          fVar224 = pfVar2[6];
          fVar200 = pfVar2[7];
          fVar280 = fVar200 + fStack_4e4;
          fVar244 = fVar200 + fVar200 + fVar244;
          auVar175._0_4_ =
               (float)local_380._0_4_ * fVar201 +
               (float)local_a0._0_4_ * fVar225 +
               (float)local_540._0_4_ * fVar245 + (float)local_500._0_4_ * fVar308;
          auVar175._4_4_ =
               (float)local_380._4_4_ * fVar213 +
               (float)local_a0._4_4_ * fVar235 +
               (float)local_540._4_4_ * fVar258 + (float)local_500._4_4_ * fVar310;
          auVar175._8_4_ =
               fStack_378 * fVar214 +
               fStack_98 * fVar237 + fStack_538 * fVar260 + fStack_4f8 * fVar221;
          auVar175._12_4_ =
               fStack_374 * fVar215 +
               fStack_94 * fVar239 + fStack_534 * fVar262 + fStack_4f4 * fVar297;
          auVar175._16_4_ =
               fStack_370 * fVar217 +
               fStack_90 * fVar241 + fStack_530 * fVar264 + fStack_4f0 * fVar312;
          auVar175._20_4_ =
               fStack_36c * fVar219 +
               fStack_8c * fVar242 + fStack_52c * fVar265 + fStack_4ec * fVar314;
          auVar175._24_4_ =
               fStack_368 * fVar222 +
               fStack_88 * fVar243 + fStack_528 * fVar266 + fStack_4e8 * fVar224;
          auVar175._28_4_ = fVar280 + fVar244;
          auVar256._0_4_ =
               (float)local_4e0._0_4_ * fVar201 +
               (float)local_140._0_4_ * fVar225 +
               (float)local_4c0._0_4_ * fVar245 + fVar371 * fVar308;
          auVar256._4_4_ =
               (float)local_4e0._4_4_ * fVar213 +
               (float)local_140._4_4_ * fVar235 +
               (float)local_4c0._4_4_ * fVar258 + fVar374 * fVar310;
          auVar256._8_4_ =
               fStack_4d8 * fVar214 +
               fStack_138 * fVar237 + fStack_4b8 * fVar260 + fVar375 * fVar221;
          auVar256._12_4_ =
               fStack_4d4 * fVar215 +
               fStack_134 * fVar239 + fStack_4b4 * fVar262 + fVar376 * fVar297;
          auVar256._16_4_ =
               fStack_4d0 * fVar217 +
               fStack_130 * fVar241 + fStack_4b0 * fVar264 + fVar371 * fVar312;
          auVar256._20_4_ =
               fStack_4cc * fVar219 +
               fStack_12c * fVar242 + fStack_4ac * fVar265 + fVar374 * fVar314;
          auVar256._24_4_ =
               fStack_4c8 * fVar222 +
               fStack_128 * fVar243 + fStack_4a8 * fVar266 + fVar375 * fVar224;
          auVar256._28_4_ = fVar244 + fVar200 + fVar200 + fVar376;
          auVar322._0_4_ =
               (float)local_c0._0_4_ * fVar225 +
               fVar245 * (float)local_340._0_4_ + fVar308 * (float)local_160._0_4_ +
               fVar201 * (float)local_180._0_4_;
          auVar322._4_4_ =
               (float)local_c0._4_4_ * fVar235 +
               fVar258 * (float)local_340._4_4_ + fVar310 * (float)local_160._4_4_ +
               fVar213 * (float)local_180._4_4_;
          auVar322._8_4_ =
               fStack_b8 * fVar237 + fVar260 * fStack_338 + fVar221 * fStack_158 +
               fVar214 * fStack_178;
          auVar322._12_4_ =
               fStack_b4 * fVar239 + fVar262 * fStack_334 + fVar297 * fStack_154 +
               fVar215 * fStack_174;
          auVar322._16_4_ =
               fStack_b0 * fVar241 + fVar264 * fStack_330 + fVar312 * fStack_150 +
               fVar217 * fStack_170;
          auVar322._20_4_ =
               fStack_ac * fVar242 + fVar265 * fStack_32c + fVar314 * fStack_14c +
               fVar219 * fStack_16c;
          auVar322._24_4_ =
               fStack_a8 * fVar243 + fVar266 * fStack_328 + fVar224 * fStack_148 +
               fVar222 * fStack_168;
          auVar322._28_4_ = fVar200 + fVar280 + fVar244;
          auVar22 = vsubps_avx(auVar175,local_6c0);
          auVar321 = vsubps_avx(auVar256,local_740._0_32_);
          fVar201 = auVar22._0_4_;
          fVar213 = auVar22._4_4_;
          auVar69._4_4_ = local_740._4_4_ * fVar213;
          auVar69._0_4_ = local_740._0_4_ * fVar201;
          fVar214 = auVar22._8_4_;
          auVar69._8_4_ = local_740._8_4_ * fVar214;
          fVar215 = auVar22._12_4_;
          auVar69._12_4_ = local_740._12_4_ * fVar215;
          fVar217 = auVar22._16_4_;
          auVar69._16_4_ = local_740._16_4_ * fVar217;
          fVar219 = auVar22._20_4_;
          auVar69._20_4_ = local_740._20_4_ * fVar219;
          fVar222 = auVar22._24_4_;
          auVar69._24_4_ = local_740._24_4_ * fVar222;
          auVar69._28_4_ = fVar244;
          fVar225 = auVar321._0_4_;
          fVar235 = auVar321._4_4_;
          auVar70._4_4_ = fVar235 * local_6c0._4_4_;
          auVar70._0_4_ = fVar225 * local_6c0._0_4_;
          fVar237 = auVar321._8_4_;
          auVar70._8_4_ = fVar237 * local_6c0._8_4_;
          fVar239 = auVar321._12_4_;
          auVar70._12_4_ = fVar239 * local_6c0._12_4_;
          fVar241 = auVar321._16_4_;
          auVar70._16_4_ = fVar241 * local_6c0._16_4_;
          fVar242 = auVar321._20_4_;
          auVar70._20_4_ = fVar242 * local_6c0._20_4_;
          fVar243 = auVar321._24_4_;
          auVar70._24_4_ = fVar243 * local_6c0._24_4_;
          auVar70._28_4_ = auVar256._28_4_;
          auVar23 = vsubps_avx(auVar69,auVar70);
          auVar113._4_4_ = fVar157;
          auVar113._0_4_ = fVar143;
          auVar113._8_4_ = fVar158;
          auVar113._12_4_ = fVar159;
          auVar113._16_4_ = fVar160;
          auVar113._20_4_ = fVar161;
          auVar113._24_4_ = fVar162;
          auVar113._28_4_ = fVar163;
          auVar156 = ZEXT3264(auVar113);
          auVar21 = vmaxps_avx(auVar113,auVar322);
          auVar71._4_4_ = auVar21._4_4_ * auVar21._4_4_ * (fVar213 * fVar213 + fVar235 * fVar235);
          auVar71._0_4_ = auVar21._0_4_ * auVar21._0_4_ * (fVar201 * fVar201 + fVar225 * fVar225);
          auVar71._8_4_ = auVar21._8_4_ * auVar21._8_4_ * (fVar214 * fVar214 + fVar237 * fVar237);
          auVar71._12_4_ = auVar21._12_4_ * auVar21._12_4_ * (fVar215 * fVar215 + fVar239 * fVar239)
          ;
          auVar71._16_4_ = auVar21._16_4_ * auVar21._16_4_ * (fVar217 * fVar217 + fVar241 * fVar241)
          ;
          auVar71._20_4_ = auVar21._20_4_ * auVar21._20_4_ * (fVar219 * fVar219 + fVar242 * fVar242)
          ;
          auVar71._24_4_ = auVar21._24_4_ * auVar21._24_4_ * (fVar222 * fVar222 + fVar243 * fVar243)
          ;
          auVar71._28_4_ = fVar280 + auVar256._28_4_;
          auVar72._4_4_ = auVar23._4_4_ * auVar23._4_4_;
          auVar72._0_4_ = auVar23._0_4_ * auVar23._0_4_;
          auVar72._8_4_ = auVar23._8_4_ * auVar23._8_4_;
          auVar72._12_4_ = auVar23._12_4_ * auVar23._12_4_;
          auVar72._16_4_ = auVar23._16_4_ * auVar23._16_4_;
          auVar72._20_4_ = auVar23._20_4_ * auVar23._20_4_;
          auVar72._24_4_ = auVar23._24_4_ * auVar23._24_4_;
          auVar72._28_4_ = auVar23._28_4_;
          auVar234 = ZEXT3264(auVar72);
          auVar21 = vcmpps_avx(auVar72,auVar71,2);
          local_2a0 = (uint)lVar139;
          auVar192 = vpshufd_avx(ZEXT416(local_2a0),0);
          auVar250 = vpor_avx(auVar192,_DAT_01f7fcf0);
          auVar192 = vpor_avx(auVar192,_DAT_01fafea0);
          auVar250 = vpcmpgtd_avx(local_3a0._0_16_,auVar250);
          auVar192 = vpcmpgtd_avx(local_3a0._0_16_,auVar192);
          auVar176._16_16_ = auVar192;
          auVar176._0_16_ = auVar250;
          auVar23 = auVar176 & auVar21;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0x7f,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar23 >> 0xbf,0) != '\0') ||
              (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar23[0x1f] < '\0') {
            local_6e0._0_4_ = auVar125._0_4_;
            local_6e0._4_4_ = auVar125._4_4_;
            fStack_6d8 = auVar125._8_4_;
            fStack_6d4 = auVar125._12_4_;
            fStack_6d0 = auVar125._16_4_;
            fStack_6cc = auVar125._20_4_;
            fStack_6c8 = auVar125._24_4_;
            local_600._0_4_ = auVar124._0_4_;
            local_600._4_4_ = auVar124._4_4_;
            fStack_5f8 = auVar124._8_4_;
            fStack_5f4 = auVar124._12_4_;
            fStack_5f0 = auVar124._16_4_;
            fStack_5ec = auVar124._20_4_;
            fStack_5e8 = auVar124._24_4_;
            local_620 = (float)local_560._0_4_ * (float)local_6e0._0_4_ +
                        (float)local_360._0_4_ * (float)local_600._0_4_ +
                        (float)local_e0._0_4_ * fVar245 + (float)local_780._0_4_ * fVar308;
            fStack_61c = (float)local_560._4_4_ * (float)local_6e0._4_4_ +
                         (float)local_360._4_4_ * (float)local_600._4_4_ +
                         (float)local_e0._4_4_ * fVar258 + (float)local_780._4_4_ * fVar310;
            fStack_618 = fStack_558 * fStack_6d8 +
                         fStack_358 * fStack_5f8 + fStack_d8 * fVar260 + fStack_778 * fVar221;
            fStack_614 = fStack_554 * fStack_6d4 +
                         fStack_354 * fStack_5f4 + fStack_d4 * fVar262 + fStack_774 * fVar297;
            fStack_610 = fStack_550 * fStack_6d0 +
                         fStack_350 * fStack_5f0 + fStack_d0 * fVar264 + fStack_770 * fVar312;
            fStack_60c = fStack_54c * fStack_6cc +
                         fStack_34c * fStack_5ec + fStack_cc * fVar265 + fStack_76c * fVar314;
            fStack_608 = fStack_548 * fStack_6c8 +
                         fStack_348 * fStack_5e8 + fStack_c8 * fVar266 + fStack_768 * fVar224;
            fStack_604 = auVar322._28_4_ + fStack_544 + auVar192._12_4_ + 0.0;
            local_5c0._0_4_ = auVar122._0_4_;
            local_5c0._4_4_ = auVar122._4_4_;
            fStack_5b8 = auVar122._8_4_;
            fStack_5b4 = auVar122._12_4_;
            auStack_5b0._0_4_ = auVar122._16_4_;
            auStack_5b0._4_4_ = auVar122._20_4_;
            fStack_5a8 = auVar122._24_4_;
            local_6a0 = auVar121._0_4_;
            auStack_69c._0_4_ = auVar121._4_4_;
            auStack_69c._4_4_ = auVar121._8_4_;
            fStack_694 = auVar121._12_4_;
            fStack_690 = auVar121._16_4_;
            fStack_68c = auVar121._20_4_;
            fStack_688 = auVar121._24_4_;
            local_5e0._0_4_ = auVar120._0_4_;
            local_5e0._4_4_ = auVar120._4_4_;
            fStack_5d8 = auVar120._8_4_;
            fStack_5d4 = auVar120._12_4_;
            fStack_5d0 = auVar120._16_4_;
            fStack_5cc = auVar120._20_4_;
            fStack_5c8 = auVar120._24_4_;
            pfVar2 = (float *)(lVar137 + 0x21b0640 + lVar139 * 4);
            fVar201 = *pfVar2;
            fVar213 = pfVar2[1];
            fVar214 = pfVar2[2];
            fVar215 = pfVar2[3];
            fVar217 = pfVar2[4];
            fVar219 = pfVar2[5];
            fVar222 = pfVar2[6];
            pfVar3 = (float *)(lVar137 + 0x21b0ac4 + lVar139 * 4);
            fVar225 = *pfVar3;
            fVar235 = pfVar3[1];
            fVar237 = pfVar3[2];
            fVar239 = pfVar3[3];
            fVar241 = pfVar3[4];
            fVar242 = pfVar3[5];
            fVar243 = pfVar3[6];
            pfVar4 = (float *)(lVar137 + 0x21b01bc + lVar139 * 4);
            fVar245 = *pfVar4;
            fVar258 = pfVar4[1];
            fVar260 = pfVar4[2];
            fVar262 = pfVar4[3];
            fVar264 = pfVar4[4];
            fVar265 = pfVar4[5];
            fVar266 = pfVar4[6];
            fVar200 = pfVar2[7] + pfVar3[7];
            fStack_504 = pfVar3[7] + fStack_364 + 0.0;
            fVar244 = fStack_364 + fStack_4c4 + fStack_364 + 0.0;
            pfVar2 = (float *)(lVar137 + 0x21afd38 + lVar139 * 4);
            fVar308 = *pfVar2;
            fVar310 = pfVar2[1];
            fVar221 = pfVar2[2];
            fVar297 = pfVar2[3];
            fVar312 = pfVar2[4];
            fVar314 = pfVar2[5];
            fVar224 = pfVar2[6];
            local_640 = fVar308 * (float)local_380._0_4_ +
                        (float)local_a0._0_4_ * fVar245 +
                        (float)local_540._0_4_ * fVar201 + (float)local_500._0_4_ * fVar225;
            fStack_63c = fVar310 * (float)local_380._4_4_ +
                         (float)local_a0._4_4_ * fVar258 +
                         (float)local_540._4_4_ * fVar213 + (float)local_500._4_4_ * fVar235;
            fStack_638 = fVar221 * fStack_378 +
                         fStack_98 * fVar260 + fStack_538 * fVar214 + fStack_4f8 * fVar237;
            fStack_634 = fVar297 * fStack_374 +
                         fStack_94 * fVar262 + fStack_534 * fVar215 + fStack_4f4 * fVar239;
            fStack_630 = fVar312 * fStack_370 +
                         fStack_90 * fVar264 + fStack_530 * fVar217 + fStack_4f0 * fVar241;
            fStack_62c = fVar314 * fStack_36c +
                         fStack_8c * fVar265 + fStack_52c * fVar219 + fStack_4ec * fVar242;
            fStack_628 = fVar224 * fStack_368 +
                         fStack_88 * fVar266 + fStack_528 * fVar222 + fStack_4e8 * fVar243;
            fStack_624 = fVar200 + fStack_504;
            local_520 = fVar308 * (float)local_4e0._0_4_ +
                        (float)local_4c0._0_4_ * fVar201 + fVar371 * fVar225 +
                        (float)local_140._0_4_ * fVar245;
            fStack_51c = fVar310 * (float)local_4e0._4_4_ +
                         (float)local_4c0._4_4_ * fVar213 + fVar374 * fVar235 +
                         (float)local_140._4_4_ * fVar258;
            fStack_518 = fVar221 * fStack_4d8 +
                         fStack_4b8 * fVar214 + fVar375 * fVar237 + fStack_138 * fVar260;
            fStack_514 = fVar297 * fStack_4d4 +
                         fStack_4b4 * fVar215 + fVar376 * fVar239 + fStack_134 * fVar262;
            fStack_510 = fVar312 * fStack_4d0 +
                         fStack_4b0 * fVar217 + fVar371 * fVar241 + fStack_130 * fVar264;
            fStack_50c = fVar314 * fStack_4cc +
                         fStack_4ac * fVar219 + fVar374 * fVar242 + fStack_12c * fVar265;
            fStack_508 = fVar224 * fStack_4c8 +
                         fStack_4a8 * fVar222 + fVar375 * fVar243 + fStack_128 * fVar266;
            fStack_504 = fStack_504 + fVar244;
            auVar359._0_4_ =
                 fVar245 * (float)local_360._0_4_ +
                 (float)local_e0._0_4_ * fVar201 + (float)local_780._0_4_ * fVar225 +
                 fVar308 * (float)local_560._0_4_;
            auVar359._4_4_ =
                 fVar258 * (float)local_360._4_4_ +
                 (float)local_e0._4_4_ * fVar213 + (float)local_780._4_4_ * fVar235 +
                 fVar310 * (float)local_560._4_4_;
            auVar359._8_4_ =
                 fVar260 * fStack_358 + fStack_d8 * fVar214 + fStack_778 * fVar237 +
                 fVar221 * fStack_558;
            auVar359._12_4_ =
                 fVar262 * fStack_354 + fStack_d4 * fVar215 + fStack_774 * fVar239 +
                 fVar297 * fStack_554;
            auVar359._16_4_ =
                 fVar264 * fStack_350 + fStack_d0 * fVar217 + fStack_770 * fVar241 +
                 fVar312 * fStack_550;
            auVar359._20_4_ =
                 fVar265 * fStack_34c + fStack_cc * fVar219 + fStack_76c * fVar242 +
                 fVar314 * fStack_54c;
            auVar359._24_4_ =
                 fVar266 * fStack_348 + fStack_c8 * fVar222 + fStack_768 * fVar243 +
                 fVar224 * fStack_548;
            auVar359._28_4_ = pfVar4[7] + fVar200 + fVar244;
            pfVar2 = (float *)(lVar137 + 0x21b2a60 + lVar139 * 4);
            fVar201 = *pfVar2;
            fVar213 = pfVar2[1];
            fVar214 = pfVar2[2];
            fVar215 = pfVar2[3];
            fVar217 = pfVar2[4];
            fVar219 = pfVar2[5];
            fVar222 = pfVar2[6];
            pfVar3 = (float *)(lVar137 + 0x21b2ee4 + lVar139 * 4);
            fVar225 = *pfVar3;
            fVar235 = pfVar3[1];
            fVar237 = pfVar3[2];
            fVar239 = pfVar3[3];
            fVar241 = pfVar3[4];
            fVar242 = pfVar3[5];
            fVar243 = pfVar3[6];
            pfVar4 = (float *)(lVar137 + 0x21b25dc + lVar139 * 4);
            fVar245 = *pfVar4;
            fVar258 = pfVar4[1];
            fVar260 = pfVar4[2];
            fVar262 = pfVar4[3];
            fVar264 = pfVar4[4];
            fVar265 = pfVar4[5];
            fVar266 = pfVar4[6];
            pfVar5 = (float *)(lVar137 + 0x21b2158 + lVar139 * 4);
            fVar308 = *pfVar5;
            fVar310 = pfVar5[1];
            fVar221 = pfVar5[2];
            fVar297 = pfVar5[3];
            fVar312 = pfVar5[4];
            fVar314 = pfVar5[5];
            fVar224 = pfVar5[6];
            auVar323._0_4_ =
                 fVar308 * (float)local_380._0_4_ +
                 (float)local_a0._0_4_ * fVar245 +
                 (float)local_540._0_4_ * fVar201 + (float)local_500._0_4_ * fVar225;
            auVar323._4_4_ =
                 fVar310 * (float)local_380._4_4_ +
                 (float)local_a0._4_4_ * fVar258 +
                 (float)local_540._4_4_ * fVar213 + (float)local_500._4_4_ * fVar235;
            auVar323._8_4_ =
                 fVar221 * fStack_378 +
                 fStack_98 * fVar260 + fStack_538 * fVar214 + fStack_4f8 * fVar237;
            auVar323._12_4_ =
                 fVar297 * fStack_374 +
                 fStack_94 * fVar262 + fStack_534 * fVar215 + fStack_4f4 * fVar239;
            auVar323._16_4_ =
                 fVar312 * fStack_370 +
                 fStack_90 * fVar264 + fStack_530 * fVar217 + fStack_4f0 * fVar241;
            auVar323._20_4_ =
                 fVar314 * fStack_36c +
                 fStack_8c * fVar265 + fStack_52c * fVar219 + fStack_4ec * fVar242;
            auVar323._24_4_ =
                 fVar224 * fStack_368 +
                 fStack_88 * fVar266 + fStack_528 * fVar222 + fStack_4e8 * fVar243;
            auVar323._28_4_ = fVar376 + fVar376 + fStack_4e4 + fStack_504;
            auVar353._0_4_ =
                 fVar308 * (float)local_4e0._0_4_ +
                 fVar245 * (float)local_140._0_4_ +
                 (float)local_4c0._0_4_ * fVar201 + fVar371 * fVar225;
            auVar353._4_4_ =
                 fVar310 * (float)local_4e0._4_4_ +
                 fVar258 * (float)local_140._4_4_ +
                 (float)local_4c0._4_4_ * fVar213 + fVar374 * fVar235;
            auVar353._8_4_ =
                 fVar221 * fStack_4d8 +
                 fVar260 * fStack_138 + fStack_4b8 * fVar214 + fVar375 * fVar237;
            auVar353._12_4_ =
                 fVar297 * fStack_4d4 +
                 fVar262 * fStack_134 + fStack_4b4 * fVar215 + fVar376 * fVar239;
            auVar353._16_4_ =
                 fVar312 * fStack_4d0 +
                 fVar264 * fStack_130 + fStack_4b0 * fVar217 + fVar371 * fVar241;
            auVar353._20_4_ =
                 fVar314 * fStack_4cc +
                 fVar265 * fStack_12c + fStack_4ac * fVar219 + fVar374 * fVar242;
            auVar353._24_4_ =
                 fVar224 * fStack_4c8 +
                 fVar266 * fStack_128 + fStack_4a8 * fVar222 + fVar375 * fVar243;
            auVar353._28_4_ = fVar376 + fVar376 + fStack_124 + fVar376;
            auVar257._8_4_ = 0x7fffffff;
            auVar257._0_8_ = 0x7fffffff7fffffff;
            auVar257._12_4_ = 0x7fffffff;
            auVar257._16_4_ = 0x7fffffff;
            auVar257._20_4_ = 0x7fffffff;
            auVar257._24_4_ = 0x7fffffff;
            auVar257._28_4_ = 0x7fffffff;
            auVar116._4_4_ = fStack_63c;
            auVar116._0_4_ = local_640;
            auVar116._8_4_ = fStack_638;
            auVar116._12_4_ = fStack_634;
            auVar116._16_4_ = fStack_630;
            auVar116._20_4_ = fStack_62c;
            auVar116._24_4_ = fStack_628;
            auVar116._28_4_ = fStack_624;
            auVar23 = vandps_avx(auVar116,auVar257);
            auVar119._4_4_ = fStack_51c;
            auVar119._0_4_ = local_520;
            auVar119._8_4_ = fStack_518;
            auVar119._12_4_ = fStack_514;
            auVar119._16_4_ = fStack_510;
            auVar119._20_4_ = fStack_50c;
            auVar119._24_4_ = fStack_508;
            auVar119._28_4_ = fStack_504;
            auVar24 = vandps_avx(auVar119,auVar257);
            auVar24 = vmaxps_avx(auVar23,auVar24);
            auVar23 = vandps_avx(auVar359,auVar257);
            auVar24 = vmaxps_avx(auVar24,auVar23);
            auVar24 = vcmpps_avx(auVar24,_local_3c0,1);
            auVar25 = vblendvps_avx(auVar116,auVar22,auVar24);
            auVar153._0_4_ =
                 fVar308 * (float)local_560._0_4_ +
                 fVar245 * (float)local_360._0_4_ +
                 fVar225 * (float)local_780._0_4_ + (float)local_e0._0_4_ * fVar201;
            auVar153._4_4_ =
                 fVar310 * (float)local_560._4_4_ +
                 fVar258 * (float)local_360._4_4_ +
                 fVar235 * (float)local_780._4_4_ + (float)local_e0._4_4_ * fVar213;
            auVar153._8_4_ =
                 fVar221 * fStack_558 +
                 fVar260 * fStack_358 + fVar237 * fStack_778 + fStack_d8 * fVar214;
            auVar153._12_4_ =
                 fVar297 * fStack_554 +
                 fVar262 * fStack_354 + fVar239 * fStack_774 + fStack_d4 * fVar215;
            auVar153._16_4_ =
                 fVar312 * fStack_550 +
                 fVar264 * fStack_350 + fVar241 * fStack_770 + fStack_d0 * fVar217;
            auVar153._20_4_ =
                 fVar314 * fStack_54c +
                 fVar265 * fStack_34c + fVar242 * fStack_76c + fStack_cc * fVar219;
            auVar153._24_4_ =
                 fVar224 * fStack_548 +
                 fVar266 * fStack_348 + fVar243 * fStack_768 + fStack_c8 * fVar222;
            auVar153._28_4_ = auVar23._28_4_ + pfVar4[7] + pfVar3[7] + pfVar2[7];
            auVar26 = vblendvps_avx(auVar119,auVar321,auVar24);
            auVar23 = vandps_avx(auVar323,auVar257);
            auVar24 = vandps_avx(auVar353,auVar257);
            auVar24 = vmaxps_avx(auVar23,auVar24);
            auVar23 = vandps_avx(auVar153,auVar257);
            auVar23 = vmaxps_avx(auVar24,auVar23);
            local_760._0_4_ = auVar123._0_4_;
            local_760._4_4_ = auVar123._4_4_;
            uStack_758._0_4_ = auVar123._8_4_;
            uStack_758._4_4_ = auVar123._12_4_;
            auStack_750._0_4_ = auVar123._16_4_;
            auStack_750._4_4_ = auVar123._20_4_;
            fStack_748 = auVar123._24_4_;
            auVar23 = vcmpps_avx(auVar23,_local_3c0,1);
            auVar22 = vblendvps_avx(auVar323,auVar22,auVar23);
            auVar154._0_4_ =
                 (float)local_560._0_4_ * (float)local_760._0_4_ +
                 (float)local_360._0_4_ * (float)local_5c0._0_4_ +
                 (float)local_e0._0_4_ * (float)local_6a0 +
                 (float)local_780._0_4_ * (float)local_5e0._0_4_;
            auVar154._4_4_ =
                 (float)local_560._4_4_ * (float)local_760._4_4_ +
                 (float)local_360._4_4_ * (float)local_5c0._4_4_ +
                 (float)local_e0._4_4_ * (float)auStack_69c._0_4_ +
                 (float)local_780._4_4_ * (float)local_5e0._4_4_;
            auVar154._8_4_ =
                 fStack_558 * (float)uStack_758 +
                 fStack_358 * fStack_5b8 +
                 fStack_d8 * (float)auStack_69c._4_4_ + fStack_778 * fStack_5d8;
            auVar154._12_4_ =
                 fStack_554 * uStack_758._4_4_ +
                 fStack_354 * fStack_5b4 + fStack_d4 * fStack_694 + fStack_774 * fStack_5d4;
            auVar154._16_4_ =
                 fStack_550 * (float)auStack_750._0_4_ +
                 fStack_350 * (float)auStack_5b0._0_4_ +
                 fStack_d0 * fStack_690 + fStack_770 * fStack_5d0;
            auVar154._20_4_ =
                 fStack_54c * (float)auStack_750._4_4_ +
                 fStack_34c * (float)auStack_5b0._4_4_ +
                 fStack_cc * fStack_68c + fStack_76c * fStack_5cc;
            auVar154._24_4_ =
                 fStack_548 * fStack_748 +
                 fStack_348 * fStack_5a8 + fStack_c8 * fStack_688 + fStack_768 * fStack_5c8;
            auVar154._28_4_ = auVar24._28_4_ + fStack_604 + auVar192._12_4_ + 0.0;
            auVar23 = vblendvps_avx(auVar353,auVar321,auVar23);
            fVar298 = auVar25._0_4_;
            fVar306 = auVar25._4_4_;
            fVar307 = auVar25._8_4_;
            fVar309 = auVar25._12_4_;
            fVar311 = auVar25._16_4_;
            fVar313 = auVar25._20_4_;
            fVar317 = auVar25._24_4_;
            fVar328 = auVar25._28_4_;
            fVar245 = auVar22._0_4_;
            fVar260 = auVar22._4_4_;
            fVar264 = auVar22._8_4_;
            fVar266 = auVar22._12_4_;
            fVar310 = auVar22._16_4_;
            fVar297 = auVar22._20_4_;
            fVar314 = auVar22._24_4_;
            fVar201 = auVar26._0_4_;
            fVar214 = auVar26._4_4_;
            fVar217 = auVar26._8_4_;
            fVar222 = auVar26._12_4_;
            fVar235 = auVar26._16_4_;
            fVar239 = auVar26._20_4_;
            fVar242 = auVar26._24_4_;
            auVar340._0_4_ = fVar201 * fVar201 + fVar298 * fVar298;
            auVar340._4_4_ = fVar214 * fVar214 + fVar306 * fVar306;
            auVar340._8_4_ = fVar217 * fVar217 + fVar307 * fVar307;
            auVar340._12_4_ = fVar222 * fVar222 + fVar309 * fVar309;
            auVar340._16_4_ = fVar235 * fVar235 + fVar311 * fVar311;
            auVar340._20_4_ = fVar239 * fVar239 + fVar313 * fVar313;
            auVar340._24_4_ = fVar242 * fVar242 + fVar317 * fVar317;
            auVar340._28_4_ = fStack_4a4 + auVar321._28_4_;
            auVar24 = vrsqrtps_avx(auVar340);
            fVar213 = auVar24._0_4_;
            fVar215 = auVar24._4_4_;
            auVar73._4_4_ = fVar215 * 1.5;
            auVar73._0_4_ = fVar213 * 1.5;
            fVar219 = auVar24._8_4_;
            auVar73._8_4_ = fVar219 * 1.5;
            fVar225 = auVar24._12_4_;
            auVar73._12_4_ = fVar225 * 1.5;
            fVar237 = auVar24._16_4_;
            auVar73._16_4_ = fVar237 * 1.5;
            fVar241 = auVar24._20_4_;
            auVar73._20_4_ = fVar241 * 1.5;
            fVar243 = auVar24._24_4_;
            auVar73._24_4_ = fVar243 * 1.5;
            auVar73._28_4_ = auVar353._28_4_;
            auVar74._4_4_ = fVar215 * fVar215 * fVar215 * auVar340._4_4_ * 0.5;
            auVar74._0_4_ = fVar213 * fVar213 * fVar213 * auVar340._0_4_ * 0.5;
            auVar74._8_4_ = fVar219 * fVar219 * fVar219 * auVar340._8_4_ * 0.5;
            auVar74._12_4_ = fVar225 * fVar225 * fVar225 * auVar340._12_4_ * 0.5;
            auVar74._16_4_ = fVar237 * fVar237 * fVar237 * auVar340._16_4_ * 0.5;
            auVar74._20_4_ = fVar241 * fVar241 * fVar241 * auVar340._20_4_ * 0.5;
            auVar74._24_4_ = fVar243 * fVar243 * fVar243 * auVar340._24_4_ * 0.5;
            auVar74._28_4_ = auVar340._28_4_;
            auVar25 = vsubps_avx(auVar73,auVar74);
            fVar200 = auVar25._0_4_;
            fVar244 = auVar25._4_4_;
            fVar280 = auVar25._8_4_;
            fVar216 = auVar25._12_4_;
            fVar218 = auVar25._16_4_;
            fVar220 = auVar25._20_4_;
            fVar223 = auVar25._24_4_;
            fVar213 = auVar23._0_4_;
            fVar215 = auVar23._4_4_;
            fVar219 = auVar23._8_4_;
            fVar225 = auVar23._12_4_;
            fVar237 = auVar23._16_4_;
            fVar241 = auVar23._20_4_;
            fVar243 = auVar23._24_4_;
            auVar304._0_4_ = fVar213 * fVar213 + fVar245 * fVar245;
            auVar304._4_4_ = fVar215 * fVar215 + fVar260 * fVar260;
            auVar304._8_4_ = fVar219 * fVar219 + fVar264 * fVar264;
            auVar304._12_4_ = fVar225 * fVar225 + fVar266 * fVar266;
            auVar304._16_4_ = fVar237 * fVar237 + fVar310 * fVar310;
            auVar304._20_4_ = fVar241 * fVar241 + fVar297 * fVar297;
            auVar304._24_4_ = fVar243 * fVar243 + fVar314 * fVar314;
            auVar304._28_4_ = auVar24._28_4_ + auVar22._28_4_;
            auVar22 = vrsqrtps_avx(auVar304);
            fVar258 = auVar22._0_4_;
            fVar262 = auVar22._4_4_;
            auVar75._4_4_ = fVar262 * 1.5;
            auVar75._0_4_ = fVar258 * 1.5;
            fVar265 = auVar22._8_4_;
            auVar75._8_4_ = fVar265 * 1.5;
            fVar308 = auVar22._12_4_;
            auVar75._12_4_ = fVar308 * 1.5;
            fVar221 = auVar22._16_4_;
            auVar75._16_4_ = fVar221 * 1.5;
            fVar312 = auVar22._20_4_;
            auVar75._20_4_ = fVar312 * 1.5;
            fVar224 = auVar22._24_4_;
            auVar75._24_4_ = fVar224 * 1.5;
            auVar75._28_4_ = auVar353._28_4_;
            auVar76._4_4_ = fVar262 * fVar262 * fVar262 * auVar304._4_4_ * 0.5;
            auVar76._0_4_ = fVar258 * fVar258 * fVar258 * auVar304._0_4_ * 0.5;
            auVar76._8_4_ = fVar265 * fVar265 * fVar265 * auVar304._8_4_ * 0.5;
            auVar76._12_4_ = fVar308 * fVar308 * fVar308 * auVar304._12_4_ * 0.5;
            auVar76._16_4_ = fVar221 * fVar221 * fVar221 * auVar304._16_4_ * 0.5;
            auVar76._20_4_ = fVar312 * fVar312 * fVar312 * auVar304._20_4_ * 0.5;
            auVar76._24_4_ = fVar224 * fVar224 * fVar224 * auVar304._24_4_ * 0.5;
            auVar76._28_4_ = auVar304._28_4_;
            auVar23 = vsubps_avx(auVar75,auVar76);
            fVar258 = auVar23._0_4_;
            fVar262 = auVar23._4_4_;
            fVar265 = auVar23._8_4_;
            fVar308 = auVar23._12_4_;
            fVar221 = auVar23._16_4_;
            fVar312 = auVar23._20_4_;
            fVar224 = auVar23._24_4_;
            fVar201 = fVar143 * fVar200 * fVar201;
            fVar214 = fVar157 * fVar244 * fVar214;
            auVar77._4_4_ = fVar214;
            auVar77._0_4_ = fVar201;
            fVar217 = fVar158 * fVar280 * fVar217;
            auVar77._8_4_ = fVar217;
            fVar222 = fVar159 * fVar216 * fVar222;
            auVar77._12_4_ = fVar222;
            fVar235 = fVar160 * fVar218 * fVar235;
            auVar77._16_4_ = fVar235;
            fVar239 = fVar161 * fVar220 * fVar239;
            auVar77._20_4_ = fVar239;
            fVar242 = fVar162 * fVar223 * fVar242;
            auVar77._24_4_ = fVar242;
            auVar77._28_4_ = auVar22._28_4_;
            local_760._4_4_ = fVar214 + local_6c0._4_4_;
            local_760._0_4_ = fVar201 + local_6c0._0_4_;
            uStack_758._0_4_ = fVar217 + local_6c0._8_4_;
            uStack_758._4_4_ = fVar222 + local_6c0._12_4_;
            auStack_750._0_4_ = fVar235 + local_6c0._16_4_;
            auStack_750._4_4_ = fVar239 + local_6c0._20_4_;
            fStack_748 = fVar242 + local_6c0._24_4_;
            fStack_744 = auVar22._28_4_ + local_6c0._28_4_;
            fVar201 = fVar143 * fVar200 * -fVar298;
            fVar214 = fVar157 * fVar244 * -fVar306;
            auVar78._4_4_ = fVar214;
            auVar78._0_4_ = fVar201;
            fVar217 = fVar158 * fVar280 * -fVar307;
            auVar78._8_4_ = fVar217;
            fVar222 = fVar159 * fVar216 * -fVar309;
            auVar78._12_4_ = fVar222;
            fVar235 = fVar160 * fVar218 * -fVar311;
            auVar78._16_4_ = fVar235;
            fVar239 = fVar161 * fVar220 * -fVar313;
            auVar78._20_4_ = fVar239;
            fVar242 = fVar162 * fVar223 * -fVar317;
            auVar78._24_4_ = fVar242;
            auVar78._28_4_ = -fVar328;
            auStack_69c._0_4_ = local_740._4_4_ + fVar214;
            local_6a0 = (undefined1  [4])(local_740._0_4_ + fVar201);
            auStack_69c._4_4_ = local_740._8_4_ + fVar217;
            fStack_694 = local_740._12_4_ + fVar222;
            fStack_690 = local_740._16_4_ + fVar235;
            fStack_68c = local_740._20_4_ + fVar239;
            fStack_688 = local_740._24_4_ + fVar242;
            fStack_684 = local_740._28_4_ + -fVar328;
            fVar201 = fVar200 * 0.0 * fVar143;
            fVar214 = fVar244 * 0.0 * fVar157;
            auVar79._4_4_ = fVar214;
            auVar79._0_4_ = fVar201;
            fVar217 = fVar280 * 0.0 * fVar158;
            auVar79._8_4_ = fVar217;
            fVar222 = fVar216 * 0.0 * fVar159;
            auVar79._12_4_ = fVar222;
            fVar235 = fVar218 * 0.0 * fVar160;
            auVar79._16_4_ = fVar235;
            fVar239 = fVar220 * 0.0 * fVar161;
            auVar79._20_4_ = fVar239;
            fVar242 = fVar223 * 0.0 * fVar162;
            auVar79._24_4_ = fVar242;
            auVar79._28_4_ = fVar328;
            auVar27 = vsubps_avx(local_6c0,auVar77);
            auVar373._0_4_ = fVar201 + auVar154._0_4_;
            auVar373._4_4_ = fVar214 + auVar154._4_4_;
            auVar373._8_4_ = fVar217 + auVar154._8_4_;
            auVar373._12_4_ = fVar222 + auVar154._12_4_;
            auVar373._16_4_ = fVar235 + auVar154._16_4_;
            auVar373._20_4_ = fVar239 + auVar154._20_4_;
            auVar373._24_4_ = fVar242 + auVar154._24_4_;
            auVar373._28_4_ = fVar328 + auVar154._28_4_;
            fVar201 = auVar322._0_4_ * fVar258 * fVar213;
            fVar213 = auVar322._4_4_ * fVar262 * fVar215;
            auVar80._4_4_ = fVar213;
            auVar80._0_4_ = fVar201;
            fVar214 = auVar322._8_4_ * fVar265 * fVar219;
            auVar80._8_4_ = fVar214;
            fVar215 = auVar322._12_4_ * fVar308 * fVar225;
            auVar80._12_4_ = fVar215;
            fVar217 = auVar322._16_4_ * fVar221 * fVar237;
            auVar80._16_4_ = fVar217;
            fVar219 = auVar322._20_4_ * fVar312 * fVar241;
            auVar80._20_4_ = fVar219;
            fVar222 = auVar322._24_4_ * fVar224 * fVar243;
            auVar80._24_4_ = fVar222;
            auVar80._28_4_ = fVar163;
            auVar171 = vsubps_avx(local_740._0_32_,auVar78);
            auVar360._0_4_ = auVar175._0_4_ + fVar201;
            auVar360._4_4_ = auVar175._4_4_ + fVar213;
            auVar360._8_4_ = auVar175._8_4_ + fVar214;
            auVar360._12_4_ = auVar175._12_4_ + fVar215;
            auVar360._16_4_ = auVar175._16_4_ + fVar217;
            auVar360._20_4_ = auVar175._20_4_ + fVar219;
            auVar360._24_4_ = auVar175._24_4_ + fVar222;
            auVar360._28_4_ = auVar175._28_4_ + fVar163;
            fVar201 = fVar258 * -fVar245 * auVar322._0_4_;
            fVar213 = fVar262 * -fVar260 * auVar322._4_4_;
            auVar81._4_4_ = fVar213;
            auVar81._0_4_ = fVar201;
            fVar214 = fVar265 * -fVar264 * auVar322._8_4_;
            auVar81._8_4_ = fVar214;
            fVar215 = fVar308 * -fVar266 * auVar322._12_4_;
            auVar81._12_4_ = fVar215;
            fVar217 = fVar221 * -fVar310 * auVar322._16_4_;
            auVar81._16_4_ = fVar217;
            fVar219 = fVar312 * -fVar297 * auVar322._20_4_;
            auVar81._20_4_ = fVar219;
            fVar222 = fVar224 * -fVar314 * auVar322._24_4_;
            auVar81._24_4_ = fVar222;
            auVar81._28_4_ = local_6c0._28_4_;
            auVar172 = vsubps_avx(auVar154,auVar79);
            auVar232._0_4_ = auVar256._0_4_ + fVar201;
            auVar232._4_4_ = auVar256._4_4_ + fVar213;
            auVar232._8_4_ = auVar256._8_4_ + fVar214;
            auVar232._12_4_ = auVar256._12_4_ + fVar215;
            auVar232._16_4_ = auVar256._16_4_ + fVar217;
            auVar232._20_4_ = auVar256._20_4_ + fVar219;
            auVar232._24_4_ = auVar256._24_4_ + fVar222;
            auVar232._28_4_ = auVar256._28_4_ + local_6c0._28_4_;
            fVar201 = fVar258 * 0.0 * auVar322._0_4_;
            fVar213 = fVar262 * 0.0 * auVar322._4_4_;
            auVar82._4_4_ = fVar213;
            auVar82._0_4_ = fVar201;
            fVar214 = fVar265 * 0.0 * auVar322._8_4_;
            auVar82._8_4_ = fVar214;
            fVar215 = fVar308 * 0.0 * auVar322._12_4_;
            auVar82._12_4_ = fVar215;
            fVar217 = fVar221 * 0.0 * auVar322._16_4_;
            auVar82._16_4_ = fVar217;
            fVar219 = fVar312 * 0.0 * auVar322._20_4_;
            auVar82._20_4_ = fVar219;
            fVar222 = fVar224 * 0.0 * auVar322._24_4_;
            auVar82._24_4_ = fVar222;
            auVar82._28_4_ = auVar154._28_4_;
            auVar22 = vsubps_avx(auVar175,auVar80);
            auVar118._4_4_ = fStack_61c;
            auVar118._0_4_ = local_620;
            auVar118._8_4_ = fStack_618;
            auVar118._12_4_ = fStack_614;
            auVar118._16_4_ = fStack_610;
            auVar118._20_4_ = fStack_60c;
            auVar118._24_4_ = fStack_608;
            auVar118._28_4_ = fStack_604;
            auVar324._0_4_ = local_620 + fVar201;
            auVar324._4_4_ = fStack_61c + fVar213;
            auVar324._8_4_ = fStack_618 + fVar214;
            auVar324._12_4_ = fStack_614 + fVar215;
            auVar324._16_4_ = fStack_610 + fVar217;
            auVar324._20_4_ = fStack_60c + fVar219;
            auVar324._24_4_ = fStack_608 + fVar222;
            auVar324._28_4_ = fStack_604 + auVar154._28_4_;
            auVar24 = vsubps_avx(auVar256,auVar81);
            auVar25 = vsubps_avx(auVar118,auVar82);
            auVar26 = vsubps_avx(auVar232,auVar171);
            auVar28 = vsubps_avx(auVar324,auVar172);
            auVar83._4_4_ = auVar172._4_4_ * auVar26._4_4_;
            auVar83._0_4_ = auVar172._0_4_ * auVar26._0_4_;
            auVar83._8_4_ = auVar172._8_4_ * auVar26._8_4_;
            auVar83._12_4_ = auVar172._12_4_ * auVar26._12_4_;
            auVar83._16_4_ = auVar172._16_4_ * auVar26._16_4_;
            auVar83._20_4_ = auVar172._20_4_ * auVar26._20_4_;
            auVar83._24_4_ = auVar172._24_4_ * auVar26._24_4_;
            auVar83._28_4_ = auVar353._28_4_;
            auVar84._4_4_ = auVar171._4_4_ * auVar28._4_4_;
            auVar84._0_4_ = auVar171._0_4_ * auVar28._0_4_;
            auVar84._8_4_ = auVar171._8_4_ * auVar28._8_4_;
            auVar84._12_4_ = auVar171._12_4_ * auVar28._12_4_;
            auVar84._16_4_ = auVar171._16_4_ * auVar28._16_4_;
            auVar84._20_4_ = auVar171._20_4_ * auVar28._20_4_;
            auVar84._24_4_ = auVar171._24_4_ * auVar28._24_4_;
            auVar84._28_4_ = auVar256._28_4_;
            auVar147 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = auVar27._4_4_ * auVar28._4_4_;
            auVar85._0_4_ = auVar27._0_4_ * auVar28._0_4_;
            auVar85._8_4_ = auVar27._8_4_ * auVar28._8_4_;
            auVar85._12_4_ = auVar27._12_4_ * auVar28._12_4_;
            auVar85._16_4_ = auVar27._16_4_ * auVar28._16_4_;
            auVar85._20_4_ = auVar27._20_4_ * auVar28._20_4_;
            auVar85._24_4_ = auVar27._24_4_ * auVar28._24_4_;
            auVar85._28_4_ = auVar28._28_4_;
            auVar28 = vsubps_avx(auVar360,auVar27);
            auVar86._4_4_ = auVar172._4_4_ * auVar28._4_4_;
            auVar86._0_4_ = auVar172._0_4_ * auVar28._0_4_;
            auVar86._8_4_ = auVar172._8_4_ * auVar28._8_4_;
            auVar86._12_4_ = auVar172._12_4_ * auVar28._12_4_;
            auVar86._16_4_ = auVar172._16_4_ * auVar28._16_4_;
            auVar86._20_4_ = auVar172._20_4_ * auVar28._20_4_;
            auVar86._24_4_ = auVar172._24_4_ * auVar28._24_4_;
            auVar86._28_4_ = auVar23._28_4_;
            auVar148 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = auVar171._4_4_ * auVar28._4_4_;
            auVar87._0_4_ = auVar171._0_4_ * auVar28._0_4_;
            auVar87._8_4_ = auVar171._8_4_ * auVar28._8_4_;
            auVar87._12_4_ = auVar171._12_4_ * auVar28._12_4_;
            auVar87._16_4_ = auVar171._16_4_ * auVar28._16_4_;
            auVar87._20_4_ = auVar171._20_4_ * auVar28._20_4_;
            auVar87._24_4_ = auVar171._24_4_ * auVar28._24_4_;
            auVar87._28_4_ = auVar23._28_4_;
            auVar88._4_4_ = auVar27._4_4_ * auVar26._4_4_;
            auVar88._0_4_ = auVar27._0_4_ * auVar26._0_4_;
            auVar88._8_4_ = auVar27._8_4_ * auVar26._8_4_;
            auVar88._12_4_ = auVar27._12_4_ * auVar26._12_4_;
            auVar88._16_4_ = auVar27._16_4_ * auVar26._16_4_;
            auVar88._20_4_ = auVar27._20_4_ * auVar26._20_4_;
            auVar88._24_4_ = auVar27._24_4_ * auVar26._24_4_;
            auVar88._28_4_ = auVar26._28_4_;
            auVar23 = vsubps_avx(auVar88,auVar87);
            auVar177._0_4_ = auVar147._0_4_ * 0.0 + auVar23._0_4_ + auVar148._0_4_ * 0.0;
            auVar177._4_4_ = auVar147._4_4_ * 0.0 + auVar23._4_4_ + auVar148._4_4_ * 0.0;
            auVar177._8_4_ = auVar147._8_4_ * 0.0 + auVar23._8_4_ + auVar148._8_4_ * 0.0;
            auVar177._12_4_ = auVar147._12_4_ * 0.0 + auVar23._12_4_ + auVar148._12_4_ * 0.0;
            auVar177._16_4_ = auVar147._16_4_ * 0.0 + auVar23._16_4_ + auVar148._16_4_ * 0.0;
            auVar177._20_4_ = auVar147._20_4_ * 0.0 + auVar23._20_4_ + auVar148._20_4_ * 0.0;
            auVar177._24_4_ = auVar147._24_4_ * 0.0 + auVar23._24_4_ + auVar148._24_4_ * 0.0;
            auVar177._28_4_ = auVar147._28_4_ + auVar23._28_4_ + auVar148._28_4_;
            auVar170 = vcmpps_avx(auVar177,ZEXT832(0) << 0x20,2);
            auVar22 = vblendvps_avx(auVar22,_local_760,auVar170);
            auVar212 = ZEXT3264(auVar22);
            auVar23 = vblendvps_avx(auVar24,_local_6a0,auVar170);
            auVar24 = vblendvps_avx(auVar25,auVar373,auVar170);
            auVar25 = vblendvps_avx(auVar27,auVar360,auVar170);
            auVar26 = vblendvps_avx(auVar171,auVar232,auVar170);
            auVar28 = vblendvps_avx(auVar172,auVar324,auVar170);
            auVar27 = vblendvps_avx(auVar360,auVar27,auVar170);
            auVar147 = vblendvps_avx(auVar232,auVar171,auVar170);
            auVar148 = vblendvps_avx(auVar324,auVar172,auVar170);
            local_740._0_32_ = vandps_avx(auVar21,auVar176);
            auVar27 = vsubps_avx(auVar27,auVar22);
            auVar173 = vsubps_avx(auVar147,auVar23);
            auVar148 = vsubps_avx(auVar148,auVar24);
            auVar195 = vsubps_avx(auVar23,auVar26);
            fVar201 = auVar173._0_4_;
            fVar282 = auVar24._0_4_;
            fVar225 = auVar173._4_4_;
            fVar292 = auVar24._4_4_;
            auVar89._4_4_ = fVar292 * fVar225;
            auVar89._0_4_ = fVar282 * fVar201;
            fVar245 = auVar173._8_4_;
            fVar294 = auVar24._8_4_;
            auVar89._8_4_ = fVar294 * fVar245;
            fVar308 = auVar173._12_4_;
            fVar296 = auVar24._12_4_;
            auVar89._12_4_ = fVar296 * fVar308;
            fVar200 = auVar173._16_4_;
            fVar164 = auVar24._16_4_;
            auVar89._16_4_ = fVar164 * fVar200;
            fVar298 = auVar173._20_4_;
            fVar180 = auVar24._20_4_;
            auVar89._20_4_ = fVar180 * fVar298;
            fVar328 = auVar173._24_4_;
            fVar181 = auVar24._24_4_;
            auVar89._24_4_ = fVar181 * fVar328;
            auVar89._28_4_ = auVar147._28_4_;
            fVar213 = auVar23._0_4_;
            fVar182 = auVar148._0_4_;
            fVar235 = auVar23._4_4_;
            fVar183 = auVar148._4_4_;
            auVar90._4_4_ = fVar183 * fVar235;
            auVar90._0_4_ = fVar182 * fVar213;
            fVar258 = auVar23._8_4_;
            fVar185 = auVar148._8_4_;
            auVar90._8_4_ = fVar185 * fVar258;
            fVar310 = auVar23._12_4_;
            fVar186 = auVar148._12_4_;
            auVar90._12_4_ = fVar186 * fVar310;
            fVar244 = auVar23._16_4_;
            fVar187 = auVar148._16_4_;
            auVar90._16_4_ = fVar187 * fVar244;
            fVar306 = auVar23._20_4_;
            fVar226 = auVar148._20_4_;
            auVar90._20_4_ = fVar226 * fVar306;
            fVar331 = auVar23._24_4_;
            fVar236 = auVar148._24_4_;
            uVar6 = auVar171._28_4_;
            auVar90._24_4_ = fVar236 * fVar331;
            auVar90._28_4_ = uVar6;
            auVar147 = vsubps_avx(auVar90,auVar89);
            fVar214 = auVar22._0_4_;
            fVar237 = auVar22._4_4_;
            auVar91._4_4_ = fVar183 * fVar237;
            auVar91._0_4_ = fVar182 * fVar214;
            fVar260 = auVar22._8_4_;
            auVar91._8_4_ = fVar185 * fVar260;
            fVar221 = auVar22._12_4_;
            auVar91._12_4_ = fVar186 * fVar221;
            fVar280 = auVar22._16_4_;
            auVar91._16_4_ = fVar187 * fVar280;
            fVar307 = auVar22._20_4_;
            auVar91._20_4_ = fVar226 * fVar307;
            fVar333 = auVar22._24_4_;
            auVar91._24_4_ = fVar236 * fVar333;
            auVar91._28_4_ = uVar6;
            fVar215 = auVar27._0_4_;
            fVar239 = auVar27._4_4_;
            auVar92._4_4_ = fVar292 * fVar239;
            auVar92._0_4_ = fVar282 * fVar215;
            fVar262 = auVar27._8_4_;
            auVar92._8_4_ = fVar294 * fVar262;
            fVar297 = auVar27._12_4_;
            auVar92._12_4_ = fVar296 * fVar297;
            fVar216 = auVar27._16_4_;
            auVar92._16_4_ = fVar164 * fVar216;
            fVar309 = auVar27._20_4_;
            auVar92._20_4_ = fVar180 * fVar309;
            fVar334 = auVar27._24_4_;
            auVar92._24_4_ = fVar181 * fVar334;
            auVar92._28_4_ = auVar360._28_4_;
            auVar171 = vsubps_avx(auVar92,auVar91);
            auVar93._4_4_ = fVar235 * fVar239;
            auVar93._0_4_ = fVar213 * fVar215;
            auVar93._8_4_ = fVar258 * fVar262;
            auVar93._12_4_ = fVar310 * fVar297;
            auVar93._16_4_ = fVar244 * fVar216;
            auVar93._20_4_ = fVar306 * fVar309;
            auVar93._24_4_ = fVar331 * fVar334;
            auVar93._28_4_ = uVar6;
            auVar94._4_4_ = fVar237 * fVar225;
            auVar94._0_4_ = fVar214 * fVar201;
            auVar94._8_4_ = fVar260 * fVar245;
            auVar94._12_4_ = fVar221 * fVar308;
            auVar94._16_4_ = fVar280 * fVar200;
            auVar94._20_4_ = fVar307 * fVar298;
            auVar94._24_4_ = fVar333 * fVar328;
            auVar94._28_4_ = auVar172._28_4_;
            auVar172 = vsubps_avx(auVar94,auVar93);
            auVar196 = vsubps_avx(auVar24,auVar28);
            fVar219 = auVar172._28_4_ + auVar171._28_4_;
            auVar341._0_4_ = auVar172._0_4_ + auVar171._0_4_ * 0.0 + auVar147._0_4_ * 0.0;
            auVar341._4_4_ = auVar172._4_4_ + auVar171._4_4_ * 0.0 + auVar147._4_4_ * 0.0;
            auVar341._8_4_ = auVar172._8_4_ + auVar171._8_4_ * 0.0 + auVar147._8_4_ * 0.0;
            auVar341._12_4_ = auVar172._12_4_ + auVar171._12_4_ * 0.0 + auVar147._12_4_ * 0.0;
            auVar341._16_4_ = auVar172._16_4_ + auVar171._16_4_ * 0.0 + auVar147._16_4_ * 0.0;
            auVar341._20_4_ = auVar172._20_4_ + auVar171._20_4_ * 0.0 + auVar147._20_4_ * 0.0;
            auVar341._24_4_ = auVar172._24_4_ + auVar171._24_4_ * 0.0 + auVar147._24_4_ * 0.0;
            auVar341._28_4_ = fVar219 + auVar147._28_4_;
            fVar217 = auVar195._0_4_;
            fVar241 = auVar195._4_4_;
            auVar95._4_4_ = auVar28._4_4_ * fVar241;
            auVar95._0_4_ = auVar28._0_4_ * fVar217;
            fVar264 = auVar195._8_4_;
            auVar95._8_4_ = auVar28._8_4_ * fVar264;
            fVar312 = auVar195._12_4_;
            auVar95._12_4_ = auVar28._12_4_ * fVar312;
            fVar218 = auVar195._16_4_;
            auVar95._16_4_ = auVar28._16_4_ * fVar218;
            fVar311 = auVar195._20_4_;
            auVar95._20_4_ = auVar28._20_4_ * fVar311;
            fVar199 = auVar195._24_4_;
            auVar95._24_4_ = auVar28._24_4_ * fVar199;
            auVar95._28_4_ = fVar219;
            fVar219 = auVar196._0_4_;
            fVar242 = auVar196._4_4_;
            auVar96._4_4_ = auVar26._4_4_ * fVar242;
            auVar96._0_4_ = auVar26._0_4_ * fVar219;
            fVar265 = auVar196._8_4_;
            auVar96._8_4_ = auVar26._8_4_ * fVar265;
            fVar314 = auVar196._12_4_;
            auVar96._12_4_ = auVar26._12_4_ * fVar314;
            fVar220 = auVar196._16_4_;
            auVar96._16_4_ = auVar26._16_4_ * fVar220;
            fVar313 = auVar196._20_4_;
            auVar96._20_4_ = auVar26._20_4_ * fVar313;
            fVar335 = auVar196._24_4_;
            auVar96._24_4_ = auVar26._24_4_ * fVar335;
            auVar96._28_4_ = auVar172._28_4_;
            auVar171 = vsubps_avx(auVar96,auVar95);
            auVar172 = vsubps_avx(auVar22,auVar25);
            fVar222 = auVar172._0_4_;
            fVar243 = auVar172._4_4_;
            auVar97._4_4_ = auVar28._4_4_ * fVar243;
            auVar97._0_4_ = auVar28._0_4_ * fVar222;
            fVar266 = auVar172._8_4_;
            auVar97._8_4_ = auVar28._8_4_ * fVar266;
            fVar224 = auVar172._12_4_;
            auVar97._12_4_ = auVar28._12_4_ * fVar224;
            fVar223 = auVar172._16_4_;
            auVar97._16_4_ = auVar28._16_4_ * fVar223;
            fVar317 = auVar172._20_4_;
            auVar97._20_4_ = auVar28._20_4_ * fVar317;
            fVar365 = auVar172._24_4_;
            auVar97._24_4_ = auVar28._24_4_ * fVar365;
            auVar97._28_4_ = auVar28._28_4_;
            auVar98._4_4_ = fVar242 * auVar25._4_4_;
            auVar98._0_4_ = fVar219 * auVar25._0_4_;
            auVar98._8_4_ = fVar265 * auVar25._8_4_;
            auVar98._12_4_ = fVar314 * auVar25._12_4_;
            auVar98._16_4_ = fVar220 * auVar25._16_4_;
            auVar98._20_4_ = fVar313 * auVar25._20_4_;
            auVar98._24_4_ = fVar335 * auVar25._24_4_;
            auVar98._28_4_ = auVar147._28_4_;
            auVar28 = vsubps_avx(auVar97,auVar98);
            auVar99._4_4_ = auVar26._4_4_ * fVar243;
            auVar99._0_4_ = auVar26._0_4_ * fVar222;
            auVar99._8_4_ = auVar26._8_4_ * fVar266;
            auVar99._12_4_ = auVar26._12_4_ * fVar224;
            auVar99._16_4_ = auVar26._16_4_ * fVar223;
            auVar99._20_4_ = auVar26._20_4_ * fVar317;
            auVar99._24_4_ = auVar26._24_4_ * fVar365;
            auVar99._28_4_ = auVar26._28_4_;
            auVar100._4_4_ = fVar241 * auVar25._4_4_;
            auVar100._0_4_ = fVar217 * auVar25._0_4_;
            auVar100._8_4_ = fVar264 * auVar25._8_4_;
            auVar100._12_4_ = fVar312 * auVar25._12_4_;
            auVar100._16_4_ = fVar218 * auVar25._16_4_;
            auVar100._20_4_ = fVar311 * auVar25._20_4_;
            auVar100._24_4_ = fVar199 * auVar25._24_4_;
            auVar100._28_4_ = auVar25._28_4_;
            auVar25 = vsubps_avx(auVar100,auVar99);
            auVar155._0_4_ = auVar171._0_4_ * 0.0 + auVar25._0_4_ + auVar28._0_4_ * 0.0;
            auVar155._4_4_ = auVar171._4_4_ * 0.0 + auVar25._4_4_ + auVar28._4_4_ * 0.0;
            auVar155._8_4_ = auVar171._8_4_ * 0.0 + auVar25._8_4_ + auVar28._8_4_ * 0.0;
            auVar155._12_4_ = auVar171._12_4_ * 0.0 + auVar25._12_4_ + auVar28._12_4_ * 0.0;
            auVar155._16_4_ = auVar171._16_4_ * 0.0 + auVar25._16_4_ + auVar28._16_4_ * 0.0;
            auVar155._20_4_ = auVar171._20_4_ * 0.0 + auVar25._20_4_ + auVar28._20_4_ * 0.0;
            auVar155._24_4_ = auVar171._24_4_ * 0.0 + auVar25._24_4_ + auVar28._24_4_ * 0.0;
            auVar155._28_4_ = auVar28._28_4_ + auVar25._28_4_ + auVar28._28_4_;
            auVar156 = ZEXT3264(auVar155);
            auVar25 = vmaxps_avx(auVar341,auVar155);
            auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,2);
            auVar234 = ZEXT3264(local_740._0_32_);
            auVar26 = local_740._0_32_ & auVar25;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0x7f,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0xbf,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0x1f]) {
LAB_010daeb8:
              auVar179._8_8_ = uStack_578;
              auVar179._0_8_ = local_580;
              auVar179._16_8_ = uStack_570;
              auVar179._24_8_ = uStack_568;
            }
            else {
              auVar26 = vandps_avx(auVar25,local_740._0_32_);
              auVar101._4_4_ = fVar242 * fVar225;
              auVar101._0_4_ = fVar219 * fVar201;
              auVar101._8_4_ = fVar265 * fVar245;
              auVar101._12_4_ = fVar314 * fVar308;
              auVar101._16_4_ = fVar220 * fVar200;
              auVar101._20_4_ = fVar313 * fVar298;
              auVar101._24_4_ = fVar335 * fVar328;
              auVar101._28_4_ = local_740._28_4_;
              auVar102._4_4_ = fVar241 * fVar183;
              auVar102._0_4_ = fVar217 * fVar182;
              auVar102._8_4_ = fVar264 * fVar185;
              auVar102._12_4_ = fVar312 * fVar186;
              auVar102._16_4_ = fVar218 * fVar187;
              auVar102._20_4_ = fVar311 * fVar226;
              auVar102._24_4_ = fVar199 * fVar236;
              auVar102._28_4_ = auVar25._28_4_;
              auVar28 = vsubps_avx(auVar102,auVar101);
              auVar103._4_4_ = fVar243 * fVar183;
              auVar103._0_4_ = fVar222 * fVar182;
              auVar103._8_4_ = fVar266 * fVar185;
              auVar103._12_4_ = fVar224 * fVar186;
              auVar103._16_4_ = fVar223 * fVar187;
              auVar103._20_4_ = fVar317 * fVar226;
              auVar103._24_4_ = fVar365 * fVar236;
              auVar103._28_4_ = auVar148._28_4_;
              auVar104._4_4_ = fVar242 * fVar239;
              auVar104._0_4_ = fVar219 * fVar215;
              auVar104._8_4_ = fVar265 * fVar262;
              auVar104._12_4_ = fVar314 * fVar297;
              auVar104._16_4_ = fVar220 * fVar216;
              auVar104._20_4_ = fVar313 * fVar309;
              auVar104._24_4_ = fVar335 * fVar334;
              auVar104._28_4_ = auVar196._28_4_;
              auVar147 = vsubps_avx(auVar104,auVar103);
              auVar105._4_4_ = fVar241 * fVar239;
              auVar105._0_4_ = fVar217 * fVar215;
              auVar105._8_4_ = fVar264 * fVar262;
              auVar105._12_4_ = fVar312 * fVar297;
              auVar105._16_4_ = fVar218 * fVar216;
              auVar105._20_4_ = fVar311 * fVar309;
              auVar105._24_4_ = fVar199 * fVar334;
              auVar105._28_4_ = auVar27._28_4_;
              auVar106._4_4_ = fVar243 * fVar225;
              auVar106._0_4_ = fVar222 * fVar201;
              auVar106._8_4_ = fVar266 * fVar245;
              auVar106._12_4_ = fVar224 * fVar308;
              auVar106._16_4_ = fVar223 * fVar200;
              auVar106._20_4_ = fVar317 * fVar298;
              auVar106._24_4_ = fVar365 * fVar328;
              auVar106._28_4_ = auVar173._28_4_;
              auVar148 = vsubps_avx(auVar106,auVar105);
              auVar178._0_4_ = auVar28._0_4_ * 0.0 + auVar148._0_4_ + auVar147._0_4_ * 0.0;
              auVar178._4_4_ = auVar28._4_4_ * 0.0 + auVar148._4_4_ + auVar147._4_4_ * 0.0;
              auVar178._8_4_ = auVar28._8_4_ * 0.0 + auVar148._8_4_ + auVar147._8_4_ * 0.0;
              auVar178._12_4_ = auVar28._12_4_ * 0.0 + auVar148._12_4_ + auVar147._12_4_ * 0.0;
              auVar178._16_4_ = auVar28._16_4_ * 0.0 + auVar148._16_4_ + auVar147._16_4_ * 0.0;
              auVar178._20_4_ = auVar28._20_4_ * 0.0 + auVar148._20_4_ + auVar147._20_4_ * 0.0;
              auVar178._24_4_ = auVar28._24_4_ * 0.0 + auVar148._24_4_ + auVar147._24_4_ * 0.0;
              auVar178._28_4_ = auVar173._28_4_ + auVar148._28_4_ + auVar27._28_4_;
              auVar25 = vrcpps_avx(auVar178);
              fVar201 = auVar25._0_4_;
              fVar215 = auVar25._4_4_;
              auVar107._4_4_ = auVar178._4_4_ * fVar215;
              auVar107._0_4_ = auVar178._0_4_ * fVar201;
              fVar217 = auVar25._8_4_;
              auVar107._8_4_ = auVar178._8_4_ * fVar217;
              fVar219 = auVar25._12_4_;
              auVar107._12_4_ = auVar178._12_4_ * fVar219;
              fVar222 = auVar25._16_4_;
              auVar107._16_4_ = auVar178._16_4_ * fVar222;
              fVar225 = auVar25._20_4_;
              auVar107._20_4_ = auVar178._20_4_ * fVar225;
              fVar239 = auVar25._24_4_;
              auVar107._24_4_ = auVar178._24_4_ * fVar239;
              auVar107._28_4_ = auVar196._28_4_;
              auVar354._8_4_ = 0x3f800000;
              auVar354._0_8_ = 0x3f8000003f800000;
              auVar354._12_4_ = 0x3f800000;
              auVar354._16_4_ = 0x3f800000;
              auVar354._20_4_ = 0x3f800000;
              auVar354._24_4_ = 0x3f800000;
              auVar354._28_4_ = 0x3f800000;
              auVar25 = vsubps_avx(auVar354,auVar107);
              fVar201 = auVar25._0_4_ * fVar201 + fVar201;
              fVar215 = auVar25._4_4_ * fVar215 + fVar215;
              fVar217 = auVar25._8_4_ * fVar217 + fVar217;
              fVar219 = auVar25._12_4_ * fVar219 + fVar219;
              fVar222 = auVar25._16_4_ * fVar222 + fVar222;
              fVar225 = auVar25._20_4_ * fVar225 + fVar225;
              fVar239 = auVar25._24_4_ * fVar239 + fVar239;
              auVar108._4_4_ =
                   (fVar237 * auVar28._4_4_ + auVar147._4_4_ * fVar235 + auVar148._4_4_ * fVar292) *
                   fVar215;
              auVar108._0_4_ =
                   (fVar214 * auVar28._0_4_ + auVar147._0_4_ * fVar213 + auVar148._0_4_ * fVar282) *
                   fVar201;
              auVar108._8_4_ =
                   (fVar260 * auVar28._8_4_ + auVar147._8_4_ * fVar258 + auVar148._8_4_ * fVar294) *
                   fVar217;
              auVar108._12_4_ =
                   (fVar221 * auVar28._12_4_ + auVar147._12_4_ * fVar310 + auVar148._12_4_ * fVar296
                   ) * fVar219;
              auVar108._16_4_ =
                   (fVar280 * auVar28._16_4_ + auVar147._16_4_ * fVar244 + auVar148._16_4_ * fVar164
                   ) * fVar222;
              auVar108._20_4_ =
                   (fVar307 * auVar28._20_4_ + auVar147._20_4_ * fVar306 + auVar148._20_4_ * fVar180
                   ) * fVar225;
              auVar108._24_4_ =
                   (fVar333 * auVar28._24_4_ + auVar147._24_4_ * fVar331 + auVar148._24_4_ * fVar181
                   ) * fVar239;
              auVar108._28_4_ = auVar22._28_4_ + auVar23._28_4_ + auVar24._28_4_;
              auVar212 = ZEXT3264(auVar108);
              uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar233._4_4_ = uVar6;
              auVar233._0_4_ = uVar6;
              auVar233._8_4_ = uVar6;
              auVar233._12_4_ = uVar6;
              auVar233._16_4_ = uVar6;
              auVar233._20_4_ = uVar6;
              auVar233._24_4_ = uVar6;
              auVar233._28_4_ = uVar6;
              auVar22 = vcmpps_avx(local_100,auVar108,2);
              auVar23 = vcmpps_avx(auVar108,auVar233,2);
              auVar234 = ZEXT3264(auVar23);
              auVar22 = vandps_avx(auVar22,auVar23);
              auVar24 = auVar26 & auVar22;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0x7f,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar24 >> 0xbf,0) == '\0') &&
                  (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar24[0x1f]) goto LAB_010daeb8;
              auVar22 = vandps_avx(auVar26,auVar22);
              auVar24 = vcmpps_avx(ZEXT832(0) << 0x20,auVar178,4);
              auVar25 = auVar22 & auVar24;
              auVar179._8_8_ = uStack_578;
              auVar179._0_8_ = local_580;
              auVar179._16_8_ = uStack_570;
              auVar179._24_8_ = uStack_568;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0x7f,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0xbf,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar25[0x1f] < '\0') {
                auVar179 = vandps_avx(auVar24,auVar22);
                auVar109._4_4_ = auVar341._4_4_ * fVar215;
                auVar109._0_4_ = auVar341._0_4_ * fVar201;
                auVar109._8_4_ = auVar341._8_4_ * fVar217;
                auVar109._12_4_ = auVar341._12_4_ * fVar219;
                auVar109._16_4_ = auVar341._16_4_ * fVar222;
                auVar109._20_4_ = auVar341._20_4_ * fVar225;
                auVar109._24_4_ = auVar341._24_4_ * fVar239;
                auVar109._28_4_ = auVar23._28_4_;
                auVar110._4_4_ = auVar155._4_4_ * fVar215;
                auVar110._0_4_ = auVar155._0_4_ * fVar201;
                auVar110._8_4_ = auVar155._8_4_ * fVar217;
                auVar110._12_4_ = auVar155._12_4_ * fVar219;
                auVar110._16_4_ = auVar155._16_4_ * fVar222;
                auVar110._20_4_ = auVar155._20_4_ * fVar225;
                auVar110._24_4_ = auVar155._24_4_ * fVar239;
                auVar110._28_4_ = auVar155._28_4_;
                auVar276._8_4_ = 0x3f800000;
                auVar276._0_8_ = 0x3f8000003f800000;
                auVar276._12_4_ = 0x3f800000;
                auVar276._16_4_ = 0x3f800000;
                auVar276._20_4_ = 0x3f800000;
                auVar276._24_4_ = 0x3f800000;
                auVar276._28_4_ = 0x3f800000;
                auVar22 = vsubps_avx(auVar276,auVar109);
                local_1a0 = vblendvps_avx(auVar22,auVar109,auVar170);
                auVar22 = vsubps_avx(auVar276,auVar110);
                auVar234 = ZEXT3264(auVar22);
                _local_400 = vblendvps_avx(auVar22,auVar110,auVar170);
                auVar156 = ZEXT3264(_local_400);
                local_1c0 = auVar108;
              }
            }
            auVar114._4_4_ = fVar157;
            auVar114._0_4_ = fVar143;
            auVar114._8_4_ = fVar158;
            auVar114._12_4_ = fVar159;
            auVar114._16_4_ = fVar160;
            auVar114._20_4_ = fVar161;
            auVar114._24_4_ = fVar162;
            auVar114._28_4_ = fVar163;
            if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar179 >> 0x7f,0) != '\0') ||
                  (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar179 >> 0xbf,0) != '\0') ||
                (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar179[0x1f] < '\0') {
              auVar22 = vsubps_avx(auVar322,auVar114);
              auVar212 = ZEXT3264(local_1a0);
              fVar143 = fVar143 + auVar22._0_4_ * local_1a0._0_4_;
              fVar157 = fVar157 + auVar22._4_4_ * local_1a0._4_4_;
              fVar158 = fVar158 + auVar22._8_4_ * local_1a0._8_4_;
              fVar159 = fVar159 + auVar22._12_4_ * local_1a0._12_4_;
              fVar160 = fVar160 + auVar22._16_4_ * local_1a0._16_4_;
              fVar161 = fVar161 + auVar22._20_4_ * local_1a0._20_4_;
              fVar162 = fVar162 + auVar22._24_4_ * local_1a0._24_4_;
              fVar163 = fVar163 + auVar22._28_4_;
              fVar201 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar111._4_4_ = (fVar157 + fVar157) * fVar201;
              auVar111._0_4_ = (fVar143 + fVar143) * fVar201;
              auVar111._8_4_ = (fVar158 + fVar158) * fVar201;
              auVar111._12_4_ = (fVar159 + fVar159) * fVar201;
              auVar111._16_4_ = (fVar160 + fVar160) * fVar201;
              auVar111._20_4_ = (fVar161 + fVar161) * fVar201;
              auVar111._24_4_ = (fVar162 + fVar162) * fVar201;
              auVar111._28_4_ = fVar163 + fVar163;
              auVar234 = ZEXT3264(local_1c0);
              auVar22 = vcmpps_avx(local_1c0,auVar111,6);
              auVar156 = ZEXT3264(auVar22);
              auVar23 = auVar179 & auVar22;
              if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0x7f,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0xbf,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar23[0x1f] < '\0') {
                local_240 = vandps_avx(auVar22,auVar179);
                auVar156 = ZEXT3264(local_240);
                local_2e0 = (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0;
                fStack_2dc = (float)local_400._4_4_ + (float)local_400._4_4_ + -1.0;
                fStack_2d8 = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
                fStack_2d4 = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
                fStack_2d0 = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
                fStack_2cc = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
                fStack_2c8 = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
                fStack_2c4 = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
                local_300 = local_1a0;
                local_2c0 = local_1c0;
                pGVar141 = (context->scene->geometries).items[local_7a8].ptr;
                local_400._4_4_ = fStack_2dc;
                local_400._0_4_ = local_2e0;
                uStack_3f8._0_4_ = fStack_2d8;
                uStack_3f8._4_4_ = fStack_2d4;
                uStack_3f0._0_4_ = fStack_2d0;
                uStack_3f0._4_4_ = fStack_2cc;
                auVar126 = _local_400;
                uStack_3e8._0_4_ = fStack_2c8;
                uStack_3e8._4_4_ = fStack_2c4;
                auVar22 = _local_400;
                if ((pGVar141->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar133 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar133 = 1, pGVar141->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_6c0._0_8_ = pGVar141;
                  local_7a0._4_28_ = auVar256._4_28_;
                  local_7a0._0_4_ = (int)uVar138;
                  auVar250 = vshufps_avx(ZEXT416((uint)(float)(int)local_2a0),
                                         ZEXT416((uint)(float)(int)local_2a0),0);
                  local_220[0] = (auVar250._0_4_ + local_1a0._0_4_ + 0.0) * (float)local_120._0_4_;
                  local_220[1] = (auVar250._4_4_ + local_1a0._4_4_ + 1.0) * (float)local_120._4_4_;
                  local_220[2] = (auVar250._8_4_ + local_1a0._8_4_ + 2.0) * fStack_118;
                  local_220[3] = (auVar250._12_4_ + local_1a0._12_4_ + 3.0) * fStack_114;
                  fStack_210 = (auVar250._0_4_ + local_1a0._16_4_ + 4.0) * fStack_110;
                  fStack_20c = (auVar250._4_4_ + local_1a0._20_4_ + 5.0) * fStack_10c;
                  fStack_208 = (auVar250._8_4_ + local_1a0._24_4_ + 6.0) * fStack_108;
                  fStack_204 = auVar250._12_4_ + (float)local_1a0._28_4_ + 7.0;
                  uStack_3f0 = auVar126._16_8_;
                  uStack_3e8 = auVar22._24_8_;
                  local_200 = local_400;
                  uStack_1f8 = uStack_3f8;
                  uStack_1f0 = uStack_3f0;
                  uStack_1e8 = uStack_3e8;
                  local_1e0 = local_1c0;
                  iVar135 = vmovmskps_avx(local_240);
                  uVar138 = CONCAT44((int)(uVar138 >> 0x20),iVar135);
                  lVar20 = 0;
                  if (uVar138 != 0) {
                    for (; (uVar138 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                    }
                  }
                  local_7e0 = (uint)lVar20;
                  uStack_7dc = (undefined4)((ulong)lVar20 >> 0x20);
                  local_740._0_8_ = uVar138;
                  _local_400 = auVar22;
                  if (iVar135 == 0) {
                    bVar133 = 0;
LAB_010daef6:
                    uVar138 = (ulong)(uint)local_7a0._0_4_;
                  }
                  else {
                    _local_760 = *local_718;
                    stack0xfffffffffffff984 = auVar175._4_28_;
                    local_680._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    _local_6e0 = auVar322;
                    _local_600 = auVar176;
                    _local_5e0 = auVar321;
                    _local_5c0 = auVar21;
                    local_29c = uVar17;
                    local_290 = uVar127;
                    uStack_288 = uVar128;
                    local_280 = uVar129;
                    uStack_278 = uVar130;
                    local_270 = uVar131;
                    uStack_268 = uVar132;
                    local_260 = auVar7;
                    do {
                      lVar20 = CONCAT44(uStack_7dc,local_7e0);
                      local_460 = local_220[lVar20];
                      local_450 = *(undefined4 *)((long)&local_200 + lVar20 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + lVar20 * 4);
                      fVar213 = 1.0 - local_460;
                      fVar201 = local_460 * fVar213 * 4.0;
                      auVar250 = ZEXT416((uint)(local_460 * local_460 * 0.5));
                      auVar250 = vshufps_avx(auVar250,auVar250,0);
                      auVar192 = ZEXT416((uint)((fVar213 * fVar213 + fVar201) * 0.5));
                      auVar192 = vshufps_avx(auVar192,auVar192,0);
                      auVar184 = ZEXT416((uint)((-local_460 * local_460 - fVar201) * 0.5));
                      auVar184 = vshufps_avx(auVar184,auVar184,0);
                      auVar228._0_4_ = local_860 * auVar184._0_4_;
                      auVar228._4_4_ = fStack_85c * auVar184._4_4_;
                      auVar228._8_4_ = fStack_858 * auVar184._8_4_;
                      auVar228._12_4_ = fStack_854 * auVar184._12_4_;
                      auVar234 = ZEXT1664(auVar228);
                      local_710.context = context->user;
                      auVar184 = ZEXT416((uint)(fVar213 * -fVar213 * 0.5));
                      auVar184 = vshufps_avx(auVar184,auVar184,0);
                      auVar193._0_4_ =
                           local_880 * auVar184._0_4_ +
                           auVar228._0_4_ + local_850 * auVar250._0_4_ + local_870 * auVar192._0_4_;
                      auVar193._4_4_ =
                           fStack_87c * auVar184._4_4_ +
                           auVar228._4_4_ +
                           fStack_84c * auVar250._4_4_ + fStack_86c * auVar192._4_4_;
                      auVar193._8_4_ =
                           fStack_878 * auVar184._8_4_ +
                           auVar228._8_4_ +
                           fStack_848 * auVar250._8_4_ + fStack_868 * auVar192._8_4_;
                      auVar193._12_4_ =
                           fStack_874 * auVar184._12_4_ +
                           auVar228._12_4_ +
                           fStack_844 * auVar250._12_4_ + fStack_864 * auVar192._12_4_;
                      local_490 = (RTCHitN  [16])vshufps_avx(auVar193,auVar193,0);
                      local_480 = vshufps_avx(auVar193,auVar193,0x55);
                      auVar212 = ZEXT1664(local_480);
                      local_470 = vshufps_avx(auVar193,auVar193,0xaa);
                      local_440 = local_650._0_8_;
                      uStack_438 = local_650._8_8_;
                      local_430 = local_310._0_8_;
                      uStack_428 = local_310._8_8_;
                      vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                      uStack_41c = (local_710.context)->instID[0];
                      local_420 = uStack_41c;
                      uStack_418 = uStack_41c;
                      uStack_414 = uStack_41c;
                      uStack_410 = (local_710.context)->instPrimID[0];
                      uStack_40c = uStack_410;
                      uStack_408 = uStack_410;
                      uStack_404 = uStack_410;
                      local_7c0 = _local_760;
                      local_710.valid = (int *)local_7c0;
                      local_710.geometryUserPtr = pGVar141->userPtr;
                      local_710.hit = local_490;
                      local_710.N = 4;
                      local_710.ray = (RTCRayN *)ray;
                      fStack_45c = local_460;
                      fStack_458 = local_460;
                      fStack_454 = local_460;
                      uStack_44c = local_450;
                      uStack_448 = local_450;
                      uStack_444 = local_450;
                      if (pGVar141->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar212 = ZEXT1664(local_480);
                        auVar234 = ZEXT1664(auVar228);
                        (*pGVar141->occlusionFilterN)(&local_710);
                      }
                      if (local_7c0 == (undefined1  [16])0x0) {
                        auVar250 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar250 = auVar250 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var19 = context->args->filter;
                        if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_6c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar212 = ZEXT1664(auVar212._0_16_);
                          auVar234 = ZEXT1664(auVar234._0_16_);
                          (*p_Var19)(&local_710);
                        }
                        auVar192 = vpcmpeqd_avx(local_7c0,_DAT_01f7aa10);
                        auVar250 = auVar192 ^ _DAT_01f7ae20;
                        auVar194._8_4_ = 0xff800000;
                        auVar194._0_8_ = 0xff800000ff800000;
                        auVar194._12_4_ = 0xff800000;
                        auVar192 = vblendvps_avx(auVar194,*(undefined1 (*) [16])
                                                           (local_710.ray + 0x80),auVar192);
                        *(undefined1 (*) [16])(local_710.ray + 0x80) = auVar192;
                      }
                      auVar156 = ZEXT1664(auVar250);
                      auVar169._8_8_ = 0x100000001;
                      auVar169._0_8_ = 0x100000001;
                      if ((auVar169 & auVar250) != (undefined1  [16])0x0) {
                        bVar133 = 1;
                        goto LAB_010daef6;
                      }
                      auVar156 = ZEXT464((uint)local_680._0_4_);
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_680._0_4_;
                      uVar136 = local_740._0_8_ ^ 1L << ((ulong)local_7e0 & 0x3f);
                      lVar20 = 0;
                      if (uVar136 != 0) {
                        for (; (uVar136 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                        }
                      }
                      local_7e0 = (uint)lVar20;
                      uStack_7dc = (undefined4)((ulong)lVar20 >> 0x20);
                      bVar133 = 0;
                      local_740._0_8_ = uVar136;
                      uVar138 = (ulong)(uint)local_7a0._0_4_;
                      pGVar141 = (Geometry *)local_6c0._0_8_;
                    } while (uVar136 != 0);
                  }
                }
                uVar138 = CONCAT71((int7)(uVar138 >> 8),(byte)uVar138 | bVar133);
              }
            }
          }
          auVar325 = ZEXT3264(auVar303);
          auVar305 = ZEXT3264(auVar146);
          lVar139 = lVar139 + 8;
        } while ((int)lVar139 < (int)uVar17);
      }
      bVar133 = (byte)uVar138;
      if ((uVar138 & 1) != 0) break;
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar152._4_4_ = uVar6;
      auVar152._0_4_ = uVar6;
      auVar152._8_4_ = uVar6;
      auVar152._12_4_ = uVar6;
      auVar152._16_4_ = uVar6;
      auVar152._20_4_ = uVar6;
      auVar152._24_4_ = uVar6;
      auVar152._28_4_ = uVar6;
      auVar146 = vcmpps_avx(local_80,auVar152,2);
      uVar134 = vmovmskps_avx(auVar146);
      uVar134 = (uint)uVar142 & uVar134;
    } while (uVar134 != 0);
  }
  return (bool)(bVar133 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }